

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86_avx512::forward_fp16s
          (InnerProduct_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int *piVar6;
  void *pvVar7;
  undefined4 *puVar8;
  uint *puVar9;
  void *pvVar10;
  size_t sVar11;
  float *pfVar12;
  bool bVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined4 uVar119;
  undefined4 uVar120;
  undefined4 uVar121;
  undefined4 uVar122;
  float afVar123 [16];
  float afVar124 [16];
  float afVar125 [16];
  float afVar126 [16];
  float afVar127 [16];
  float afVar128 [16];
  float afVar129 [16];
  float afVar130 [16];
  float afVar131 [16];
  float afVar132 [16];
  float afVar133 [16];
  int iVar134;
  uint uVar135;
  long lVar136;
  ulong uVar137;
  undefined1 (*pauVar138) [32];
  long lVar139;
  long lVar140;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar165 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 (*pauVar141) [32];
  long lVar142;
  long lVar143;
  int iVar144;
  long lVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  uint uVar149;
  uint uVar150;
  long lVar151;
  long lVar152;
  long lVar153;
  long lVar154;
  ulong uVar155;
  uint uVar156;
  long lVar157;
  undefined1 (*pauVar158) [16];
  long lVar159;
  undefined1 (*pauVar160) [16];
  long lVar161;
  undefined1 (*pauVar162) [16];
  undefined1 (*pauVar163) [16];
  undefined1 auVar164 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [28];
  undefined1 auVar217 [64];
  undefined1 auVar218 [64];
  undefined1 auVar219 [64];
  undefined1 auVar220 [64];
  undefined1 auVar221 [64];
  undefined1 auVar222 [64];
  undefined1 auVar223 [64];
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [64];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  float fVar232;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar233 [16];
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined1 auVar236 [32];
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined1 extraout_var [60];
  undefined4 extraout_XMM0_Dc_05;
  undefined4 extraout_XMM0_Dc_06;
  undefined4 extraout_XMM0_Dc_07;
  undefined4 extraout_XMM0_Dd_05;
  undefined4 extraout_XMM0_Dd_06;
  undefined4 extraout_XMM0_Dd_07;
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  v4sf one_4;
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar265;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar266;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  v4sf one;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [16];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 in_ZMM16 [64];
  undefined1 auVar336 [64];
  undefined1 in_ZMM17 [64];
  undefined1 auVar337 [64];
  undefined1 in_ZMM18 [64];
  undefined1 auVar338 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar339 [64];
  Option opt_flatten;
  undefined1 (*local_3b8) [32];
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 local_3a8;
  undefined4 uStack_3a4;
  int local_3a0;
  Allocator *local_398;
  int local_390;
  int iStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  int iStack_380;
  size_t local_378;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  long local_308;
  ulong local_300;
  ulong local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  float local_2b8;
  undefined4 uStack_2b4;
  undefined4 uStack_2b0;
  undefined4 uStack_2ac;
  undefined1 local_2a8 [32];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined8 local_238;
  ulong local_220;
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined8 local_78;
  Allocator *pAStack_70;
  undefined1 auStack_68 [48];
  
  auVar164 = in_ZMM29._0_16_;
  local_390 = bottom_blob->dims;
  if ((local_390 == 2) &&
     (iVar144 = (this->super_InnerProduct).num_output,
     bottom_blob->w == (this->super_InnerProduct).weight_data_size / iVar144)) {
    Mat::create(top_blob,iVar144,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                opt->blob_allocator);
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    innerproduct_gemm_fp16s_sse
              (bottom_blob,top_blob,&this->weight_data_tm,&(this->super_InnerProduct).bias_data,
               (this->super_InnerProduct).activation_type,
               &(this->super_InnerProduct).activation_params,opt);
    return 0;
  }
  piVar6 = bottom_blob->refcount;
  local_3b8 = (undefined1 (*) [32])bottom_blob->data;
  uStack_3b0 = SUB84(bottom_blob->refcount,0);
  uStack_3ac = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_3a8 = (undefined4)bottom_blob->elemsize;
  uStack_3a4 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_3a0 = bottom_blob->elempack;
  local_398 = bottom_blob->allocator;
  uVar119 = bottom_blob->w;
  uVar120 = bottom_blob->h;
  uVar121 = bottom_blob->d;
  uVar122 = bottom_blob->c;
  local_378 = bottom_blob->cstep;
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + 1;
    UNLOCK();
  }
  iStack_38c = uVar119;
  uStack_388 = uVar120;
  uStack_384 = uVar121;
  iStack_380 = uVar122;
  if (bottom_blob->dims != 1) {
    auStack_68 = SUB6448(*opt,0x10);
    local_78 = SUB648(*opt,0);
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_3b8);
    if ((local_3b8 == (undefined1 (*) [32])0x0) || ((long)iStack_380 * local_378 == 0)) {
      iVar144 = -100;
      goto LAB_002db035;
    }
  }
  uVar135 = 1;
  if (opt->use_packing_layout == true) {
    uVar135 = (this->super_InnerProduct).num_output;
    if ((uVar135 & 0xf) == 0) {
      uVar135 = 0x10;
    }
    else if ((uVar135 & 7) == 0) {
      uVar135 = 8;
    }
    else {
      uVar135 = (uint)((uVar135 & 3) == 0) * 3 + 1;
    }
  }
  Mat::create(top_blob,(this->super_InnerProduct).num_output / (int)uVar135,
              (ulong)uVar135 * (CONCAT44(uStack_3a4,local_3a8) / (ulong)(long)local_3a0),uVar135,
              opt->blob_allocator);
  afVar133 = _ps512_cephes_log_q1;
  afVar132 = ::_ps512_cephes_exp_p5;
  afVar131 = ::_ps512_cephes_exp_p4;
  afVar130 = ::_ps512_cephes_exp_p3;
  afVar129 = ::_ps512_cephes_exp_p2;
  afVar128 = ::_ps512_cephes_exp_p1;
  afVar127 = ::_ps512_cephes_exp_p0;
  afVar126 = ::_ps512_cephes_LOG2EF;
  afVar125 = ::_ps512_exp_lo;
  afVar124 = ::_ps512_exp_hi;
  afVar123 = ::_ps512_1;
  iVar144 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar5 = (this->super_InnerProduct).activation_type;
    uVar156 = local_3a0 * iStack_38c;
    iVar134 = top_blob->elempack;
    uVar135 = top_blob->w;
    uVar155 = (ulong)uVar135;
    pvVar7 = (this->super_InnerProduct).bias_data.data;
    iVar144 = 0;
    if (7 < iVar134) {
      if (iVar134 != 8) {
        if (iVar134 == 0x10) {
          if (0 < (int)uVar135) {
            auVar217 = vbroadcastss_avx512f(ZEXT416(0x80000000));
            auVar218 = vxorps_avx512dq(auVar217,(undefined1  [64])_ps512_cephes_log_q2);
            auVar219 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar217);
            auVar220 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
            auVar221 = vxorps_avx512dq((undefined1  [64])::_ps512_cephes_exp_p5,auVar217);
            uVar137 = 0;
            auVar164 = vxorps_avx512vl(auVar164,auVar164);
            auVar339 = ZEXT1664(auVar164);
            auVar222 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar223 = vbroadcastss_avx512f(ZEXT416(0xc0000000));
            do {
              auVar164 = vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
              auVar336 = ZEXT1664(auVar164);
              if (pvVar7 != (void *)0x0) {
                auVar336 = *(undefined1 (*) [64])((long)pvVar7 + uVar137 * 0x40);
              }
              pauVar141 = (undefined1 (*) [32])
                          ((long)(this->weight_data_tm).w * uVar137 *
                           (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
              auVar165 = in_ZMM18._0_16_;
              auVar170 = in_ZMM23._0_16_;
              auVar168 = in_ZMM21._0_16_;
              auVar169 = in_ZMM22._0_16_;
              auVar166 = in_ZMM19._0_16_;
              auVar167 = in_ZMM20._0_16_;
              auVar164 = in_ZMM17._0_16_;
              pauVar138 = local_3b8;
              if ((int)uVar156 < 8) {
                auVar165 = vxorps_avx512vl(auVar165,auVar165);
                auVar338 = ZEXT1664(auVar165);
                auVar165 = vxorps_avx512vl(auVar170,auVar170);
                in_ZMM23 = ZEXT1664(auVar165);
                auVar165 = vxorps_avx512vl(auVar168,auVar168);
                in_ZMM21 = ZEXT1664(auVar165);
                auVar165 = vxorps_avx512vl(auVar169,auVar169);
                in_ZMM22 = ZEXT1664(auVar165);
                auVar165 = vxorps_avx512vl(auVar166,auVar166);
                in_ZMM19 = ZEXT1664(auVar165);
                auVar165 = vxorps_avx512vl(auVar167,auVar167);
                in_ZMM20 = ZEXT1664(auVar165);
                auVar164 = vxorps_avx512vl(auVar164,auVar164);
                auVar337 = ZEXT1664(auVar164);
                uVar135 = 0;
              }
              else {
                auVar164 = vxorps_avx512vl(auVar164,auVar164);
                auVar337 = ZEXT1664(auVar164);
                iVar144 = 7;
                auVar164 = vxorps_avx512vl(auVar167,auVar167);
                in_ZMM20 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar166,auVar166);
                in_ZMM19 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar169,auVar169);
                in_ZMM22 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar168,auVar168);
                in_ZMM21 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar170,auVar170);
                in_ZMM23 = ZEXT1664(auVar164);
                auVar164 = vxorps_avx512vl(auVar165,auVar165);
                auVar338 = ZEXT1664(auVar164);
                do {
                  auVar224 = vcvtph2ps_avx512f(*pauVar141);
                  auVar225 = vcvtph2ps_avx512f(pauVar141[1]);
                  auVar226 = vcvtph2ps_avx512f(pauVar141[2]);
                  auVar227 = vcvtph2ps_avx512f(pauVar141[3]);
                  uVar1 = *(undefined4 *)*pauVar138;
                  auVar228._4_4_ = uVar1;
                  auVar228._0_4_ = uVar1;
                  auVar228._8_4_ = uVar1;
                  auVar228._12_4_ = uVar1;
                  auVar228._16_4_ = uVar1;
                  auVar228._20_4_ = uVar1;
                  auVar228._24_4_ = uVar1;
                  auVar228._28_4_ = uVar1;
                  auVar228._32_4_ = uVar1;
                  auVar228._36_4_ = uVar1;
                  auVar228._40_4_ = uVar1;
                  auVar228._44_4_ = uVar1;
                  auVar228._48_4_ = uVar1;
                  auVar228._52_4_ = uVar1;
                  auVar228._56_4_ = uVar1;
                  auVar228._60_4_ = uVar1;
                  auVar336 = vfmadd231ps_avx512f(auVar336,auVar224,auVar228);
                  uVar1 = *(undefined4 *)(*pauVar138 + 4);
                  auVar224._4_4_ = uVar1;
                  auVar224._0_4_ = uVar1;
                  auVar224._8_4_ = uVar1;
                  auVar224._12_4_ = uVar1;
                  auVar224._16_4_ = uVar1;
                  auVar224._20_4_ = uVar1;
                  auVar224._24_4_ = uVar1;
                  auVar224._28_4_ = uVar1;
                  auVar224._32_4_ = uVar1;
                  auVar224._36_4_ = uVar1;
                  auVar224._40_4_ = uVar1;
                  auVar224._44_4_ = uVar1;
                  auVar224._48_4_ = uVar1;
                  auVar224._52_4_ = uVar1;
                  auVar224._56_4_ = uVar1;
                  auVar224._60_4_ = uVar1;
                  auVar337 = vfmadd231ps_avx512f(auVar337,auVar225,auVar224);
                  uVar1 = *(undefined4 *)(*pauVar138 + 8);
                  auVar225._4_4_ = uVar1;
                  auVar225._0_4_ = uVar1;
                  auVar225._8_4_ = uVar1;
                  auVar225._12_4_ = uVar1;
                  auVar225._16_4_ = uVar1;
                  auVar225._20_4_ = uVar1;
                  auVar225._24_4_ = uVar1;
                  auVar225._28_4_ = uVar1;
                  auVar225._32_4_ = uVar1;
                  auVar225._36_4_ = uVar1;
                  auVar225._40_4_ = uVar1;
                  auVar225._44_4_ = uVar1;
                  auVar225._48_4_ = uVar1;
                  auVar225._52_4_ = uVar1;
                  auVar225._56_4_ = uVar1;
                  auVar225._60_4_ = uVar1;
                  in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar226,auVar225);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
                  auVar226._4_4_ = uVar1;
                  auVar226._0_4_ = uVar1;
                  auVar226._8_4_ = uVar1;
                  auVar226._12_4_ = uVar1;
                  auVar226._16_4_ = uVar1;
                  auVar226._20_4_ = uVar1;
                  auVar226._24_4_ = uVar1;
                  auVar226._28_4_ = uVar1;
                  auVar226._32_4_ = uVar1;
                  auVar226._36_4_ = uVar1;
                  auVar226._40_4_ = uVar1;
                  auVar226._44_4_ = uVar1;
                  auVar226._48_4_ = uVar1;
                  auVar226._52_4_ = uVar1;
                  auVar226._56_4_ = uVar1;
                  auVar226._60_4_ = uVar1;
                  in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar227,auVar226);
                  auVar228 = vcvtph2ps_avx512f(pauVar141[4]);
                  auVar224 = vcvtph2ps_avx512f(pauVar141[5]);
                  auVar225 = vcvtph2ps_avx512f(pauVar141[6]);
                  auVar226 = vcvtph2ps_avx512f(pauVar141[7]);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x10);
                  auVar227._4_4_ = uVar1;
                  auVar227._0_4_ = uVar1;
                  auVar227._8_4_ = uVar1;
                  auVar227._12_4_ = uVar1;
                  auVar227._16_4_ = uVar1;
                  auVar227._20_4_ = uVar1;
                  auVar227._24_4_ = uVar1;
                  auVar227._28_4_ = uVar1;
                  auVar227._32_4_ = uVar1;
                  auVar227._36_4_ = uVar1;
                  auVar227._40_4_ = uVar1;
                  auVar227._44_4_ = uVar1;
                  auVar227._48_4_ = uVar1;
                  auVar227._52_4_ = uVar1;
                  auVar227._56_4_ = uVar1;
                  auVar227._60_4_ = uVar1;
                  in_ZMM22 = vfmadd231ps_avx512f(in_ZMM22,auVar228,auVar227);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x14);
                  auVar105._4_4_ = uVar1;
                  auVar105._0_4_ = uVar1;
                  auVar105._8_4_ = uVar1;
                  auVar105._12_4_ = uVar1;
                  auVar105._16_4_ = uVar1;
                  auVar105._20_4_ = uVar1;
                  auVar105._24_4_ = uVar1;
                  auVar105._28_4_ = uVar1;
                  auVar105._32_4_ = uVar1;
                  auVar105._36_4_ = uVar1;
                  auVar105._40_4_ = uVar1;
                  auVar105._44_4_ = uVar1;
                  auVar105._48_4_ = uVar1;
                  auVar105._52_4_ = uVar1;
                  auVar105._56_4_ = uVar1;
                  auVar105._60_4_ = uVar1;
                  in_ZMM21 = vfmadd231ps_avx512f(in_ZMM21,auVar224,auVar105);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x18);
                  auVar106._4_4_ = uVar1;
                  auVar106._0_4_ = uVar1;
                  auVar106._8_4_ = uVar1;
                  auVar106._12_4_ = uVar1;
                  auVar106._16_4_ = uVar1;
                  auVar106._20_4_ = uVar1;
                  auVar106._24_4_ = uVar1;
                  auVar106._28_4_ = uVar1;
                  auVar106._32_4_ = uVar1;
                  auVar106._36_4_ = uVar1;
                  auVar106._40_4_ = uVar1;
                  auVar106._44_4_ = uVar1;
                  auVar106._48_4_ = uVar1;
                  auVar106._52_4_ = uVar1;
                  auVar106._56_4_ = uVar1;
                  auVar106._60_4_ = uVar1;
                  in_ZMM23 = vfmadd231ps_avx512f(in_ZMM23,auVar225,auVar106);
                  uVar1 = *(undefined4 *)(*pauVar138 + 0x1c);
                  auVar107._4_4_ = uVar1;
                  auVar107._0_4_ = uVar1;
                  auVar107._8_4_ = uVar1;
                  auVar107._12_4_ = uVar1;
                  auVar107._16_4_ = uVar1;
                  auVar107._20_4_ = uVar1;
                  auVar107._24_4_ = uVar1;
                  auVar107._28_4_ = uVar1;
                  auVar107._32_4_ = uVar1;
                  auVar107._36_4_ = uVar1;
                  auVar107._40_4_ = uVar1;
                  auVar107._44_4_ = uVar1;
                  auVar107._48_4_ = uVar1;
                  auVar107._52_4_ = uVar1;
                  auVar107._56_4_ = uVar1;
                  auVar107._60_4_ = uVar1;
                  auVar338 = vfmadd231ps_avx512f(auVar338,auVar226,auVar107);
                  pauVar138 = pauVar138 + 1;
                  pauVar141 = pauVar141 + 8;
                  iVar144 = iVar144 + 8;
                  uVar135 = uVar156 & 0xfffffff8;
                } while (iVar144 < (int)uVar156);
              }
              uVar149 = uVar135 | 3;
              while ((int)uVar149 < (int)uVar156) {
                auVar228 = vcvtph2ps_avx512f(*pauVar141);
                auVar224 = vcvtph2ps_avx512f(pauVar141[1]);
                auVar225 = vcvtph2ps_avx512f(pauVar141[2]);
                auVar226 = vcvtph2ps_avx512f(pauVar141[3]);
                uVar1 = *(undefined4 *)*pauVar138;
                auVar108._4_4_ = uVar1;
                auVar108._0_4_ = uVar1;
                auVar108._8_4_ = uVar1;
                auVar108._12_4_ = uVar1;
                auVar108._16_4_ = uVar1;
                auVar108._20_4_ = uVar1;
                auVar108._24_4_ = uVar1;
                auVar108._28_4_ = uVar1;
                auVar108._32_4_ = uVar1;
                auVar108._36_4_ = uVar1;
                auVar108._40_4_ = uVar1;
                auVar108._44_4_ = uVar1;
                auVar108._48_4_ = uVar1;
                auVar108._52_4_ = uVar1;
                auVar108._56_4_ = uVar1;
                auVar108._60_4_ = uVar1;
                auVar336 = vfmadd231ps_avx512f(auVar336,auVar228,auVar108);
                uVar1 = *(undefined4 *)(*pauVar138 + 4);
                auVar109._4_4_ = uVar1;
                auVar109._0_4_ = uVar1;
                auVar109._8_4_ = uVar1;
                auVar109._12_4_ = uVar1;
                auVar109._16_4_ = uVar1;
                auVar109._20_4_ = uVar1;
                auVar109._24_4_ = uVar1;
                auVar109._28_4_ = uVar1;
                auVar109._32_4_ = uVar1;
                auVar109._36_4_ = uVar1;
                auVar109._40_4_ = uVar1;
                auVar109._44_4_ = uVar1;
                auVar109._48_4_ = uVar1;
                auVar109._52_4_ = uVar1;
                auVar109._56_4_ = uVar1;
                auVar109._60_4_ = uVar1;
                auVar337 = vfmadd231ps_avx512f(auVar337,auVar224,auVar109);
                uVar1 = *(undefined4 *)(*pauVar138 + 8);
                auVar110._4_4_ = uVar1;
                auVar110._0_4_ = uVar1;
                auVar110._8_4_ = uVar1;
                auVar110._12_4_ = uVar1;
                auVar110._16_4_ = uVar1;
                auVar110._20_4_ = uVar1;
                auVar110._24_4_ = uVar1;
                auVar110._28_4_ = uVar1;
                auVar110._32_4_ = uVar1;
                auVar110._36_4_ = uVar1;
                auVar110._40_4_ = uVar1;
                auVar110._44_4_ = uVar1;
                auVar110._48_4_ = uVar1;
                auVar110._52_4_ = uVar1;
                auVar110._56_4_ = uVar1;
                auVar110._60_4_ = uVar1;
                in_ZMM20 = vfmadd231ps_avx512f(in_ZMM20,auVar225,auVar110);
                uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
                auVar111._4_4_ = uVar1;
                auVar111._0_4_ = uVar1;
                auVar111._8_4_ = uVar1;
                auVar111._12_4_ = uVar1;
                auVar111._16_4_ = uVar1;
                auVar111._20_4_ = uVar1;
                auVar111._24_4_ = uVar1;
                auVar111._28_4_ = uVar1;
                auVar111._32_4_ = uVar1;
                auVar111._36_4_ = uVar1;
                auVar111._40_4_ = uVar1;
                auVar111._44_4_ = uVar1;
                auVar111._48_4_ = uVar1;
                auVar111._52_4_ = uVar1;
                auVar111._56_4_ = uVar1;
                auVar111._60_4_ = uVar1;
                in_ZMM19 = vfmadd231ps_avx512f(in_ZMM19,auVar226,auVar111);
                pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
                pauVar141 = pauVar141 + 4;
                uVar149 = uVar135 + 7;
                uVar135 = uVar135 + 4;
              }
              if (uVar156 - uVar135 != 0 && (int)uVar135 <= (int)uVar156) {
                lVar145 = 0;
                do {
                  auVar191 = vlddqu_avx(*pauVar141);
                  auVar228 = vcvtph2ps_avx512f(auVar191);
                  uVar1 = *(undefined4 *)(*pauVar138 + lVar145 * 4);
                  auVar112._4_4_ = uVar1;
                  auVar112._0_4_ = uVar1;
                  auVar112._8_4_ = uVar1;
                  auVar112._12_4_ = uVar1;
                  auVar112._16_4_ = uVar1;
                  auVar112._20_4_ = uVar1;
                  auVar112._24_4_ = uVar1;
                  auVar112._28_4_ = uVar1;
                  auVar112._32_4_ = uVar1;
                  auVar112._36_4_ = uVar1;
                  auVar112._40_4_ = uVar1;
                  auVar112._44_4_ = uVar1;
                  auVar112._48_4_ = uVar1;
                  auVar112._52_4_ = uVar1;
                  auVar112._56_4_ = uVar1;
                  auVar112._60_4_ = uVar1;
                  auVar336 = vfmadd231ps_avx512f(auVar336,auVar228,auVar112);
                  pauVar141 = pauVar141 + 1;
                  lVar145 = lVar145 + 1;
                } while (uVar156 - uVar135 != (int)lVar145);
              }
              auVar338 = vaddps_avx512f(in_ZMM23,auVar338);
              auVar228 = vaddps_avx512f(in_ZMM21,in_ZMM22);
              auVar338 = vaddps_avx512f(auVar338,auVar228);
              in_ZMM18 = vaddps_avx512f(in_ZMM19,in_ZMM20);
              in_ZMM17 = vaddps_avx512f(in_ZMM18,auVar337);
              auVar337 = vaddps_avx512f(auVar338,in_ZMM17);
              auVar336 = vaddps_avx512f(auVar337,auVar336);
              in_ZMM16 = auVar336;
              switch(iVar5) {
              case 1:
                in_ZMM16 = vmaxps_avx512f(auVar336,auVar339);
                break;
              case 2:
                uVar15 = vcmpps_avx512f(auVar336,auVar339,1);
                uVar1 = *(this->super_InnerProduct).activation_params.data;
                auVar114._4_4_ = uVar1;
                auVar114._0_4_ = uVar1;
                auVar114._8_4_ = uVar1;
                auVar114._12_4_ = uVar1;
                auVar114._16_4_ = uVar1;
                auVar114._20_4_ = uVar1;
                auVar114._24_4_ = uVar1;
                auVar114._28_4_ = uVar1;
                auVar114._32_4_ = uVar1;
                auVar114._36_4_ = uVar1;
                auVar114._40_4_ = uVar1;
                auVar114._44_4_ = uVar1;
                auVar114._48_4_ = uVar1;
                auVar114._52_4_ = uVar1;
                auVar114._56_4_ = uVar1;
                auVar114._60_4_ = uVar1;
                auVar337 = vmulps_avx512f(auVar336,auVar114);
                bVar13 = (bool)((byte)uVar15 & 1);
                in_ZMM16._0_4_ = (uint)bVar13 * auVar337._0_4_ | (uint)!bVar13 * auVar336._0_4_;
                bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
                in_ZMM16._4_4_ = (uint)bVar13 * auVar337._4_4_ | (uint)!bVar13 * auVar336._4_4_;
                bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
                in_ZMM16._8_4_ = (uint)bVar13 * auVar337._8_4_ | (uint)!bVar13 * auVar336._8_4_;
                bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
                in_ZMM16._12_4_ = (uint)bVar13 * auVar337._12_4_ | (uint)!bVar13 * auVar336._12_4_;
                bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
                in_ZMM16._16_4_ = (uint)bVar13 * auVar337._16_4_ | (uint)!bVar13 * auVar336._16_4_;
                bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
                in_ZMM16._20_4_ = (uint)bVar13 * auVar337._20_4_ | (uint)!bVar13 * auVar336._20_4_;
                bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
                in_ZMM16._24_4_ = (uint)bVar13 * auVar337._24_4_ | (uint)!bVar13 * auVar336._24_4_;
                bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
                in_ZMM16._28_4_ = (uint)bVar13 * auVar337._28_4_ | (uint)!bVar13 * auVar336._28_4_;
                bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
                in_ZMM16._32_4_ = (uint)bVar13 * auVar337._32_4_ | (uint)!bVar13 * auVar336._32_4_;
                bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
                in_ZMM16._36_4_ = (uint)bVar13 * auVar337._36_4_ | (uint)!bVar13 * auVar336._36_4_;
                bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
                in_ZMM16._40_4_ = (uint)bVar13 * auVar337._40_4_ | (uint)!bVar13 * auVar336._40_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
                in_ZMM16._44_4_ = (uint)bVar13 * auVar337._44_4_ | (uint)!bVar13 * auVar336._44_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
                in_ZMM16._48_4_ = (uint)bVar13 * auVar337._48_4_ | (uint)!bVar13 * auVar336._48_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
                in_ZMM16._52_4_ = (uint)bVar13 * auVar337._52_4_ | (uint)!bVar13 * auVar336._52_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
                in_ZMM16._56_4_ = (uint)bVar13 * auVar337._56_4_ | (uint)!bVar13 * auVar336._56_4_;
                bVar13 = SUB81(uVar15 >> 0xf,0);
                in_ZMM16._60_4_ = (uint)bVar13 * auVar337._60_4_ | (uint)!bVar13 * auVar336._60_4_;
                break;
              case 3:
                puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
                uVar1 = *puVar8;
                auVar113._4_4_ = uVar1;
                auVar113._0_4_ = uVar1;
                auVar113._8_4_ = uVar1;
                auVar113._12_4_ = uVar1;
                auVar113._16_4_ = uVar1;
                auVar113._20_4_ = uVar1;
                auVar113._24_4_ = uVar1;
                auVar113._28_4_ = uVar1;
                auVar113._32_4_ = uVar1;
                auVar113._36_4_ = uVar1;
                auVar113._40_4_ = uVar1;
                auVar113._44_4_ = uVar1;
                auVar113._48_4_ = uVar1;
                auVar113._52_4_ = uVar1;
                auVar113._56_4_ = uVar1;
                auVar113._60_4_ = uVar1;
                auVar337 = vmaxps_avx512f(auVar336,auVar113);
                uVar1 = puVar8[1];
                auVar336._4_4_ = uVar1;
                auVar336._0_4_ = uVar1;
                auVar336._8_4_ = uVar1;
                auVar336._12_4_ = uVar1;
                auVar336._16_4_ = uVar1;
                auVar336._20_4_ = uVar1;
                auVar336._24_4_ = uVar1;
                auVar336._28_4_ = uVar1;
                auVar336._32_4_ = uVar1;
                auVar336._36_4_ = uVar1;
                auVar336._40_4_ = uVar1;
                auVar336._44_4_ = uVar1;
                auVar336._48_4_ = uVar1;
                auVar336._52_4_ = uVar1;
                auVar336._56_4_ = uVar1;
                auVar336._60_4_ = uVar1;
                in_ZMM16 = vminps_avx512f(auVar337,auVar336);
                break;
              case 4:
                auVar336 = vxorps_avx512dq(auVar336,auVar217);
                auVar336 = vminps_avx512f(auVar336,(undefined1  [64])afVar124);
                auVar336 = vmaxps_avx512f(auVar336,(undefined1  [64])afVar125);
                auVar337 = vfmadd213ps_avx512f((undefined1  [64])afVar126,auVar336,
                                               (undefined1  [64])afVar132);
                auVar338 = vrndscaleps_avx512f(auVar337,1);
                uVar15 = vcmpps_avx512f(auVar337,auVar338,1);
                auVar337 = vsubps_avx512f(auVar338,(undefined1  [64])afVar123);
                bVar13 = (bool)((byte)uVar15 & 1);
                in_ZMM17._0_4_ = (uint)bVar13 * auVar337._0_4_ | (uint)!bVar13 * auVar338._0_4_;
                bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
                in_ZMM17._4_4_ = (uint)bVar13 * auVar337._4_4_ | (uint)!bVar13 * auVar338._4_4_;
                bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
                in_ZMM17._8_4_ = (uint)bVar13 * auVar337._8_4_ | (uint)!bVar13 * auVar338._8_4_;
                bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
                in_ZMM17._12_4_ = (uint)bVar13 * auVar337._12_4_ | (uint)!bVar13 * auVar338._12_4_;
                bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
                in_ZMM17._16_4_ = (uint)bVar13 * auVar337._16_4_ | (uint)!bVar13 * auVar338._16_4_;
                bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
                in_ZMM17._20_4_ = (uint)bVar13 * auVar337._20_4_ | (uint)!bVar13 * auVar338._20_4_;
                bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
                in_ZMM17._24_4_ = (uint)bVar13 * auVar337._24_4_ | (uint)!bVar13 * auVar338._24_4_;
                bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
                in_ZMM17._28_4_ = (uint)bVar13 * auVar337._28_4_ | (uint)!bVar13 * auVar338._28_4_;
                bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
                in_ZMM17._32_4_ = (uint)bVar13 * auVar337._32_4_ | (uint)!bVar13 * auVar338._32_4_;
                bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
                in_ZMM17._36_4_ = (uint)bVar13 * auVar337._36_4_ | (uint)!bVar13 * auVar338._36_4_;
                bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
                in_ZMM17._40_4_ = (uint)bVar13 * auVar337._40_4_ | (uint)!bVar13 * auVar338._40_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
                in_ZMM17._44_4_ = (uint)bVar13 * auVar337._44_4_ | (uint)!bVar13 * auVar338._44_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
                in_ZMM17._48_4_ = (uint)bVar13 * auVar337._48_4_ | (uint)!bVar13 * auVar338._48_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
                in_ZMM17._52_4_ = (uint)bVar13 * auVar337._52_4_ | (uint)!bVar13 * auVar338._52_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
                in_ZMM17._56_4_ = (uint)bVar13 * auVar337._56_4_ | (uint)!bVar13 * auVar338._56_4_;
                bVar13 = SUB81(uVar15 >> 0xf,0);
                in_ZMM17._60_4_ = (uint)bVar13 * auVar337._60_4_ | (uint)!bVar13 * auVar338._60_4_;
                auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM17,auVar218);
                auVar336 = vfmadd231ps_avx512f(auVar336,in_ZMM17,auVar219);
                auVar337 = vmulps_avx512f(auVar336,auVar336);
                auVar338 = vfmadd213ps_avx512f(auVar336,(undefined1  [64])afVar127,
                                               (undefined1  [64])afVar128);
                auVar338 = vfmadd213ps_avx512f(auVar338,auVar336,(undefined1  [64])afVar129);
                auVar338 = vfmadd213ps_avx512f(auVar338,auVar336,(undefined1  [64])afVar130);
                auVar338 = vfmadd213ps_avx512f(auVar338,auVar336,(undefined1  [64])afVar131);
                auVar338 = vfmadd213ps_avx512f(auVar338,auVar336,(undefined1  [64])afVar132);
                in_ZMM18 = vfmadd213ps_avx512f(auVar338,auVar337,auVar336);
                auVar336 = vaddps_avx512f(in_ZMM18,(undefined1  [64])afVar123);
                auVar337 = vcvttps2dq_avx512f(in_ZMM17);
                auVar337 = vpaddd_avx512f(auVar337,auVar220);
                auVar337 = vpslld_avx512f(auVar337,0x17);
                auVar336 = vfmadd213ps_avx512f(auVar337,auVar336,auVar222);
                in_ZMM16 = vdivps_avx512f(auVar222,auVar336);
                break;
              case 5:
                auVar337 = vminps_avx512f(auVar336,(undefined1  [64])afVar124);
                auVar337 = vmaxps_avx512f(auVar337,(undefined1  [64])afVar125);
                auVar338 = vfmadd213ps_avx512f((undefined1  [64])afVar126,auVar337,
                                               (undefined1  [64])afVar132);
                auVar228 = vrndscaleps_avx512f(auVar338,1);
                uVar15 = vcmpps_avx512f(auVar338,auVar228,1);
                auVar224 = vsubps_avx512f(auVar228,(undefined1  [64])afVar123);
                bVar13 = (bool)((byte)uVar15 & 1);
                auVar338._0_4_ = (uint)bVar13 * auVar224._0_4_ | (uint)!bVar13 * auVar228._0_4_;
                bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
                auVar338._4_4_ = (uint)bVar13 * auVar224._4_4_ | (uint)!bVar13 * auVar228._4_4_;
                bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
                auVar338._8_4_ = (uint)bVar13 * auVar224._8_4_ | (uint)!bVar13 * auVar228._8_4_;
                bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
                auVar338._12_4_ = (uint)bVar13 * auVar224._12_4_ | (uint)!bVar13 * auVar228._12_4_;
                bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
                auVar338._16_4_ = (uint)bVar13 * auVar224._16_4_ | (uint)!bVar13 * auVar228._16_4_;
                bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
                auVar338._20_4_ = (uint)bVar13 * auVar224._20_4_ | (uint)!bVar13 * auVar228._20_4_;
                bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
                auVar338._24_4_ = (uint)bVar13 * auVar224._24_4_ | (uint)!bVar13 * auVar228._24_4_;
                bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
                auVar338._28_4_ = (uint)bVar13 * auVar224._28_4_ | (uint)!bVar13 * auVar228._28_4_;
                bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
                auVar338._32_4_ = (uint)bVar13 * auVar224._32_4_ | (uint)!bVar13 * auVar228._32_4_;
                bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
                auVar338._36_4_ = (uint)bVar13 * auVar224._36_4_ | (uint)!bVar13 * auVar228._36_4_;
                bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
                auVar338._40_4_ = (uint)bVar13 * auVar224._40_4_ | (uint)!bVar13 * auVar228._40_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
                auVar338._44_4_ = (uint)bVar13 * auVar224._44_4_ | (uint)!bVar13 * auVar228._44_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
                auVar338._48_4_ = (uint)bVar13 * auVar224._48_4_ | (uint)!bVar13 * auVar228._48_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
                auVar338._52_4_ = (uint)bVar13 * auVar224._52_4_ | (uint)!bVar13 * auVar228._52_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
                auVar338._56_4_ = (uint)bVar13 * auVar224._56_4_ | (uint)!bVar13 * auVar228._56_4_;
                bVar13 = SUB81(uVar15 >> 0xf,0);
                auVar338._60_4_ = (uint)bVar13 * auVar224._60_4_ | (uint)!bVar13 * auVar228._60_4_;
                auVar337 = vfmadd231ps_avx512f(auVar337,auVar338,auVar218);
                auVar337 = vfmadd231ps_avx512f(auVar337,auVar338,auVar219);
                auVar228 = vmulps_avx512f(auVar337,auVar337);
                auVar224 = vfmadd213ps_avx512f(auVar337,(undefined1  [64])afVar127,
                                               (undefined1  [64])afVar128);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar337,(undefined1  [64])afVar129);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar337,(undefined1  [64])afVar130);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar337,(undefined1  [64])afVar131);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar337,(undefined1  [64])afVar132);
                auVar337 = vfmadd213ps_avx512f(auVar224,auVar228,auVar337);
                auVar337 = vaddps_avx512f(auVar337,(undefined1  [64])afVar123);
                auVar338 = vcvttps2dq_avx512f(auVar338);
                auVar338 = vpaddd_avx512f(auVar338,auVar220);
                auVar338 = vpslld_avx512f(auVar338,0x17);
                auVar337 = vfmadd213ps_avx512f(auVar338,auVar337,auVar222);
                auVar338 = vmaxps_avx512f(auVar337,(undefined1  [64])_ps512_min_norm_pos);
                auVar228 = vpsrld_avx512f(auVar338,0x17);
                auVar338 = vpternlogd_avx512f(auVar338,(undefined1  [64])afVar132,
                                              (undefined1  [64])_ps512_inv_mant_mask,0xec);
                uVar15 = vcmpps_avx512f(auVar338,(undefined1  [64])_ps512_cephes_SQRTHF,1);
                auVar224 = vsubps_avx512f(auVar338,(undefined1  [64])afVar123);
                auVar338 = vaddps_avx512f(auVar224,auVar338);
                bVar13 = (bool)((byte)uVar15 & 1);
                auVar229._0_4_ = (uint)bVar13 * auVar338._0_4_ | (uint)!bVar13 * auVar224._0_4_;
                bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
                auVar229._4_4_ = (uint)bVar13 * auVar338._4_4_ | (uint)!bVar13 * auVar224._4_4_;
                bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
                auVar229._8_4_ = (uint)bVar13 * auVar338._8_4_ | (uint)!bVar13 * auVar224._8_4_;
                bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
                auVar229._12_4_ = (uint)bVar13 * auVar338._12_4_ | (uint)!bVar13 * auVar224._12_4_;
                bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
                auVar229._16_4_ = (uint)bVar13 * auVar338._16_4_ | (uint)!bVar13 * auVar224._16_4_;
                bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
                auVar229._20_4_ = (uint)bVar13 * auVar338._20_4_ | (uint)!bVar13 * auVar224._20_4_;
                bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
                auVar229._24_4_ = (uint)bVar13 * auVar338._24_4_ | (uint)!bVar13 * auVar224._24_4_;
                bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
                auVar229._28_4_ = (uint)bVar13 * auVar338._28_4_ | (uint)!bVar13 * auVar224._28_4_;
                bVar14 = (byte)(uVar15 >> 8);
                bVar13 = (bool)(bVar14 & 1);
                auVar229._32_4_ = (uint)bVar13 * auVar338._32_4_ | (uint)!bVar13 * auVar224._32_4_;
                bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
                auVar229._36_4_ = (uint)bVar13 * auVar338._36_4_ | (uint)!bVar13 * auVar224._36_4_;
                bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
                auVar229._40_4_ = (uint)bVar13 * auVar338._40_4_ | (uint)!bVar13 * auVar224._40_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
                auVar229._44_4_ = (uint)bVar13 * auVar338._44_4_ | (uint)!bVar13 * auVar224._44_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
                auVar229._48_4_ = (uint)bVar13 * auVar338._48_4_ | (uint)!bVar13 * auVar224._48_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
                auVar229._52_4_ = (uint)bVar13 * auVar338._52_4_ | (uint)!bVar13 * auVar224._52_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
                auVar229._56_4_ = (uint)bVar13 * auVar338._56_4_ | (uint)!bVar13 * auVar224._56_4_;
                bVar13 = SUB81(uVar15 >> 0xf,0);
                auVar229._60_4_ = (uint)bVar13 * auVar338._60_4_ | (uint)!bVar13 * auVar224._60_4_;
                auVar338 = vmulps_avx512f(auVar229,auVar229);
                auVar224 = vfmadd132ps_avx512f(auVar229,(undefined1  [64])_ps512_cephes_log_p1,
                                               (undefined1  [64])_ps512_cephes_log_p0);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_p2);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_p3);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_p4);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_p5);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_p6);
                auVar224 = vfmadd213ps_avx512f(auVar224,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_p7);
                in_ZMM20 = vfmadd213ps_avx512f(auVar224,auVar229,
                                               (undefined1  [64])_ps512_cephes_log_p8);
                auVar224 = vmulps_avx512f(auVar338,auVar229);
                auVar224 = vfmadd213ps_avx512f(auVar224,in_ZMM20,auVar229);
                uVar16 = vcmpps_avx512f(auVar337,auVar339,2);
                auVar337 = vpsubd_avx512f(auVar228,auVar220);
                auVar337 = vcvtdq2ps_avx512f(auVar337);
                auVar228 = vaddps_avx512f(auVar337,(undefined1  [64])afVar123);
                bVar13 = (bool)((byte)uVar15 & 1);
                auVar230._0_4_ = (uint)bVar13 * auVar337._0_4_ | (uint)!bVar13 * auVar228._0_4_;
                bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
                auVar230._4_4_ = (uint)bVar13 * auVar337._4_4_ | (uint)!bVar13 * auVar228._4_4_;
                bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
                auVar230._8_4_ = (uint)bVar13 * auVar337._8_4_ | (uint)!bVar13 * auVar228._8_4_;
                bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
                auVar230._12_4_ = (uint)bVar13 * auVar337._12_4_ | (uint)!bVar13 * auVar228._12_4_;
                bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
                auVar230._16_4_ = (uint)bVar13 * auVar337._16_4_ | (uint)!bVar13 * auVar228._16_4_;
                bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
                auVar230._20_4_ = (uint)bVar13 * auVar337._20_4_ | (uint)!bVar13 * auVar228._20_4_;
                bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
                auVar230._24_4_ = (uint)bVar13 * auVar337._24_4_ | (uint)!bVar13 * auVar228._24_4_;
                bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
                auVar230._28_4_ = (uint)bVar13 * auVar337._28_4_ | (uint)!bVar13 * auVar228._28_4_;
                bVar13 = (bool)(bVar14 & 1);
                auVar230._32_4_ = (uint)bVar13 * auVar337._32_4_ | (uint)!bVar13 * auVar228._32_4_;
                bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
                auVar230._36_4_ = (uint)bVar13 * auVar337._36_4_ | (uint)!bVar13 * auVar228._36_4_;
                bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
                auVar230._40_4_ = (uint)bVar13 * auVar337._40_4_ | (uint)!bVar13 * auVar228._40_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
                auVar230._44_4_ = (uint)bVar13 * auVar337._44_4_ | (uint)!bVar13 * auVar228._44_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
                auVar230._48_4_ = (uint)bVar13 * auVar337._48_4_ | (uint)!bVar13 * auVar228._48_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
                auVar230._52_4_ = (uint)bVar13 * auVar337._52_4_ | (uint)!bVar13 * auVar228._52_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
                auVar230._56_4_ = (uint)bVar13 * auVar337._56_4_ | (uint)!bVar13 * auVar228._56_4_;
                bVar13 = SUB81(uVar15 >> 0xf,0);
                auVar230._60_4_ = (uint)bVar13 * auVar337._60_4_ | (uint)!bVar13 * auVar228._60_4_;
                auVar337 = vfmadd231ps_avx512f(auVar224,auVar230,(undefined1  [64])afVar133);
                auVar337 = vfmadd231ps_avx512f(auVar337,auVar221,auVar338);
                in_ZMM21 = vfmadd231ps_avx512f(auVar337,auVar230,
                                               (undefined1  [64])_ps512_cephes_log_q2);
                auVar337 = vmulps_avx512f(in_ZMM21,auVar223);
                auVar338 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
                bVar13 = (bool)((byte)uVar16 & 1);
                auVar231._0_4_ = (uint)bVar13 * auVar338._0_4_ | (uint)!bVar13 * auVar337._0_4_;
                bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
                auVar231._4_4_ = (uint)bVar13 * auVar338._4_4_ | (uint)!bVar13 * auVar337._4_4_;
                bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
                auVar231._8_4_ = (uint)bVar13 * auVar338._8_4_ | (uint)!bVar13 * auVar337._8_4_;
                bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
                auVar231._12_4_ = (uint)bVar13 * auVar338._12_4_ | (uint)!bVar13 * auVar337._12_4_;
                bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
                auVar231._16_4_ = (uint)bVar13 * auVar338._16_4_ | (uint)!bVar13 * auVar337._16_4_;
                bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
                auVar231._20_4_ = (uint)bVar13 * auVar338._20_4_ | (uint)!bVar13 * auVar337._20_4_;
                bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
                auVar231._24_4_ = (uint)bVar13 * auVar338._24_4_ | (uint)!bVar13 * auVar337._24_4_;
                bVar13 = (bool)((byte)(uVar16 >> 7) & 1);
                auVar231._28_4_ = (uint)bVar13 * auVar338._28_4_ | (uint)!bVar13 * auVar337._28_4_;
                bVar13 = (bool)((byte)(uVar16 >> 8) & 1);
                auVar231._32_4_ = (uint)bVar13 * auVar338._32_4_ | (uint)!bVar13 * auVar337._32_4_;
                bVar13 = (bool)((byte)(uVar16 >> 9) & 1);
                auVar231._36_4_ = (uint)bVar13 * auVar338._36_4_ | (uint)!bVar13 * auVar337._36_4_;
                bVar13 = (bool)((byte)(uVar16 >> 10) & 1);
                auVar231._40_4_ = (uint)bVar13 * auVar338._40_4_ | (uint)!bVar13 * auVar337._40_4_;
                bVar13 = (bool)((byte)(uVar16 >> 0xb) & 1);
                auVar231._44_4_ = (uint)bVar13 * auVar338._44_4_ | (uint)!bVar13 * auVar337._44_4_;
                bVar13 = (bool)((byte)(uVar16 >> 0xc) & 1);
                auVar231._48_4_ = (uint)bVar13 * auVar338._48_4_ | (uint)!bVar13 * auVar337._48_4_;
                bVar13 = (bool)((byte)(uVar16 >> 0xd) & 1);
                auVar231._52_4_ = (uint)bVar13 * auVar338._52_4_ | (uint)!bVar13 * auVar337._52_4_;
                bVar13 = (bool)((byte)(uVar16 >> 0xe) & 1);
                auVar231._56_4_ = (uint)bVar13 * auVar338._56_4_ | (uint)!bVar13 * auVar337._56_4_;
                bVar13 = SUB81(uVar16 >> 0xf,0);
                auVar231._60_4_ = (uint)bVar13 * auVar338._60_4_ | (uint)!bVar13 * auVar337._60_4_;
                auVar337 = vminps_avx512f(auVar231,(undefined1  [64])afVar124);
                auVar337 = vmaxps_avx512f(auVar337,(undefined1  [64])afVar125);
                auVar338 = vfmadd213ps_avx512f((undefined1  [64])afVar126,auVar337,
                                               (undefined1  [64])afVar132);
                auVar228 = vrndscaleps_avx512f(auVar338,1);
                uVar15 = vcmpps_avx512f(auVar338,auVar228,1);
                auVar338 = vsubps_avx512f(auVar228,(undefined1  [64])afVar123);
                bVar13 = (bool)((byte)uVar15 & 1);
                in_ZMM18._0_4_ = (uint)bVar13 * auVar338._0_4_ | (uint)!bVar13 * auVar228._0_4_;
                bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
                in_ZMM18._4_4_ = (uint)bVar13 * auVar338._4_4_ | (uint)!bVar13 * auVar228._4_4_;
                bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
                in_ZMM18._8_4_ = (uint)bVar13 * auVar338._8_4_ | (uint)!bVar13 * auVar228._8_4_;
                bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
                in_ZMM18._12_4_ = (uint)bVar13 * auVar338._12_4_ | (uint)!bVar13 * auVar228._12_4_;
                bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
                in_ZMM18._16_4_ = (uint)bVar13 * auVar338._16_4_ | (uint)!bVar13 * auVar228._16_4_;
                bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
                in_ZMM18._20_4_ = (uint)bVar13 * auVar338._20_4_ | (uint)!bVar13 * auVar228._20_4_;
                bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
                in_ZMM18._24_4_ = (uint)bVar13 * auVar338._24_4_ | (uint)!bVar13 * auVar228._24_4_;
                bVar13 = (bool)((byte)(uVar15 >> 7) & 1);
                in_ZMM18._28_4_ = (uint)bVar13 * auVar338._28_4_ | (uint)!bVar13 * auVar228._28_4_;
                bVar13 = (bool)((byte)(uVar15 >> 8) & 1);
                in_ZMM18._32_4_ = (uint)bVar13 * auVar338._32_4_ | (uint)!bVar13 * auVar228._32_4_;
                bVar13 = (bool)((byte)(uVar15 >> 9) & 1);
                in_ZMM18._36_4_ = (uint)bVar13 * auVar338._36_4_ | (uint)!bVar13 * auVar228._36_4_;
                bVar13 = (bool)((byte)(uVar15 >> 10) & 1);
                in_ZMM18._40_4_ = (uint)bVar13 * auVar338._40_4_ | (uint)!bVar13 * auVar228._40_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xb) & 1);
                in_ZMM18._44_4_ = (uint)bVar13 * auVar338._44_4_ | (uint)!bVar13 * auVar228._44_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xc) & 1);
                in_ZMM18._48_4_ = (uint)bVar13 * auVar338._48_4_ | (uint)!bVar13 * auVar228._48_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xd) & 1);
                in_ZMM18._52_4_ = (uint)bVar13 * auVar338._52_4_ | (uint)!bVar13 * auVar228._52_4_;
                bVar13 = (bool)((byte)(uVar15 >> 0xe) & 1);
                in_ZMM18._56_4_ = (uint)bVar13 * auVar338._56_4_ | (uint)!bVar13 * auVar228._56_4_;
                bVar13 = SUB81(uVar15 >> 0xf,0);
                in_ZMM18._60_4_ = (uint)bVar13 * auVar338._60_4_ | (uint)!bVar13 * auVar228._60_4_;
                auVar337 = vfmadd231ps_avx512f(auVar337,in_ZMM18,auVar218);
                auVar337 = vfmadd231ps_avx512f(auVar337,in_ZMM18,auVar219);
                auVar338 = vmulps_avx512f(auVar337,auVar337);
                auVar228 = vfmadd213ps_avx512f(auVar337,(undefined1  [64])afVar127,
                                               (undefined1  [64])afVar128);
                auVar228 = vfmadd213ps_avx512f(auVar228,auVar337,(undefined1  [64])afVar129);
                auVar228 = vfmadd213ps_avx512f(auVar228,auVar337,(undefined1  [64])afVar130);
                auVar228 = vfmadd213ps_avx512f(auVar228,auVar337,(undefined1  [64])afVar131);
                auVar228 = vfmadd213ps_avx512f(auVar228,auVar337,(undefined1  [64])afVar132);
                in_ZMM19 = vfmadd213ps_avx512f(auVar228,auVar338,auVar337);
                auVar337 = vaddps_avx512f(in_ZMM19,(undefined1  [64])afVar123);
                auVar338 = vcvttps2dq_avx512f(in_ZMM18);
                auVar338 = vpaddd_avx512f(auVar338,auVar220);
                auVar338 = vpslld_avx512f(auVar338,0x17);
                in_ZMM17 = vfmadd213ps_avx512f(auVar338,auVar337,auVar222);
                auVar337 = vdivps_avx512f(auVar222,in_ZMM17);
                auVar337 = vfnmsub213ps_avx512f(auVar337,auVar223,auVar222);
                goto LAB_002d8fad;
              case 6:
                puVar9 = (uint *)(this->super_InnerProduct).activation_params.data;
                auVar338 = vbroadcastss_avx512f(ZEXT416(*puVar9));
                uVar135 = puVar9[1];
                auVar337._4_4_ = uVar135;
                auVar337._0_4_ = uVar135;
                auVar337._8_4_ = uVar135;
                auVar337._12_4_ = uVar135;
                auVar337._16_4_ = uVar135;
                auVar337._20_4_ = uVar135;
                auVar337._24_4_ = uVar135;
                auVar337._28_4_ = uVar135;
                auVar337._32_4_ = uVar135;
                auVar337._36_4_ = uVar135;
                auVar337._40_4_ = uVar135;
                auVar337._44_4_ = uVar135;
                auVar337._48_4_ = uVar135;
                auVar337._52_4_ = uVar135;
                auVar337._56_4_ = uVar135;
                auVar337._60_4_ = uVar135;
                auVar337 = vfmadd213ps_avx512f(auVar338,auVar336,auVar337);
                auVar337 = vmaxps_avx512f(auVar337,auVar339);
                auVar337 = vminps_avx512f(auVar337,auVar222);
LAB_002d8fad:
                in_ZMM16 = vmulps_avx512f(auVar337,auVar336);
              }
              *(undefined1 (*) [64])((long)top_blob->data + uVar137 * 0x40) = in_ZMM16;
              uVar137 = uVar137 + 1;
            } while (uVar137 != uVar155);
          }
          iVar144 = 0;
        }
        goto LAB_002db035;
      }
      if (0 < (int)uVar135) {
        uVar137 = 0;
        auVar191 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar192 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar262._8_4_ = 0x3f000000;
        auVar262._0_8_ = 0x3f0000003f000000;
        auVar262._12_4_ = 0x3f000000;
        auVar262._16_4_ = 0x3f000000;
        auVar262._20_4_ = 0x3f000000;
        auVar262._24_4_ = 0x3f000000;
        auVar262._28_4_ = 0x3f000000;
        auVar292._8_4_ = 0x3fb8aa3b;
        auVar292._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar292._12_4_ = 0x3fb8aa3b;
        auVar292._16_4_ = 0x3fb8aa3b;
        auVar292._20_4_ = 0x3fb8aa3b;
        auVar292._24_4_ = 0x3fb8aa3b;
        auVar292._28_4_ = 0x3fb8aa3b;
        auVar297._8_4_ = 0x3f800000;
        auVar297._0_8_ = 0x3f8000003f800000;
        auVar297._12_4_ = 0x3f800000;
        auVar297._16_4_ = 0x3f800000;
        auVar297._20_4_ = 0x3f800000;
        auVar297._24_4_ = 0x3f800000;
        auVar297._28_4_ = 0x3f800000;
        auVar302._8_4_ = 0x3f318000;
        auVar302._0_8_ = 0x3f3180003f318000;
        auVar302._12_4_ = 0x3f318000;
        auVar302._16_4_ = 0x3f318000;
        auVar302._20_4_ = 0x3f318000;
        auVar302._24_4_ = 0x3f318000;
        auVar302._28_4_ = 0x3f318000;
        auVar310._8_4_ = 0x39506967;
        auVar310._0_8_ = 0x3950696739506967;
        auVar310._12_4_ = 0x39506967;
        auVar310._16_4_ = 0x39506967;
        auVar310._20_4_ = 0x39506967;
        auVar310._24_4_ = 0x39506967;
        auVar310._28_4_ = 0x39506967;
        auVar314._8_4_ = 0x3ab743ce;
        auVar314._0_8_ = 0x3ab743ce3ab743ce;
        auVar314._12_4_ = 0x3ab743ce;
        auVar314._16_4_ = 0x3ab743ce;
        auVar314._20_4_ = 0x3ab743ce;
        auVar314._24_4_ = 0x3ab743ce;
        auVar314._28_4_ = 0x3ab743ce;
        auVar318._8_4_ = 0x3c088908;
        auVar318._0_8_ = 0x3c0889083c088908;
        auVar318._12_4_ = 0x3c088908;
        auVar318._16_4_ = 0x3c088908;
        auVar318._20_4_ = 0x3c088908;
        auVar318._24_4_ = 0x3c088908;
        auVar318._28_4_ = 0x3c088908;
        auVar322._8_4_ = 0x3d2aa9c1;
        auVar322._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar322._12_4_ = 0x3d2aa9c1;
        auVar322._16_4_ = 0x3d2aa9c1;
        auVar322._20_4_ = 0x3d2aa9c1;
        auVar322._24_4_ = 0x3d2aa9c1;
        auVar322._28_4_ = 0x3d2aa9c1;
        auVar327._8_4_ = 0x3e2aaaaa;
        auVar327._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar327._12_4_ = 0x3e2aaaaa;
        auVar327._16_4_ = 0x3e2aaaaa;
        auVar327._20_4_ = 0x3e2aaaaa;
        auVar327._24_4_ = 0x3e2aaaaa;
        auVar327._28_4_ = 0x3e2aaaaa;
        auVar330._8_4_ = 0x3f800000;
        auVar330._0_8_ = 0x3f8000003f800000;
        auVar330._12_4_ = 0x3f800000;
        auVar330._16_4_ = 0x3f800000;
        auVar330._20_4_ = 0x3f800000;
        auVar330._24_4_ = 0x3f800000;
        auVar330._28_4_ = 0x3f800000;
        auVar334._8_4_ = 0xb95e8083;
        auVar334._0_8_ = 0xb95e8083b95e8083;
        auVar334._12_4_ = 0xb95e8083;
        auVar334._16_4_ = 0xb95e8083;
        auVar334._20_4_ = 0xb95e8083;
        auVar334._24_4_ = 0xb95e8083;
        auVar334._28_4_ = 0xb95e8083;
        auVar193 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
        auVar194 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
        auVar195 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
        auVar196 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar197 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar198 = vbroadcastss_avx512vl(ZEXT416(0xc0000000));
        do {
          auVar217 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar7 != (void *)0x0) {
            auVar217 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar7 + uVar137 * 0x20));
          }
          pauVar141 = (undefined1 (*) [32])
                      ((long)(this->weight_data_tm).w * uVar137 * (this->weight_data_tm).elemsize +
                      (long)(this->weight_data_tm).data);
          auVar165 = in_ZMM17._0_16_;
          auVar164 = in_ZMM16._0_16_;
          auVar168 = in_ZMM20._0_16_;
          auVar167 = in_ZMM19._0_16_;
          auVar169 = in_ZMM23._0_16_;
          auVar166 = in_ZMM18._0_16_;
          pauVar138 = local_3b8;
          if ((int)uVar156 < 8) {
            auVar166 = vxorps_avx512vl(auVar166,auVar166);
            in_ZMM18 = ZEXT1664(auVar166);
            auVar166 = vxorps_avx512vl(auVar169,auVar169);
            in_ZMM23 = ZEXT1664(auVar166);
            auVar166 = vxorps_avx512vl(auVar167,auVar167);
            in_ZMM19 = ZEXT1664(auVar166);
            auVar166 = vxorps_avx512vl(auVar168,auVar168);
            in_ZMM20 = ZEXT1664(auVar166);
            auVar164 = vxorps_avx512vl(auVar164,auVar164);
            in_ZMM16 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar165,auVar165);
            in_ZMM17 = ZEXT1664(auVar164);
            auVar218 = ZEXT864(0);
            uVar149 = 0;
          }
          else {
            auVar218 = ZEXT864(0);
            iVar144 = 7;
            auVar165 = vxorps_avx512vl(auVar165,auVar165);
            in_ZMM17 = ZEXT1664(auVar165);
            auVar164 = vxorps_avx512vl(auVar164,auVar164);
            in_ZMM16 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar168,auVar168);
            in_ZMM20 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar167,auVar167);
            in_ZMM19 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar169,auVar169);
            in_ZMM23 = ZEXT1664(auVar164);
            auVar164 = vxorps_avx512vl(auVar166,auVar166);
            in_ZMM18 = ZEXT1664(auVar164);
            do {
              auVar202 = vlddqu_avx(*pauVar141);
              auVar203 = vlddqu_avx(pauVar141[1]);
              auVar199 = vcvtph2ps_avx512vl(auVar202._0_16_);
              auVar202 = vcvtph2ps_f16c(auVar202._16_16_);
              auVar200 = vcvtph2ps_avx512vl(auVar203._0_16_);
              auVar203 = vcvtph2ps_f16c(auVar203._16_16_);
              uVar1 = *(undefined4 *)*pauVar138;
              auVar201._4_4_ = uVar1;
              auVar201._0_4_ = uVar1;
              auVar201._8_4_ = uVar1;
              auVar201._12_4_ = uVar1;
              auVar201._16_4_ = uVar1;
              auVar201._20_4_ = uVar1;
              auVar201._24_4_ = uVar1;
              auVar201._28_4_ = uVar1;
              auVar201 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar199,auVar201);
              auVar217 = ZEXT3264(auVar201);
              uVar1 = *(undefined4 *)(*pauVar138 + 4);
              auVar199._4_4_ = uVar1;
              auVar199._0_4_ = uVar1;
              auVar199._8_4_ = uVar1;
              auVar199._12_4_ = uVar1;
              auVar199._16_4_ = uVar1;
              auVar199._20_4_ = uVar1;
              auVar199._24_4_ = uVar1;
              auVar199._28_4_ = uVar1;
              auVar202 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar202,auVar199);
              auVar218 = ZEXT3264(auVar202);
              uVar1 = *(undefined4 *)(*pauVar138 + 8);
              auVar202._4_4_ = uVar1;
              auVar202._0_4_ = uVar1;
              auVar202._8_4_ = uVar1;
              auVar202._12_4_ = uVar1;
              auVar202._16_4_ = uVar1;
              auVar202._20_4_ = uVar1;
              auVar202._24_4_ = uVar1;
              auVar202._28_4_ = uVar1;
              auVar202 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar200,auVar202);
              in_ZMM17 = ZEXT3264(auVar202);
              uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
              auVar200._4_4_ = uVar1;
              auVar200._0_4_ = uVar1;
              auVar200._8_4_ = uVar1;
              auVar200._12_4_ = uVar1;
              auVar200._16_4_ = uVar1;
              auVar200._20_4_ = uVar1;
              auVar200._24_4_ = uVar1;
              auVar200._28_4_ = uVar1;
              auVar202 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar203,auVar200);
              in_ZMM16 = ZEXT3264(auVar202);
              auVar202 = vlddqu_avx(pauVar141[2]);
              auVar203 = vlddqu_avx(pauVar141[3]);
              auVar201 = vcvtph2ps_avx512vl(auVar202._0_16_);
              auVar202 = vcvtph2ps_f16c(auVar202._16_16_);
              auVar199 = vcvtph2ps_avx512vl(auVar203._0_16_);
              auVar203 = vcvtph2ps_f16c(auVar203._16_16_);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x10);
              auVar58._4_4_ = uVar1;
              auVar58._0_4_ = uVar1;
              auVar58._8_4_ = uVar1;
              auVar58._12_4_ = uVar1;
              auVar58._16_4_ = uVar1;
              auVar58._20_4_ = uVar1;
              auVar58._24_4_ = uVar1;
              auVar58._28_4_ = uVar1;
              auVar201 = vfmadd231ps_avx512vl(in_ZMM20._0_32_,auVar201,auVar58);
              in_ZMM20 = ZEXT3264(auVar201);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x14);
              auVar59._4_4_ = uVar1;
              auVar59._0_4_ = uVar1;
              auVar59._8_4_ = uVar1;
              auVar59._12_4_ = uVar1;
              auVar59._16_4_ = uVar1;
              auVar59._20_4_ = uVar1;
              auVar59._24_4_ = uVar1;
              auVar59._28_4_ = uVar1;
              auVar202 = vfmadd231ps_avx512vl(in_ZMM19._0_32_,auVar202,auVar59);
              in_ZMM19 = ZEXT3264(auVar202);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x18);
              auVar60._4_4_ = uVar1;
              auVar60._0_4_ = uVar1;
              auVar60._8_4_ = uVar1;
              auVar60._12_4_ = uVar1;
              auVar60._16_4_ = uVar1;
              auVar60._20_4_ = uVar1;
              auVar60._24_4_ = uVar1;
              auVar60._28_4_ = uVar1;
              auVar202 = vfmadd231ps_avx512vl(in_ZMM23._0_32_,auVar199,auVar60);
              in_ZMM23 = ZEXT3264(auVar202);
              uVar1 = *(undefined4 *)(*pauVar138 + 0x1c);
              auVar61._4_4_ = uVar1;
              auVar61._0_4_ = uVar1;
              auVar61._8_4_ = uVar1;
              auVar61._12_4_ = uVar1;
              auVar61._16_4_ = uVar1;
              auVar61._20_4_ = uVar1;
              auVar61._24_4_ = uVar1;
              auVar61._28_4_ = uVar1;
              auVar202 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar203,auVar61);
              in_ZMM18 = ZEXT3264(auVar202);
              pauVar138 = pauVar138 + 1;
              pauVar141 = pauVar141 + 4;
              iVar144 = iVar144 + 8;
              uVar149 = uVar156 & 0xfffffff8;
            } while (iVar144 < (int)uVar156);
          }
          auVar202 = auVar218._0_32_;
          uVar150 = uVar149 | 3;
          while( true ) {
            auVar203 = auVar217._0_32_;
            if ((int)uVar156 <= (int)uVar150) break;
            auVar202 = vlddqu_avx(*pauVar141);
            auVar201 = vlddqu_avx(pauVar141[1]);
            auVar199 = vcvtph2ps_avx512vl(auVar202._0_16_);
            auVar202 = vcvtph2ps_f16c(auVar202._16_16_);
            auVar200 = vcvtph2ps_avx512vl(auVar201._0_16_);
            uVar1 = *(undefined4 *)*pauVar138;
            auVar62._4_4_ = uVar1;
            auVar62._0_4_ = uVar1;
            auVar62._8_4_ = uVar1;
            auVar62._12_4_ = uVar1;
            auVar62._16_4_ = uVar1;
            auVar62._20_4_ = uVar1;
            auVar62._24_4_ = uVar1;
            auVar62._28_4_ = uVar1;
            auVar203 = vfmadd231ps_avx512vl(auVar203,auVar199,auVar62);
            auVar217 = ZEXT3264(auVar203);
            uVar1 = *(undefined4 *)(*pauVar138 + 4);
            auVar63._4_4_ = uVar1;
            auVar63._0_4_ = uVar1;
            auVar63._8_4_ = uVar1;
            auVar63._12_4_ = uVar1;
            auVar63._16_4_ = uVar1;
            auVar63._20_4_ = uVar1;
            auVar63._24_4_ = uVar1;
            auVar63._28_4_ = uVar1;
            auVar202 = vfmadd231ps_avx512vl(auVar218._0_32_,auVar202,auVar63);
            auVar218 = ZEXT3264(auVar202);
            uVar1 = *(undefined4 *)(*pauVar138 + 8);
            auVar64._4_4_ = uVar1;
            auVar64._0_4_ = uVar1;
            auVar64._8_4_ = uVar1;
            auVar64._12_4_ = uVar1;
            auVar64._16_4_ = uVar1;
            auVar64._20_4_ = uVar1;
            auVar64._24_4_ = uVar1;
            auVar64._28_4_ = uVar1;
            auVar203 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar200,auVar64);
            in_ZMM17 = ZEXT3264(auVar203);
            auVar203 = vcvtph2ps_f16c(auVar201._16_16_);
            uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
            auVar65._4_4_ = uVar1;
            auVar65._0_4_ = uVar1;
            auVar65._8_4_ = uVar1;
            auVar65._12_4_ = uVar1;
            auVar65._16_4_ = uVar1;
            auVar65._20_4_ = uVar1;
            auVar65._24_4_ = uVar1;
            auVar65._28_4_ = uVar1;
            auVar203 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar203,auVar65);
            in_ZMM16 = ZEXT3264(auVar203);
            pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
            pauVar141 = pauVar141 + 2;
            uVar150 = uVar149 + 7;
            uVar149 = uVar149 + 4;
          }
          if (uVar156 - uVar149 != 0 && (int)uVar149 <= (int)uVar156) {
            lVar145 = 0;
            do {
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])*pauVar141);
              auVar203 = vcvtph2ps_f16c(auVar164);
              uVar1 = *(undefined4 *)(*pauVar138 + lVar145 * 4);
              auVar66._4_4_ = uVar1;
              auVar66._0_4_ = uVar1;
              auVar66._8_4_ = uVar1;
              auVar66._12_4_ = uVar1;
              auVar66._16_4_ = uVar1;
              auVar66._20_4_ = uVar1;
              auVar66._24_4_ = uVar1;
              auVar66._28_4_ = uVar1;
              auVar203 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar203,auVar66);
              auVar217 = ZEXT3264(auVar203);
              pauVar141 = (undefined1 (*) [32])(*pauVar141 + 0x10);
              lVar145 = lVar145 + 1;
            } while (uVar156 - uVar149 != (int)lVar145);
          }
          auVar201 = vaddps_avx512vl(in_ZMM23._0_32_,in_ZMM18._0_32_);
          auVar199 = vaddps_avx512vl(in_ZMM19._0_32_,in_ZMM20._0_32_);
          auVar200 = vaddps_avx512vl(in_ZMM16._0_32_,in_ZMM17._0_32_);
          auVar209._0_4_ =
               auVar201._0_4_ + auVar199._0_4_ + auVar202._0_4_ + auVar200._0_4_ + auVar203._0_4_;
          auVar209._4_4_ =
               auVar201._4_4_ + auVar199._4_4_ + auVar202._4_4_ + auVar200._4_4_ + auVar203._4_4_;
          auVar209._8_4_ =
               auVar201._8_4_ + auVar199._8_4_ + auVar202._8_4_ + auVar200._8_4_ + auVar203._8_4_;
          auVar209._12_4_ =
               auVar201._12_4_ + auVar199._12_4_ + auVar202._12_4_ + auVar200._12_4_ +
               auVar203._12_4_;
          auVar209._16_4_ =
               auVar201._16_4_ + auVar199._16_4_ + auVar202._16_4_ + auVar200._16_4_ +
               auVar203._16_4_;
          auVar209._20_4_ =
               auVar201._20_4_ + auVar199._20_4_ + auVar202._20_4_ + auVar200._20_4_ +
               auVar203._20_4_;
          auVar209._24_4_ =
               auVar201._24_4_ + auVar199._24_4_ + auVar202._24_4_ + auVar200._24_4_ +
               auVar203._24_4_;
          auVar209._28_4_ =
               auVar201._28_4_ + auVar199._28_4_ + auVar202._28_4_ + auVar200._28_4_ +
               auVar203._28_4_;
          if (5 < iVar5 - 1U) goto LAB_002d9586;
          auVar202 = ZEXT1632(ZEXT816(0) << 0x40);
          switch(iVar5) {
          case 1:
            auVar209 = vmaxps_avx(auVar209,ZEXT1632(ZEXT816(0) << 0x40));
            break;
          case 2:
            auVar203 = vmaxps_avx(auVar209,auVar202);
            auVar202 = vminps_avx(auVar209,auVar202);
            uVar1 = *(this->super_InnerProduct).activation_params.data;
            auVar80._4_4_ = uVar1;
            auVar80._0_4_ = uVar1;
            auVar80._8_4_ = uVar1;
            auVar80._12_4_ = uVar1;
            auVar80._16_4_ = uVar1;
            auVar80._20_4_ = uVar1;
            auVar80._24_4_ = uVar1;
            auVar80._28_4_ = uVar1;
            auVar209 = vfmadd132ps_avx512vl(auVar202,auVar203,auVar80);
            break;
          case 3:
            puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar8;
            auVar78._4_4_ = uVar1;
            auVar78._0_4_ = uVar1;
            auVar78._8_4_ = uVar1;
            auVar78._12_4_ = uVar1;
            auVar78._16_4_ = uVar1;
            auVar78._20_4_ = uVar1;
            auVar78._24_4_ = uVar1;
            auVar78._28_4_ = uVar1;
            auVar202 = vmaxps_avx512vl(auVar209,auVar78);
            uVar1 = puVar8[1];
            auVar79._4_4_ = uVar1;
            auVar79._0_4_ = uVar1;
            auVar79._8_4_ = uVar1;
            auVar79._12_4_ = uVar1;
            auVar79._16_4_ = uVar1;
            auVar79._20_4_ = uVar1;
            auVar79._24_4_ = uVar1;
            auVar79._28_4_ = uVar1;
            auVar209 = vminps_avx512vl(auVar202,auVar79);
            break;
          case 4:
            auVar76._8_4_ = 0x80000000;
            auVar76._0_8_ = 0x8000000080000000;
            auVar76._12_4_ = 0x80000000;
            auVar76._16_4_ = 0x80000000;
            auVar76._20_4_ = 0x80000000;
            auVar76._24_4_ = 0x80000000;
            auVar76._28_4_ = 0x80000000;
            auVar202 = vxorps_avx512vl(auVar209,auVar76);
            auVar202 = vminps_avx512vl(auVar202,auVar191);
            auVar203 = vmaxps_avx512vl(auVar202,auVar192);
            auVar164 = vfmadd231ps_fma(auVar262,auVar203,auVar292);
            auVar202 = vroundps_avx(ZEXT1632(auVar164),1);
            uVar15 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar202,1);
            auVar201 = vsubps_avx512vl(auVar202,auVar297);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar210._0_4_ = (float)((uint)bVar13 * auVar201._0_4_ | (uint)!bVar13 * auVar202._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar210._4_4_ = (float)((uint)bVar13 * auVar201._4_4_ | (uint)!bVar13 * auVar202._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar210._8_4_ = (float)((uint)bVar13 * auVar201._8_4_ | (uint)!bVar13 * auVar202._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar210._12_4_ =
                 (float)((uint)bVar13 * auVar201._12_4_ | (uint)!bVar13 * auVar202._12_4_);
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar210._16_4_ =
                 (float)((uint)bVar13 * auVar201._16_4_ | (uint)!bVar13 * auVar202._16_4_);
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar210._20_4_ =
                 (float)((uint)bVar13 * auVar201._20_4_ | (uint)!bVar13 * auVar202._20_4_);
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar210._24_4_ =
                 (float)((uint)bVar13 * auVar201._24_4_ | (uint)!bVar13 * auVar202._24_4_);
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar210._28_4_ =
                 (float)((uint)bVar13 * auVar201._28_4_ | (uint)!bVar13 * auVar202._28_4_);
            auVar164 = vfmsub231ps_fma(auVar203,auVar210,auVar302);
            auVar77._8_4_ = 0x395e8083;
            auVar77._0_8_ = 0x395e8083395e8083;
            auVar77._12_4_ = 0x395e8083;
            auVar77._16_4_ = 0x395e8083;
            auVar77._20_4_ = 0x395e8083;
            auVar77._24_4_ = 0x395e8083;
            auVar77._28_4_ = 0x395e8083;
            auVar202 = vfmsub231ps_avx512vl(ZEXT1632(auVar164),auVar210,auVar77);
            auVar256._0_4_ = auVar202._0_4_ * auVar202._0_4_;
            auVar256._4_4_ = auVar202._4_4_ * auVar202._4_4_;
            auVar256._8_4_ = auVar202._8_4_ * auVar202._8_4_;
            auVar256._12_4_ = auVar202._12_4_ * auVar202._12_4_;
            auVar256._16_4_ = auVar202._16_4_ * auVar202._16_4_;
            auVar256._20_4_ = auVar202._20_4_ * auVar202._20_4_;
            auVar256._24_4_ = auVar202._24_4_ * auVar202._24_4_;
            auVar256._28_4_ = 0;
            auVar164 = vfmadd213ps_fma(auVar310,auVar202,auVar314);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar202,auVar318);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar202,auVar322);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar202,auVar327);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar202,auVar262);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar256,auVar202);
            auVar242._0_4_ = auVar164._0_4_ + 1.0;
            auVar242._4_4_ = auVar164._4_4_ + 1.0;
            auVar242._8_4_ = auVar164._8_4_ + 1.0;
            auVar242._12_4_ = auVar164._12_4_ + 1.0;
            auVar242._16_4_ = 0x3f800000;
            auVar242._20_4_ = 0x3f800000;
            auVar242._24_4_ = 0x3f800000;
            auVar242._28_4_ = 0x3f800000;
            auVar257._0_4_ = (int)auVar210._0_4_;
            auVar257._4_4_ = (int)auVar210._4_4_;
            auVar257._8_4_ = (int)auVar210._8_4_;
            auVar257._12_4_ = (int)auVar210._12_4_;
            auVar257._16_4_ = (int)auVar210._16_4_;
            auVar257._20_4_ = (int)auVar210._20_4_;
            auVar257._24_4_ = (int)auVar210._24_4_;
            auVar257._28_4_ = (int)auVar210._28_4_;
            auVar202 = vpslld_avx2(auVar257,0x17);
            auVar202 = vpaddd_avx2(auVar330,auVar202);
            auVar164 = vfmadd213ps_fma(auVar202,auVar242,auVar297);
            auVar209 = vdivps_avx(auVar297,ZEXT1632(auVar164));
            break;
          case 5:
            auVar203 = vminps_avx512vl(auVar209,auVar191);
            auVar201 = vmaxps_avx512vl(auVar203,auVar192);
            auVar164 = vfmadd213ps_fma(auVar292,auVar201,auVar262);
            auVar203 = vroundps_avx(ZEXT1632(auVar164),1);
            uVar15 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar203,1);
            auVar199 = vsubps_avx512vl(auVar203,auVar297);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar204._0_4_ = (float)((uint)bVar13 * auVar199._0_4_ | (uint)!bVar13 * auVar203._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar204._4_4_ = (float)((uint)bVar13 * auVar199._4_4_ | (uint)!bVar13 * auVar203._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar204._8_4_ = (float)((uint)bVar13 * auVar199._8_4_ | (uint)!bVar13 * auVar203._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar204._12_4_ =
                 (float)((uint)bVar13 * auVar199._12_4_ | (uint)!bVar13 * auVar203._12_4_);
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar204._16_4_ =
                 (float)((uint)bVar13 * auVar199._16_4_ | (uint)!bVar13 * auVar203._16_4_);
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar204._20_4_ =
                 (float)((uint)bVar13 * auVar199._20_4_ | (uint)!bVar13 * auVar203._20_4_);
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar204._24_4_ =
                 (float)((uint)bVar13 * auVar199._24_4_ | (uint)!bVar13 * auVar203._24_4_);
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar204._28_4_ =
                 (float)((uint)bVar13 * auVar199._28_4_ | (uint)!bVar13 * auVar203._28_4_);
            auVar164 = vfmsub231ps_fma(auVar201,auVar204,auVar302);
            auVar164 = vfnmsub231ps_fma(ZEXT1632(auVar164),auVar204,auVar334);
            auVar201 = ZEXT1632(auVar164);
            auVar203 = vfmadd213ps_avx512vl(auVar310,auVar201,auVar314);
            auVar203 = vfmadd213ps_avx512vl(auVar203,auVar201,auVar318);
            auVar203 = vfmadd213ps_avx512vl(auVar203,auVar201,auVar322);
            auVar201 = ZEXT1632(auVar164);
            auVar203 = vfmadd213ps_avx512vl(auVar203,auVar201,auVar327);
            auVar203 = vfmadd213ps_avx512vl(auVar203,auVar201,auVar262);
            auVar203 = vfmadd213ps_avx512vl
                                 (auVar203,ZEXT1632(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                                              CONCAT48(auVar164._8_4_ *
                                                                       auVar164._8_4_,
                                                                       CONCAT44(auVar164._4_4_ *
                                                                                auVar164._4_4_,
                                                                                auVar164._0_4_ *
                                                                                auVar164._0_4_)))),
                                  auVar201);
            auVar201 = vaddps_avx512vl(auVar203,auVar297);
            auVar277._0_4_ = (int)auVar204._0_4_;
            auVar277._4_4_ = (int)auVar204._4_4_;
            auVar277._8_4_ = (int)auVar204._8_4_;
            auVar277._12_4_ = (int)auVar204._12_4_;
            auVar277._16_4_ = (int)auVar204._16_4_;
            auVar277._20_4_ = (int)auVar204._20_4_;
            auVar277._24_4_ = (int)auVar204._24_4_;
            auVar277._28_4_ = (int)auVar204._28_4_;
            auVar203 = vpslld_avx2(auVar277,0x17);
            auVar203 = vpaddd_avx2(auVar330,auVar203);
            auVar164 = vfmadd213ps_fma(auVar203,auVar201,auVar297);
            uVar15 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar202,2);
            auVar67._8_4_ = 0x800000;
            auVar67._0_8_ = 0x80000000800000;
            auVar67._12_4_ = 0x800000;
            auVar67._16_4_ = 0x800000;
            auVar67._20_4_ = 0x800000;
            auVar67._24_4_ = 0x800000;
            auVar67._28_4_ = 0x800000;
            auVar202 = vmaxps_avx512vl(ZEXT1632(auVar164),auVar67);
            auVar199 = vpsrld_avx2(auVar202,0x17);
            auVar306._8_4_ = 0x807fffff;
            auVar306._0_8_ = 0x807fffff807fffff;
            auVar306._12_4_ = 0x807fffff;
            auVar306._16_4_ = 0x807fffff;
            auVar306._20_4_ = 0x807fffff;
            auVar306._24_4_ = 0x807fffff;
            auVar306._28_4_ = 0x807fffff;
            auVar68._8_4_ = 0x3f000000;
            auVar68._0_8_ = 0x3f0000003f000000;
            auVar68._12_4_ = 0x3f000000;
            auVar68._16_4_ = 0x3f000000;
            auVar68._20_4_ = 0x3f000000;
            auVar68._24_4_ = 0x3f000000;
            auVar68._28_4_ = 0x3f000000;
            auVar202 = vpternlogd_avx512vl(auVar202,auVar306,auVar68,0xea);
            auVar69._8_4_ = 0x3f3504f3;
            auVar69._0_8_ = 0x3f3504f33f3504f3;
            auVar69._12_4_ = 0x3f3504f3;
            auVar69._16_4_ = 0x3f3504f3;
            auVar69._20_4_ = 0x3f3504f3;
            auVar69._24_4_ = 0x3f3504f3;
            auVar69._28_4_ = 0x3f3504f3;
            uVar16 = vcmpps_avx512vl(auVar202,auVar69,1);
            auVar203 = vaddps_avx512vl(auVar202,auVar193);
            auVar201 = vaddps_avx512vl(auVar203,auVar202);
            bVar13 = (bool)((byte)uVar16 & 1);
            auVar205._0_4_ = (float)((uint)bVar13 * auVar201._0_4_ | (uint)!bVar13 * auVar203._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar205._4_4_ = (float)((uint)bVar13 * auVar201._4_4_ | (uint)!bVar13 * auVar203._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar205._8_4_ = (float)((uint)bVar13 * auVar201._8_4_ | (uint)!bVar13 * auVar203._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar205._12_4_ =
                 (float)((uint)bVar13 * auVar201._12_4_ | (uint)!bVar13 * auVar203._12_4_);
            bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar205._16_4_ =
                 (float)((uint)bVar13 * auVar201._16_4_ | (uint)!bVar13 * auVar203._16_4_);
            bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar205._20_4_ =
                 (float)((uint)bVar13 * auVar201._20_4_ | (uint)!bVar13 * auVar203._20_4_);
            bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar205._24_4_ =
                 (float)((uint)bVar13 * auVar201._24_4_ | (uint)!bVar13 * auVar203._24_4_);
            bVar13 = SUB81(uVar16 >> 7,0);
            auVar205._28_4_ = (uint)bVar13 * auVar201._28_4_ | (uint)!bVar13 * auVar203._28_4_;
            auVar115._4_4_ = auVar205._4_4_ * auVar205._4_4_;
            auVar115._0_4_ = auVar205._0_4_ * auVar205._0_4_;
            auVar115._8_4_ = auVar205._8_4_ * auVar205._8_4_;
            auVar115._12_4_ = auVar205._12_4_ * auVar205._12_4_;
            auVar115._16_4_ = auVar205._16_4_ * auVar205._16_4_;
            auVar115._20_4_ = auVar205._20_4_ * auVar205._20_4_;
            auVar115._24_4_ = auVar205._24_4_ * auVar205._24_4_;
            auVar115._28_4_ = auVar202._28_4_;
            auVar70._8_4_ = 0xbdebd1b8;
            auVar70._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar70._12_4_ = 0xbdebd1b8;
            auVar70._16_4_ = 0xbdebd1b8;
            auVar70._20_4_ = 0xbdebd1b8;
            auVar70._24_4_ = 0xbdebd1b8;
            auVar70._28_4_ = 0xbdebd1b8;
            auVar202 = vfmadd213ps_avx512vl(auVar194,auVar205,auVar70);
            auVar71._8_4_ = 0x3def251a;
            auVar71._0_8_ = 0x3def251a3def251a;
            auVar71._12_4_ = 0x3def251a;
            auVar71._16_4_ = 0x3def251a;
            auVar71._20_4_ = 0x3def251a;
            auVar71._24_4_ = 0x3def251a;
            auVar71._28_4_ = 0x3def251a;
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar205,auVar71);
            auVar72._8_4_ = 0xbdfe5d4f;
            auVar72._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar72._12_4_ = 0xbdfe5d4f;
            auVar72._16_4_ = 0xbdfe5d4f;
            auVar72._20_4_ = 0xbdfe5d4f;
            auVar72._24_4_ = 0xbdfe5d4f;
            auVar72._28_4_ = 0xbdfe5d4f;
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar205,auVar72);
            auVar73._8_4_ = 0x3e11e9bf;
            auVar73._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar73._12_4_ = 0x3e11e9bf;
            auVar73._16_4_ = 0x3e11e9bf;
            auVar73._20_4_ = 0x3e11e9bf;
            auVar73._24_4_ = 0x3e11e9bf;
            auVar73._28_4_ = 0x3e11e9bf;
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar205,auVar73);
            auVar74._8_4_ = 0xbe2aae50;
            auVar74._0_8_ = 0xbe2aae50be2aae50;
            auVar74._12_4_ = 0xbe2aae50;
            auVar74._16_4_ = 0xbe2aae50;
            auVar74._20_4_ = 0xbe2aae50;
            auVar74._24_4_ = 0xbe2aae50;
            auVar74._28_4_ = 0xbe2aae50;
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar205,auVar74);
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar205,auVar195);
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar205,auVar196);
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar205,auVar197);
            auVar203 = vmulps_avx512vl(auVar115,auVar205);
            in_ZMM17 = ZEXT3264(auVar203);
            auVar203 = vmulps_avx512vl(auVar203,auVar202);
            auVar75._8_4_ = 0xffffff82;
            auVar75._0_8_ = 0xffffff82ffffff82;
            auVar75._12_4_ = 0xffffff82;
            auVar75._16_4_ = 0xffffff82;
            auVar75._20_4_ = 0xffffff82;
            auVar75._24_4_ = 0xffffff82;
            auVar75._28_4_ = 0xffffff82;
            auVar202 = vpaddd_avx512vl(auVar199,auVar75);
            auVar202 = vcvtdq2ps_avx(auVar202);
            auVar201 = vsubps_avx512vl(auVar202,auVar297);
            bVar13 = (bool)((byte)uVar16 & 1);
            auVar206._0_4_ = (uint)bVar13 * auVar201._0_4_ | (uint)!bVar13 * auVar202._0_4_;
            bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
            auVar206._4_4_ = (uint)bVar13 * auVar201._4_4_ | (uint)!bVar13 * auVar202._4_4_;
            bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
            auVar206._8_4_ = (uint)bVar13 * auVar201._8_4_ | (uint)!bVar13 * auVar202._8_4_;
            bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
            auVar206._12_4_ = (uint)bVar13 * auVar201._12_4_ | (uint)!bVar13 * auVar202._12_4_;
            bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
            auVar206._16_4_ = (uint)bVar13 * auVar201._16_4_ | (uint)!bVar13 * auVar202._16_4_;
            bVar13 = (bool)((byte)(uVar16 >> 5) & 1);
            auVar206._20_4_ = (uint)bVar13 * auVar201._20_4_ | (uint)!bVar13 * auVar202._20_4_;
            bVar13 = (bool)((byte)(uVar16 >> 6) & 1);
            auVar206._24_4_ = (uint)bVar13 * auVar201._24_4_ | (uint)!bVar13 * auVar202._24_4_;
            bVar13 = SUB81(uVar16 >> 7,0);
            auVar206._28_4_ = (uint)bVar13 * auVar201._28_4_ | (uint)!bVar13 * auVar202._28_4_;
            auVar202 = vfmadd231ps_avx512vl(auVar203,auVar206,auVar334);
            auVar202 = vfmsub231ps_avx512vl(auVar202,auVar262,auVar115);
            auVar202 = vsubps_avx512vl(auVar202,auVar205);
            auVar164 = vfmsub231ps_fma(auVar202,auVar302,auVar206);
            auVar202 = vmulps_avx512vl(ZEXT1632(auVar164),auVar198);
            auVar203 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar207._0_4_ = (uint)bVar13 * auVar203._0_4_ | (uint)!bVar13 * auVar202._0_4_;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar207._4_4_ = (uint)bVar13 * auVar203._4_4_ | (uint)!bVar13 * auVar202._4_4_;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar207._8_4_ = (uint)bVar13 * auVar203._8_4_ | (uint)!bVar13 * auVar202._8_4_;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar207._12_4_ = (uint)bVar13 * auVar203._12_4_ | (uint)!bVar13 * auVar202._12_4_;
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar207._16_4_ = (uint)bVar13 * auVar203._16_4_ | (uint)!bVar13 * auVar202._16_4_;
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar207._20_4_ = (uint)bVar13 * auVar203._20_4_ | (uint)!bVar13 * auVar202._20_4_;
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar207._24_4_ = (uint)bVar13 * auVar203._24_4_ | (uint)!bVar13 * auVar202._24_4_;
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar207._28_4_ = (uint)bVar13 * auVar203._28_4_ | (uint)!bVar13 * auVar202._28_4_;
            auVar202 = vminps_avx512vl(auVar207,auVar191);
            auVar203 = vmaxps_avx512vl(auVar202,auVar192);
            auVar164 = vfmadd213ps_fma(auVar292,auVar203,auVar262);
            auVar202 = vroundps_avx(ZEXT1632(auVar164),1);
            uVar15 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar202,1);
            auVar201 = vsubps_avx512vl(auVar202,auVar297);
            bVar13 = (bool)((byte)uVar15 & 1);
            auVar208._0_4_ = (float)((uint)bVar13 * auVar201._0_4_ | (uint)!bVar13 * auVar202._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
            auVar208._4_4_ = (float)((uint)bVar13 * auVar201._4_4_ | (uint)!bVar13 * auVar202._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
            auVar208._8_4_ = (float)((uint)bVar13 * auVar201._8_4_ | (uint)!bVar13 * auVar202._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
            auVar208._12_4_ =
                 (float)((uint)bVar13 * auVar201._12_4_ | (uint)!bVar13 * auVar202._12_4_);
            bVar13 = (bool)((byte)(uVar15 >> 4) & 1);
            auVar208._16_4_ =
                 (float)((uint)bVar13 * auVar201._16_4_ | (uint)!bVar13 * auVar202._16_4_);
            bVar13 = (bool)((byte)(uVar15 >> 5) & 1);
            auVar208._20_4_ =
                 (float)((uint)bVar13 * auVar201._20_4_ | (uint)!bVar13 * auVar202._20_4_);
            bVar13 = (bool)((byte)(uVar15 >> 6) & 1);
            auVar208._24_4_ =
                 (float)((uint)bVar13 * auVar201._24_4_ | (uint)!bVar13 * auVar202._24_4_);
            bVar13 = SUB81(uVar15 >> 7,0);
            auVar208._28_4_ =
                 (float)((uint)bVar13 * auVar201._28_4_ | (uint)!bVar13 * auVar202._28_4_);
            auVar164 = vfmsub231ps_fma(auVar203,auVar208,auVar302);
            auVar164 = vfnmsub231ps_fma(ZEXT1632(auVar164),auVar208,auVar334);
            auVar203 = ZEXT1632(auVar164);
            auVar202 = vfmadd213ps_avx512vl(auVar310,auVar203,auVar314);
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar203,auVar318);
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar203,auVar322);
            auVar203 = ZEXT1632(auVar164);
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar203,auVar327);
            auVar202 = vfmadd213ps_avx512vl(auVar202,auVar203,auVar262);
            auVar202 = vfmadd213ps_avx512vl
                                 (auVar202,ZEXT1632(CONCAT412(auVar164._12_4_ * auVar164._12_4_,
                                                              CONCAT48(auVar164._8_4_ *
                                                                       auVar164._8_4_,
                                                                       CONCAT44(auVar164._4_4_ *
                                                                                auVar164._4_4_,
                                                                                auVar164._0_4_ *
                                                                                auVar164._0_4_)))),
                                  auVar203);
            in_ZMM16 = ZEXT3264(auVar202);
            auVar203 = vaddps_avx512vl(auVar202,auVar297);
            auVar278._0_4_ = (int)auVar208._0_4_;
            auVar278._4_4_ = (int)auVar208._4_4_;
            auVar278._8_4_ = (int)auVar208._8_4_;
            auVar278._12_4_ = (int)auVar208._12_4_;
            auVar278._16_4_ = (int)auVar208._16_4_;
            auVar278._20_4_ = (int)auVar208._20_4_;
            auVar278._24_4_ = (int)auVar208._24_4_;
            auVar278._28_4_ = (int)auVar208._28_4_;
            auVar202 = vpslld_avx2(auVar278,0x17);
            auVar202 = vpaddd_avx2(auVar330,auVar202);
            auVar164 = vfmadd213ps_fma(auVar202,auVar203,auVar297);
            auVar202 = vdivps_avx(auVar297,ZEXT1632(auVar164));
            auVar202 = vfnmadd213ps_avx512vl(auVar202,auVar198,auVar193);
            auVar190 = auVar202._0_28_;
            goto LAB_002d9582;
          case 6:
            puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar8;
            auVar258._4_4_ = uVar1;
            auVar258._0_4_ = uVar1;
            auVar258._8_4_ = uVar1;
            auVar258._12_4_ = uVar1;
            auVar258._16_4_ = uVar1;
            auVar258._20_4_ = uVar1;
            auVar258._24_4_ = uVar1;
            auVar258._28_4_ = uVar1;
            uVar1 = puVar8[1];
            auVar203._4_4_ = uVar1;
            auVar203._0_4_ = uVar1;
            auVar203._8_4_ = uVar1;
            auVar203._12_4_ = uVar1;
            auVar203._16_4_ = uVar1;
            auVar203._20_4_ = uVar1;
            auVar203._24_4_ = uVar1;
            auVar203._28_4_ = uVar1;
            auVar203 = vfmadd213ps_avx512vl(auVar258,auVar209,auVar203);
            auVar202 = vmaxps_avx(auVar203,auVar202);
            auVar202 = vminps_avx(auVar202,auVar297);
            auVar190 = auVar202._0_28_;
LAB_002d9582:
            auVar209._4_4_ = auVar190._4_4_ * auVar209._4_4_;
            auVar209._0_4_ = auVar190._0_4_ * auVar209._0_4_;
            auVar209._8_4_ = auVar190._8_4_ * auVar209._8_4_;
            auVar209._12_4_ = auVar190._12_4_ * auVar209._12_4_;
            auVar209._16_4_ = auVar190._16_4_ * auVar209._16_4_;
            auVar209._20_4_ = auVar190._20_4_ * auVar209._20_4_;
            auVar209._24_4_ = auVar190._24_4_ * auVar209._24_4_;
          }
LAB_002d9586:
          *(undefined1 (*) [32])((long)top_blob->data + uVar137 * 0x20) = auVar209;
          uVar137 = uVar137 + 1;
        } while (uVar137 != uVar155);
      }
    }
    if (iVar134 == 1) {
      if (0 < (int)uVar135 >> 3) {
        local_220 = (ulong)(uint)((int)uVar135 >> 3);
        lVar145 = 7;
        lVar140 = 6;
        lVar142 = 5;
        lVar143 = 4;
        lVar146 = 3;
        lVar161 = 2;
        lVar157 = 1;
        local_308 = 0;
        uVar155 = 0;
        do {
          local_300 = uVar155 * 8;
          auVar217 = ZEXT1664(ZEXT816(0) << 0x40);
          if (pvVar7 != (void *)0x0) {
            auVar217 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar7 + uVar155 * 0x20));
          }
          auVar191 = auVar217._0_32_;
          lVar136 = (long)(this->weight_data_tm).w;
          pvVar10 = (this->weight_data_tm).data;
          sVar11 = (this->weight_data_tm).elemsize;
          pauVar141 = local_3b8;
          if ((int)uVar156 < 8) {
            lVar136 = sVar11 * lVar136;
            lVar159 = lVar136 * local_300;
            lVar148 = (local_300 | 1) * lVar136;
            lVar147 = (local_300 | 2) * lVar136;
            lVar154 = (local_300 | 3) * lVar136;
            lVar153 = (local_300 | 4) * lVar136;
            lVar152 = (local_300 | 5) * lVar136;
            lVar151 = (local_300 | 6) * lVar136;
            lVar139 = (local_300 | 7) * lVar136;
            uVar149 = 0;
            local_b8 = SUB6432(ZEXT864(0),0);
            local_d8 = SUB6432(ZEXT864(0),0);
            local_f8 = SUB6432(ZEXT864(0),0);
            local_118 = SUB6432(ZEXT864(0),0);
            local_138 = SUB6432(ZEXT864(0),0);
            local_158 = SUB6432(ZEXT864(0),0);
            local_178 = SUB6432(ZEXT864(0),0);
            local_98 = SUB6432(ZEXT864(0),0);
          }
          else {
            lVar139 = sVar11 * lVar145 * lVar136;
            lVar151 = sVar11 * lVar140 * lVar136;
            lVar152 = sVar11 * lVar142 * lVar136;
            lVar153 = sVar11 * lVar143 * lVar136;
            lVar154 = sVar11 * lVar146 * lVar136;
            lVar147 = sVar11 * lVar161 * lVar136;
            lVar148 = sVar11 * lVar157 * lVar136;
            local_2a8._0_8_ = lVar148;
            lVar136 = sVar11 * local_308 * lVar136;
            auVar218 = ZEXT864(0);
            auVar336 = ZEXT864(0);
            auVar339 = ZEXT864(0);
            auVar223 = ZEXT864(0);
            auVar222 = ZEXT864(0);
            auVar221 = ZEXT864(0);
            auVar220 = ZEXT864(0);
            auVar219 = ZEXT864(0);
            iVar144 = 7;
            lVar159 = 0;
            do {
              auVar192 = *(undefined1 (*) [32])(*local_3b8 + lVar159 * 2);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar136));
              auVar193 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar148));
              auVar194 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar147));
              auVar195 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar154));
              auVar196 = vcvtph2ps_f16c(auVar164);
              auVar164 = vfmadd231ps_fma(auVar218._0_32_,auVar192,auVar193);
              auVar218 = ZEXT1664(auVar164);
              local_98 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar336._0_32_,auVar192,auVar194);
              auVar336 = ZEXT1664(auVar164);
              local_178 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar339._0_32_,auVar192,auVar195);
              auVar339 = ZEXT1664(auVar164);
              local_158 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar223._0_32_,auVar192,auVar196);
              auVar223 = ZEXT1664(auVar164);
              local_138 = ZEXT1632(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar153));
              auVar193 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar152));
              auVar194 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar151));
              auVar195 = vcvtph2ps_f16c(auVar164);
              auVar164 = vlddqu_avx(*(undefined1 (*) [16])((long)pvVar10 + lVar159 + lVar139));
              auVar196 = vcvtph2ps_f16c(auVar164);
              auVar164 = vfmadd231ps_fma(auVar222._0_32_,auVar192,auVar193);
              auVar222 = ZEXT1664(auVar164);
              local_118 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar221._0_32_,auVar192,auVar194);
              auVar221 = ZEXT1664(auVar164);
              local_f8 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar220._0_32_,auVar192,auVar195);
              auVar220 = ZEXT1664(auVar164);
              local_d8 = ZEXT1632(auVar164);
              auVar164 = vfmadd231ps_fma(auVar219._0_32_,auVar192,auVar196);
              auVar219 = ZEXT1664(auVar164);
              local_b8 = ZEXT1632(auVar164);
              pauVar141 = pauVar141 + 1;
              iVar144 = iVar144 + 8;
              lVar159 = lVar159 + 0x10;
            } while (iVar144 < (int)uVar156);
            lVar139 = lVar139 + lVar159;
            lVar151 = lVar151 + lVar159;
            lVar152 = lVar152 + lVar159;
            lVar153 = lVar153 + lVar159;
            lVar154 = lVar154 + lVar159;
            lVar147 = lVar147 + lVar159;
            lVar148 = lVar148 + lVar159;
            lVar159 = lVar136 + lVar159;
            uVar149 = uVar156 & 0xfffffff8;
          }
          local_338._0_8_ = (long)pvVar10 + lVar147;
          local_348._0_8_ = (long)pvVar10 + lVar154;
          local_358._0_8_ = (long)pvVar10 + lVar153;
          local_368._0_8_ = (long)pvVar10 + lVar152;
          local_2f8 = uVar155;
          local_2f0 = lVar157;
          local_2e8 = lVar161;
          local_2e0 = lVar146;
          local_2d8 = lVar143;
          local_2d0 = lVar142;
          local_2c8 = lVar140;
          local_2c0 = lVar145;
          if ((int)uVar149 < (int)uVar156) {
            lVar145 = 0;
            do {
              local_2a8 = auVar217._0_32_;
              uVar150 = *(uint *)(*pauVar141 + lVar145 * 4);
              fVar265 = float16_to_float32(*(unsigned_short *)
                                            ((long)pvVar10 + lVar145 * 2 + lVar159));
              auVar191 = _local_218;
              local_218._4_4_ = extraout_XMM0_Db;
              local_218._0_4_ = fVar265;
              fStack_210 = (float)extraout_XMM0_Dc;
              _fStack_208 = auVar191._16_16_;
              fStack_20c = (float)extraout_XMM0_Dd;
              _local_318 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
              fVar265 = float16_to_float32(*(unsigned_short *)
                                            ((long)pvVar10 + lVar145 * 2 + lVar148));
              local_238 = CONCAT44(extraout_XMM0_Db_00,fVar265);
              local_328 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
              local_248._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_338._0_8_ + lVar145 * 2));
              local_248._4_4_ = extraout_XMM0_Db_01;
              local_248._8_4_ = extraout_XMM0_Dc_00;
              local_248._12_4_ = extraout_XMM0_Dd_00;
              local_258 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
              local_268._0_4_ =
                   float16_to_float32(*(unsigned_short *)(local_348._0_8_ + lVar145 * 2));
              local_268._4_4_ = extraout_XMM0_Db_02;
              local_268._8_4_ = extraout_XMM0_Dc_01;
              local_268._12_4_ = extraout_XMM0_Dd_01;
              local_278 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
              local_2b8 = float16_to_float32(*(unsigned_short *)(local_358._0_8_ + lVar145 * 2));
              local_288 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
              uStack_2b4 = extraout_XMM0_Db_03;
              uStack_2b0 = extraout_XMM0_Dc_02;
              uStack_2ac = extraout_XMM0_Dd_02;
              fVar265 = float16_to_float32(*(unsigned_short *)(local_368._0_8_ + lVar145 * 2));
              auVar191 = local_198;
              local_198._4_4_ = extraout_XMM0_Db_04;
              local_198._0_4_ = fVar265;
              local_198._8_4_ = extraout_XMM0_Dc_03;
              local_198._16_16_ = auVar191._16_16_;
              local_198._12_4_ = extraout_XMM0_Dd_03;
              local_1b8._0_16_ = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
              fVar265 = float16_to_float32(*(unsigned_short *)
                                            ((long)pvVar10 + lVar145 * 2 + lVar151));
              auVar191 = local_1d8;
              local_1d8._4_4_ = extraout_XMM0_Db_05;
              local_1d8._0_4_ = fVar265;
              local_1d8._8_4_ = extraout_XMM0_Dc_04;
              local_1d8._16_16_ = auVar191._16_16_;
              local_1d8._12_4_ = extraout_XMM0_Dd_04;
              local_1f8._0_16_ = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
              auVar217._0_4_ =
                   float16_to_float32(*(unsigned_short *)((long)pvVar10 + lVar145 * 2 + lVar139));
              auVar217._4_60_ = extraout_var;
              auVar164._4_4_ = uStack_2b4;
              auVar164._0_4_ = local_2b8;
              auVar164._8_4_ = uStack_2b0;
              auVar164._12_4_ = uStack_2ac;
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_198._0_4_),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_1d8._0_4_),0x20);
              auVar164 = vinsertps_avx(auVar164,auVar217._0_16_,0x30);
              auVar165 = vinsertps_avx(_local_218,ZEXT416((uint)local_238),0x10);
              auVar165 = vinsertps_avx(auVar165,ZEXT416((uint)local_248._0_4_),0x20);
              auVar165 = vinsertps_avx(auVar165,ZEXT416((uint)local_268._0_4_),0x30);
              auVar191._16_16_ = auVar164;
              auVar191._0_16_ = auVar165;
              auVar164 = vinsertps_avx(local_278,ZEXT416((uint)local_288._0_4_),0x10);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_1b8._0_4_),0x20);
              auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_1f8._0_4_),0x30);
              auVar165 = vinsertps_avx(ZEXT416(uVar150),ZEXT416((uint)local_318._0_4_),0x10);
              auVar165 = vinsertps_avx(auVar165,ZEXT416((uint)local_328._0_4_),0x20);
              auVar165 = vinsertps_avx(auVar165,ZEXT416((uint)local_258._0_4_),0x30);
              auVar192._16_16_ = auVar164;
              auVar192._0_16_ = auVar165;
              auVar164 = vfmadd231ps_fma(local_2a8,auVar191,auVar192);
              auVar217 = ZEXT1664(auVar164);
              auVar191 = ZEXT1632(auVar164);
              lVar145 = lVar145 + 1;
            } while (uVar156 - uVar149 != (int)lVar145);
          }
          auVar192 = vhaddps_avx(local_98,local_178);
          auVar193 = vhaddps_avx(local_158,local_138);
          auVar193 = vhaddps_avx(auVar192,auVar193);
          auVar192 = vhaddps_avx(local_118,local_f8);
          auVar194 = vhaddps_avx(local_d8,local_b8);
          auVar194 = vhaddps_avx(auVar192,auVar194);
          auVar192 = vblendps_avx(auVar193,auVar194,0xf0);
          auVar194 = vperm2f128_avx(auVar193,auVar194,0x21);
          auVar193._0_4_ = auVar194._0_4_ + auVar191._0_4_ + auVar192._0_4_;
          auVar193._4_4_ = auVar194._4_4_ + auVar191._4_4_ + auVar192._4_4_;
          auVar193._8_4_ = auVar194._8_4_ + auVar191._8_4_ + auVar192._8_4_;
          auVar193._12_4_ = auVar194._12_4_ + auVar191._12_4_ + auVar192._12_4_;
          auVar193._16_4_ = auVar194._16_4_ + auVar191._16_4_ + auVar192._16_4_;
          auVar193._20_4_ = auVar194._20_4_ + auVar191._20_4_ + auVar192._20_4_;
          auVar193._24_4_ = auVar194._24_4_ + auVar191._24_4_ + auVar192._24_4_;
          auVar193._28_4_ = auVar194._28_4_ + auVar191._28_4_ + auVar192._28_4_;
          switch(iVar5) {
          case 1:
            auVar193 = vmaxps_avx(auVar193,_DAT_00603060);
            break;
          case 2:
            auVar191 = vmaxps_avx(auVar193,ZEXT832(0) << 0x20);
            auVar192 = vminps_avx(auVar193,ZEXT832(0) << 0x20);
            uVar1 = *(this->super_InnerProduct).activation_params.data;
            auVar104._4_4_ = uVar1;
            auVar104._0_4_ = uVar1;
            auVar104._8_4_ = uVar1;
            auVar104._12_4_ = uVar1;
            auVar104._16_4_ = uVar1;
            auVar104._20_4_ = uVar1;
            auVar104._24_4_ = uVar1;
            auVar104._28_4_ = uVar1;
            auVar193 = vfmadd132ps_avx512vl(auVar192,auVar191,auVar104);
            break;
          case 3:
            puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar8;
            auVar102._4_4_ = uVar1;
            auVar102._0_4_ = uVar1;
            auVar102._8_4_ = uVar1;
            auVar102._12_4_ = uVar1;
            auVar102._16_4_ = uVar1;
            auVar102._20_4_ = uVar1;
            auVar102._24_4_ = uVar1;
            auVar102._28_4_ = uVar1;
            auVar191 = vmaxps_avx512vl(auVar193,auVar102);
            uVar1 = puVar8[1];
            auVar103._4_4_ = uVar1;
            auVar103._0_4_ = uVar1;
            auVar103._8_4_ = uVar1;
            auVar103._12_4_ = uVar1;
            auVar103._16_4_ = uVar1;
            auVar103._20_4_ = uVar1;
            auVar103._24_4_ = uVar1;
            auVar103._28_4_ = uVar1;
            auVar193 = vminps_avx512vl(auVar191,auVar103);
            break;
          case 4:
            auVar91._8_4_ = 0x80000000;
            auVar91._0_8_ = 0x8000000080000000;
            auVar91._12_4_ = 0x80000000;
            auVar91._16_4_ = 0x80000000;
            auVar91._20_4_ = 0x80000000;
            auVar91._24_4_ = 0x80000000;
            auVar91._28_4_ = 0x80000000;
            auVar191 = vxorps_avx512vl(auVar193,auVar91);
            auVar92._8_4_ = 0x42b0c0a5;
            auVar92._0_8_ = 0x42b0c0a542b0c0a5;
            auVar92._12_4_ = 0x42b0c0a5;
            auVar92._16_4_ = 0x42b0c0a5;
            auVar92._20_4_ = 0x42b0c0a5;
            auVar92._24_4_ = 0x42b0c0a5;
            auVar92._28_4_ = 0x42b0c0a5;
            auVar191 = vminps_avx512vl(auVar191,auVar92);
            auVar93._8_4_ = 0xc2b0c0a5;
            auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar93._12_4_ = 0xc2b0c0a5;
            auVar93._16_4_ = 0xc2b0c0a5;
            auVar93._20_4_ = 0xc2b0c0a5;
            auVar93._24_4_ = 0xc2b0c0a5;
            auVar93._28_4_ = 0xc2b0c0a5;
            auVar192 = vmaxps_avx512vl(auVar191,auVar93);
            auVar286._8_4_ = 0x3f000000;
            auVar286._0_8_ = 0x3f0000003f000000;
            auVar286._12_4_ = 0x3f000000;
            auVar286._16_4_ = 0x3f000000;
            auVar286._20_4_ = 0x3f000000;
            auVar286._24_4_ = 0x3f000000;
            auVar286._28_4_ = 0x3f000000;
            auVar94._8_4_ = 0x3fb8aa3b;
            auVar94._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar94._12_4_ = 0x3fb8aa3b;
            auVar94._16_4_ = 0x3fb8aa3b;
            auVar94._20_4_ = 0x3fb8aa3b;
            auVar94._24_4_ = 0x3fb8aa3b;
            auVar94._28_4_ = 0x3fb8aa3b;
            auVar193 = vfmadd231ps_avx512vl(auVar286,auVar192,auVar94);
            auVar191 = vroundps_avx(auVar193,1);
            uVar155 = vcmpps_avx512vl(auVar193,auVar191,1);
            auVar294._8_4_ = 0x3f800000;
            auVar294._0_8_ = 0x3f8000003f800000;
            auVar294._12_4_ = 0x3f800000;
            auVar294._16_4_ = 0x3f800000;
            auVar294._20_4_ = 0x3f800000;
            auVar294._24_4_ = 0x3f800000;
            auVar294._28_4_ = 0x3f800000;
            auVar194 = vsubps_avx512vl(auVar191,auVar294);
            bVar13 = (bool)((byte)uVar155 & 1);
            auVar216._0_4_ = (float)((uint)bVar13 * auVar194._0_4_ | (uint)!bVar13 * auVar191._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
            auVar216._4_4_ = (float)((uint)bVar13 * auVar194._4_4_ | (uint)!bVar13 * auVar191._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
            auVar216._8_4_ = (float)((uint)bVar13 * auVar194._8_4_ | (uint)!bVar13 * auVar191._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
            auVar216._12_4_ =
                 (float)((uint)bVar13 * auVar194._12_4_ | (uint)!bVar13 * auVar191._12_4_);
            bVar13 = (bool)((byte)(uVar155 >> 4) & 1);
            auVar216._16_4_ =
                 (float)((uint)bVar13 * auVar194._16_4_ | (uint)!bVar13 * auVar191._16_4_);
            bVar13 = (bool)((byte)(uVar155 >> 5) & 1);
            auVar216._20_4_ =
                 (float)((uint)bVar13 * auVar194._20_4_ | (uint)!bVar13 * auVar191._20_4_);
            bVar13 = (bool)((byte)(uVar155 >> 6) & 1);
            auVar216._24_4_ =
                 (float)((uint)bVar13 * auVar194._24_4_ | (uint)!bVar13 * auVar191._24_4_);
            bVar13 = SUB81(uVar155 >> 7,0);
            auVar216._28_4_ =
                 (float)((uint)bVar13 * auVar194._28_4_ | (uint)!bVar13 * auVar191._28_4_);
            auVar95._8_4_ = 0x3f318000;
            auVar95._0_8_ = 0x3f3180003f318000;
            auVar95._12_4_ = 0x3f318000;
            auVar95._16_4_ = 0x3f318000;
            auVar95._20_4_ = 0x3f318000;
            auVar95._24_4_ = 0x3f318000;
            auVar95._28_4_ = 0x3f318000;
            auVar191 = vfmsub231ps_avx512vl(auVar192,auVar216,auVar95);
            auVar96._8_4_ = 0x395e8083;
            auVar96._0_8_ = 0x395e8083395e8083;
            auVar96._12_4_ = 0x395e8083;
            auVar96._16_4_ = 0x395e8083;
            auVar96._20_4_ = 0x395e8083;
            auVar96._24_4_ = 0x395e8083;
            auVar96._28_4_ = 0x395e8083;
            auVar191 = vfmsub231ps_avx512vl(auVar191,auVar216,auVar96);
            auVar118._4_4_ = auVar191._4_4_ * auVar191._4_4_;
            auVar118._0_4_ = auVar191._0_4_ * auVar191._0_4_;
            auVar118._8_4_ = auVar191._8_4_ * auVar191._8_4_;
            auVar118._12_4_ = auVar191._12_4_ * auVar191._12_4_;
            auVar118._16_4_ = auVar191._16_4_ * auVar191._16_4_;
            auVar118._20_4_ = auVar191._20_4_ * auVar191._20_4_;
            auVar118._24_4_ = auVar191._24_4_ * auVar191._24_4_;
            auVar118._28_4_ = auVar193._28_4_;
            auVar280._8_4_ = 0x39506967;
            auVar280._0_8_ = 0x3950696739506967;
            auVar280._12_4_ = 0x39506967;
            auVar280._16_4_ = 0x39506967;
            auVar280._20_4_ = 0x39506967;
            auVar280._24_4_ = 0x39506967;
            auVar280._28_4_ = 0x39506967;
            auVar97._8_4_ = 0x3ab743ce;
            auVar97._0_8_ = 0x3ab743ce3ab743ce;
            auVar97._12_4_ = 0x3ab743ce;
            auVar97._16_4_ = 0x3ab743ce;
            auVar97._20_4_ = 0x3ab743ce;
            auVar97._24_4_ = 0x3ab743ce;
            auVar97._28_4_ = 0x3ab743ce;
            auVar192 = vfmadd213ps_avx512vl(auVar280,auVar191,auVar97);
            auVar98._8_4_ = 0x3c088908;
            auVar98._0_8_ = 0x3c0889083c088908;
            auVar98._12_4_ = 0x3c088908;
            auVar98._16_4_ = 0x3c088908;
            auVar98._20_4_ = 0x3c088908;
            auVar98._24_4_ = 0x3c088908;
            auVar98._28_4_ = 0x3c088908;
            auVar192 = vfmadd213ps_avx512vl(auVar192,auVar191,auVar98);
            auVar99._8_4_ = 0x3d2aa9c1;
            auVar99._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar99._12_4_ = 0x3d2aa9c1;
            auVar99._16_4_ = 0x3d2aa9c1;
            auVar99._20_4_ = 0x3d2aa9c1;
            auVar99._24_4_ = 0x3d2aa9c1;
            auVar99._28_4_ = 0x3d2aa9c1;
            auVar192 = vfmadd213ps_avx512vl(auVar192,auVar191,auVar99);
            auVar100._8_4_ = 0x3e2aaaaa;
            auVar100._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar100._12_4_ = 0x3e2aaaaa;
            auVar100._16_4_ = 0x3e2aaaaa;
            auVar100._20_4_ = 0x3e2aaaaa;
            auVar100._24_4_ = 0x3e2aaaaa;
            auVar100._28_4_ = 0x3e2aaaaa;
            auVar192 = vfmadd213ps_avx512vl(auVar192,auVar191,auVar100);
            auVar164 = vfmadd213ps_fma(auVar192,auVar191,auVar286);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar118,auVar191);
            auVar236._0_4_ = auVar164._0_4_ + 1.0;
            auVar236._4_4_ = auVar164._4_4_ + 1.0;
            auVar236._8_4_ = auVar164._8_4_ + 1.0;
            auVar236._12_4_ = auVar164._12_4_ + 1.0;
            auVar236._16_4_ = 0x3f800000;
            auVar236._20_4_ = 0x3f800000;
            auVar236._24_4_ = 0x3f800000;
            auVar236._28_4_ = 0x3f800000;
            auVar245._0_4_ = (int)auVar216._0_4_;
            auVar245._4_4_ = (int)auVar216._4_4_;
            auVar245._8_4_ = (int)auVar216._8_4_;
            auVar245._12_4_ = (int)auVar216._12_4_;
            auVar245._16_4_ = (int)auVar216._16_4_;
            auVar245._20_4_ = (int)auVar216._20_4_;
            auVar245._24_4_ = (int)auVar216._24_4_;
            auVar245._28_4_ = (int)auVar216._28_4_;
            auVar191 = vpslld_avx2(auVar245,0x17);
            auVar101._8_4_ = 0x3f800000;
            auVar101._0_8_ = 0x3f8000003f800000;
            auVar101._12_4_ = 0x3f800000;
            auVar101._16_4_ = 0x3f800000;
            auVar101._20_4_ = 0x3f800000;
            auVar101._24_4_ = 0x3f800000;
            auVar101._28_4_ = 0x3f800000;
            auVar191 = vpaddd_avx512vl(auVar191,auVar101);
            auVar164 = vfmadd213ps_fma(auVar191,auVar236,auVar294);
            auVar193 = vdivps_avx(auVar294,ZEXT1632(auVar164));
            break;
          case 5:
            auVar298._8_4_ = 0x42b0c0a5;
            auVar298._0_8_ = 0x42b0c0a542b0c0a5;
            auVar298._12_4_ = 0x42b0c0a5;
            auVar298._16_4_ = 0x42b0c0a5;
            auVar298._20_4_ = 0x42b0c0a5;
            auVar298._24_4_ = 0x42b0c0a5;
            auVar298._28_4_ = 0x42b0c0a5;
            auVar191 = vminps_avx(auVar193,auVar298);
            auVar303._8_4_ = 0xc2b0c0a5;
            auVar303._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar303._12_4_ = 0xc2b0c0a5;
            auVar303._16_4_ = 0xc2b0c0a5;
            auVar303._20_4_ = 0xc2b0c0a5;
            auVar303._24_4_ = 0xc2b0c0a5;
            auVar303._28_4_ = 0xc2b0c0a5;
            auVar191 = vmaxps_avx(auVar191,auVar303);
            auVar311._8_4_ = 0x3fb8aa3b;
            auVar311._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar311._12_4_ = 0x3fb8aa3b;
            auVar311._16_4_ = 0x3fb8aa3b;
            auVar311._20_4_ = 0x3fb8aa3b;
            auVar311._24_4_ = 0x3fb8aa3b;
            auVar311._28_4_ = 0x3fb8aa3b;
            auVar307._8_4_ = 0x3f000000;
            auVar307._0_8_ = 0x3f0000003f000000;
            auVar307._12_4_ = 0x3f000000;
            auVar307._16_4_ = 0x3f000000;
            auVar307._20_4_ = 0x3f000000;
            auVar307._24_4_ = 0x3f000000;
            auVar307._28_4_ = 0x3f000000;
            auVar164 = vfmadd213ps_fma(auVar311,auVar191,auVar307);
            auVar192 = vroundps_avx(ZEXT1632(auVar164),1);
            uVar155 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar192,1);
            auVar315._8_4_ = 0x3f800000;
            auVar315._0_8_ = 0x3f8000003f800000;
            auVar315._12_4_ = 0x3f800000;
            auVar315._16_4_ = 0x3f800000;
            auVar315._20_4_ = 0x3f800000;
            auVar315._24_4_ = 0x3f800000;
            auVar315._28_4_ = 0x3f800000;
            auVar194 = vsubps_avx512vl(auVar192,auVar315);
            bVar13 = (bool)((byte)uVar155 & 1);
            auVar211._0_4_ = (float)((uint)bVar13 * auVar194._0_4_ | (uint)!bVar13 * auVar192._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
            auVar211._4_4_ = (float)((uint)bVar13 * auVar194._4_4_ | (uint)!bVar13 * auVar192._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
            auVar211._8_4_ = (float)((uint)bVar13 * auVar194._8_4_ | (uint)!bVar13 * auVar192._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
            auVar211._12_4_ =
                 (float)((uint)bVar13 * auVar194._12_4_ | (uint)!bVar13 * auVar192._12_4_);
            bVar13 = (bool)((byte)(uVar155 >> 4) & 1);
            auVar211._16_4_ =
                 (float)((uint)bVar13 * auVar194._16_4_ | (uint)!bVar13 * auVar192._16_4_);
            bVar13 = (bool)((byte)(uVar155 >> 5) & 1);
            auVar211._20_4_ =
                 (float)((uint)bVar13 * auVar194._20_4_ | (uint)!bVar13 * auVar192._20_4_);
            bVar13 = (bool)((byte)(uVar155 >> 6) & 1);
            auVar211._24_4_ =
                 (float)((uint)bVar13 * auVar194._24_4_ | (uint)!bVar13 * auVar192._24_4_);
            bVar13 = SUB81(uVar155 >> 7,0);
            auVar211._28_4_ =
                 (float)((uint)bVar13 * auVar194._28_4_ | (uint)!bVar13 * auVar192._28_4_);
            auVar319._8_4_ = 0x3f318000;
            auVar319._0_8_ = 0x3f3180003f318000;
            auVar319._12_4_ = 0x3f318000;
            auVar319._16_4_ = 0x3f318000;
            auVar319._20_4_ = 0x3f318000;
            auVar319._24_4_ = 0x3f318000;
            auVar319._28_4_ = 0x3f318000;
            auVar164 = vfmsub231ps_fma(auVar191,auVar211,auVar319);
            auVar194 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar191 = vfnmsub231ps_avx512vl(ZEXT1632(auVar164),auVar211,auVar194);
            auVar260._0_4_ = auVar191._0_4_ * auVar191._0_4_;
            auVar260._4_4_ = auVar191._4_4_ * auVar191._4_4_;
            auVar260._8_4_ = auVar191._8_4_ * auVar191._8_4_;
            auVar260._12_4_ = auVar191._12_4_ * auVar191._12_4_;
            auVar260._16_4_ = auVar191._16_4_ * auVar191._16_4_;
            auVar260._20_4_ = auVar191._20_4_ * auVar191._20_4_;
            auVar260._24_4_ = auVar191._24_4_ * auVar191._24_4_;
            auVar260._28_4_ = 0;
            auVar323._8_4_ = 0x39506967;
            auVar323._0_8_ = 0x3950696739506967;
            auVar323._12_4_ = 0x39506967;
            auVar323._16_4_ = 0x39506967;
            auVar323._20_4_ = 0x39506967;
            auVar323._24_4_ = 0x39506967;
            auVar323._28_4_ = 0x39506967;
            auVar328._8_4_ = 0x3ab743ce;
            auVar328._0_8_ = 0x3ab743ce3ab743ce;
            auVar328._12_4_ = 0x3ab743ce;
            auVar328._16_4_ = 0x3ab743ce;
            auVar328._20_4_ = 0x3ab743ce;
            auVar328._24_4_ = 0x3ab743ce;
            auVar328._28_4_ = 0x3ab743ce;
            auVar164 = vfmadd213ps_fma(auVar323,auVar191,auVar328);
            auVar331._8_4_ = 0x3c088908;
            auVar331._0_8_ = 0x3c0889083c088908;
            auVar331._12_4_ = 0x3c088908;
            auVar331._16_4_ = 0x3c088908;
            auVar331._20_4_ = 0x3c088908;
            auVar331._24_4_ = 0x3c088908;
            auVar331._28_4_ = 0x3c088908;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar191,auVar331);
            auVar335._8_4_ = 0x3d2aa9c1;
            auVar335._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar335._12_4_ = 0x3d2aa9c1;
            auVar335._16_4_ = 0x3d2aa9c1;
            auVar335._20_4_ = 0x3d2aa9c1;
            auVar335._24_4_ = 0x3d2aa9c1;
            auVar335._28_4_ = 0x3d2aa9c1;
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar191,auVar335);
            auVar195 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar192 = vfmadd213ps_avx512vl(ZEXT1632(auVar164),auVar191,auVar195);
            auVar164 = vfmadd213ps_fma(auVar192,auVar191,auVar307);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar260,auVar191);
            auVar243._0_4_ = auVar164._0_4_ + 1.0;
            auVar243._4_4_ = auVar164._4_4_ + 1.0;
            auVar243._8_4_ = auVar164._8_4_ + 1.0;
            auVar243._12_4_ = auVar164._12_4_ + 1.0;
            auVar243._16_4_ = 0x3f800000;
            auVar243._20_4_ = 0x3f800000;
            auVar243._24_4_ = 0x3f800000;
            auVar243._28_4_ = 0x3f800000;
            auVar261._0_4_ = (int)auVar211._0_4_;
            auVar261._4_4_ = (int)auVar211._4_4_;
            auVar261._8_4_ = (int)auVar211._8_4_;
            auVar261._12_4_ = (int)auVar211._12_4_;
            auVar261._16_4_ = (int)auVar211._16_4_;
            auVar261._20_4_ = (int)auVar211._20_4_;
            auVar261._24_4_ = (int)auVar211._24_4_;
            auVar261._28_4_ = (int)auVar211._28_4_;
            auVar191 = vpslld_avx2(auVar261,0x17);
            auVar196 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            auVar191 = vpaddd_avx512vl(auVar191,auVar196);
            auVar164 = vfmadd213ps_fma(auVar191,auVar243,auVar315);
            uVar155 = vcmpps_avx512vl(ZEXT1632(auVar164),_DAT_00603060,2);
            auVar197._8_4_ = 0x800000;
            auVar197._0_8_ = 0x80000000800000;
            auVar197._12_4_ = 0x800000;
            auVar197._16_4_ = 0x800000;
            auVar197._20_4_ = 0x800000;
            auVar197._24_4_ = 0x800000;
            auVar197._28_4_ = 0x800000;
            auVar191 = vmaxps_avx512vl(ZEXT1632(auVar164),auVar197);
            auVar262 = vpsrld_avx2(auVar191,0x17);
            auVar279._8_4_ = 0x807fffff;
            auVar279._0_8_ = 0x807fffff807fffff;
            auVar279._12_4_ = 0x807fffff;
            auVar279._16_4_ = 0x807fffff;
            auVar279._20_4_ = 0x807fffff;
            auVar279._24_4_ = 0x807fffff;
            auVar279._28_4_ = 0x807fffff;
            auVar198._8_4_ = 0x3f000000;
            auVar198._0_8_ = 0x3f0000003f000000;
            auVar198._12_4_ = 0x3f000000;
            auVar198._16_4_ = 0x3f000000;
            auVar198._20_4_ = 0x3f000000;
            auVar198._24_4_ = 0x3f000000;
            auVar198._28_4_ = 0x3f000000;
            auVar191 = vpternlogd_avx512vl(auVar191,auVar279,auVar198,0xea);
            auVar81._8_4_ = 0x3f3504f3;
            auVar81._0_8_ = 0x3f3504f33f3504f3;
            auVar81._12_4_ = 0x3f3504f3;
            auVar81._16_4_ = 0x3f3504f3;
            auVar81._20_4_ = 0x3f3504f3;
            auVar81._24_4_ = 0x3f3504f3;
            auVar81._28_4_ = 0x3f3504f3;
            uVar137 = vcmpps_avx512vl(auVar191,auVar81,1);
            auVar197 = vbroadcastss_avx512vl(ZEXT416(0xbf800000));
            auVar192 = vaddps_avx512vl(auVar191,auVar197);
            auVar198 = vaddps_avx512vl(auVar192,auVar191);
            bVar13 = (bool)((byte)uVar137 & 1);
            auVar212._0_4_ = (float)((uint)bVar13 * auVar198._0_4_ | (uint)!bVar13 * auVar192._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar137 >> 1) & 1);
            auVar212._4_4_ = (float)((uint)bVar13 * auVar198._4_4_ | (uint)!bVar13 * auVar192._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar137 >> 2) & 1);
            auVar212._8_4_ = (float)((uint)bVar13 * auVar198._8_4_ | (uint)!bVar13 * auVar192._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar137 >> 3) & 1);
            auVar212._12_4_ =
                 (float)((uint)bVar13 * auVar198._12_4_ | (uint)!bVar13 * auVar192._12_4_);
            bVar13 = (bool)((byte)(uVar137 >> 4) & 1);
            auVar212._16_4_ =
                 (float)((uint)bVar13 * auVar198._16_4_ | (uint)!bVar13 * auVar192._16_4_);
            bVar13 = (bool)((byte)(uVar137 >> 5) & 1);
            auVar212._20_4_ =
                 (float)((uint)bVar13 * auVar198._20_4_ | (uint)!bVar13 * auVar192._20_4_);
            bVar13 = (bool)((byte)(uVar137 >> 6) & 1);
            auVar212._24_4_ =
                 (float)((uint)bVar13 * auVar198._24_4_ | (uint)!bVar13 * auVar192._24_4_);
            bVar13 = SUB81(uVar137 >> 7,0);
            auVar212._28_4_ = (uint)bVar13 * auVar198._28_4_ | (uint)!bVar13 * auVar192._28_4_;
            auVar116._4_4_ = auVar212._4_4_ * auVar212._4_4_;
            auVar116._0_4_ = auVar212._0_4_ * auVar212._0_4_;
            auVar116._8_4_ = auVar212._8_4_ * auVar212._8_4_;
            auVar116._12_4_ = auVar212._12_4_ * auVar212._12_4_;
            auVar116._16_4_ = auVar212._16_4_ * auVar212._16_4_;
            auVar116._20_4_ = auVar212._20_4_ * auVar212._20_4_;
            auVar116._24_4_ = auVar212._24_4_ * auVar212._24_4_;
            auVar116._28_4_ = auVar191._28_4_;
            auVar285._8_4_ = 0x3d9021bb;
            auVar285._0_8_ = 0x3d9021bb3d9021bb;
            auVar285._12_4_ = 0x3d9021bb;
            auVar285._16_4_ = 0x3d9021bb;
            auVar285._20_4_ = 0x3d9021bb;
            auVar285._24_4_ = 0x3d9021bb;
            auVar285._28_4_ = 0x3d9021bb;
            auVar82._8_4_ = 0xbdebd1b8;
            auVar82._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar82._12_4_ = 0xbdebd1b8;
            auVar82._16_4_ = 0xbdebd1b8;
            auVar82._20_4_ = 0xbdebd1b8;
            auVar82._24_4_ = 0xbdebd1b8;
            auVar82._28_4_ = 0xbdebd1b8;
            auVar191 = vfmadd213ps_avx512vl(auVar285,auVar212,auVar82);
            auVar83._8_4_ = 0x3def251a;
            auVar83._0_8_ = 0x3def251a3def251a;
            auVar83._12_4_ = 0x3def251a;
            auVar83._16_4_ = 0x3def251a;
            auVar83._20_4_ = 0x3def251a;
            auVar83._24_4_ = 0x3def251a;
            auVar83._28_4_ = 0x3def251a;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar212,auVar83);
            auVar84._8_4_ = 0xbdfe5d4f;
            auVar84._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar84._12_4_ = 0xbdfe5d4f;
            auVar84._16_4_ = 0xbdfe5d4f;
            auVar84._20_4_ = 0xbdfe5d4f;
            auVar84._24_4_ = 0xbdfe5d4f;
            auVar84._28_4_ = 0xbdfe5d4f;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar212,auVar84);
            auVar85._8_4_ = 0x3e11e9bf;
            auVar85._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar85._12_4_ = 0x3e11e9bf;
            auVar85._16_4_ = 0x3e11e9bf;
            auVar85._20_4_ = 0x3e11e9bf;
            auVar85._24_4_ = 0x3e11e9bf;
            auVar85._28_4_ = 0x3e11e9bf;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar212,auVar85);
            auVar86._8_4_ = 0xbe2aae50;
            auVar86._0_8_ = 0xbe2aae50be2aae50;
            auVar86._12_4_ = 0xbe2aae50;
            auVar86._16_4_ = 0xbe2aae50;
            auVar86._20_4_ = 0xbe2aae50;
            auVar86._24_4_ = 0xbe2aae50;
            auVar86._28_4_ = 0xbe2aae50;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar212,auVar86);
            auVar87._8_4_ = 0x3e4cceac;
            auVar87._0_8_ = 0x3e4cceac3e4cceac;
            auVar87._12_4_ = 0x3e4cceac;
            auVar87._16_4_ = 0x3e4cceac;
            auVar87._20_4_ = 0x3e4cceac;
            auVar87._24_4_ = 0x3e4cceac;
            auVar87._28_4_ = 0x3e4cceac;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar212,auVar87);
            auVar88._8_4_ = 0xbe7ffffc;
            auVar88._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar88._12_4_ = 0xbe7ffffc;
            auVar88._16_4_ = 0xbe7ffffc;
            auVar88._20_4_ = 0xbe7ffffc;
            auVar88._24_4_ = 0xbe7ffffc;
            auVar88._28_4_ = 0xbe7ffffc;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar212,auVar88);
            auVar89._8_4_ = 0x3eaaaaaa;
            auVar89._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar89._12_4_ = 0x3eaaaaaa;
            auVar89._16_4_ = 0x3eaaaaaa;
            auVar89._20_4_ = 0x3eaaaaaa;
            auVar89._24_4_ = 0x3eaaaaaa;
            auVar89._28_4_ = 0x3eaaaaaa;
            auVar191 = vfmadd213ps_avx512vl(auVar191,auVar212,auVar89);
            auVar117._4_4_ = auVar212._4_4_ * auVar212._4_4_ * auVar212._4_4_ * auVar191._4_4_;
            auVar117._0_4_ = auVar212._0_4_ * auVar212._0_4_ * auVar212._0_4_ * auVar191._0_4_;
            auVar117._8_4_ = auVar212._8_4_ * auVar212._8_4_ * auVar212._8_4_ * auVar191._8_4_;
            auVar117._12_4_ = auVar212._12_4_ * auVar212._12_4_ * auVar212._12_4_ * auVar191._12_4_;
            auVar117._16_4_ = auVar212._16_4_ * auVar212._16_4_ * auVar212._16_4_ * auVar191._16_4_;
            auVar117._20_4_ = auVar212._20_4_ * auVar212._20_4_ * auVar212._20_4_ * auVar191._20_4_;
            auVar117._24_4_ = auVar212._24_4_ * auVar212._24_4_ * auVar212._24_4_ * auVar191._24_4_;
            auVar117._28_4_ = auVar191._28_4_;
            auVar90._8_4_ = 0xffffff82;
            auVar90._0_8_ = 0xffffff82ffffff82;
            auVar90._12_4_ = 0xffffff82;
            auVar90._16_4_ = 0xffffff82;
            auVar90._20_4_ = 0xffffff82;
            auVar90._24_4_ = 0xffffff82;
            auVar90._28_4_ = 0xffffff82;
            auVar191 = vpaddd_avx512vl(auVar262,auVar90);
            auVar191 = vcvtdq2ps_avx(auVar191);
            auVar192 = vsubps_avx512vl(auVar191,auVar315);
            bVar13 = (bool)((byte)uVar137 & 1);
            auVar213._0_4_ = (uint)bVar13 * auVar192._0_4_ | (uint)!bVar13 * auVar191._0_4_;
            bVar13 = (bool)((byte)(uVar137 >> 1) & 1);
            auVar213._4_4_ = (uint)bVar13 * auVar192._4_4_ | (uint)!bVar13 * auVar191._4_4_;
            bVar13 = (bool)((byte)(uVar137 >> 2) & 1);
            auVar213._8_4_ = (uint)bVar13 * auVar192._8_4_ | (uint)!bVar13 * auVar191._8_4_;
            bVar13 = (bool)((byte)(uVar137 >> 3) & 1);
            auVar213._12_4_ = (uint)bVar13 * auVar192._12_4_ | (uint)!bVar13 * auVar191._12_4_;
            bVar13 = (bool)((byte)(uVar137 >> 4) & 1);
            auVar213._16_4_ = (uint)bVar13 * auVar192._16_4_ | (uint)!bVar13 * auVar191._16_4_;
            bVar13 = (bool)((byte)(uVar137 >> 5) & 1);
            auVar213._20_4_ = (uint)bVar13 * auVar192._20_4_ | (uint)!bVar13 * auVar191._20_4_;
            bVar13 = (bool)((byte)(uVar137 >> 6) & 1);
            auVar213._24_4_ = (uint)bVar13 * auVar192._24_4_ | (uint)!bVar13 * auVar191._24_4_;
            bVar13 = SUB81(uVar137 >> 7,0);
            auVar213._28_4_ = (uint)bVar13 * auVar192._28_4_ | (uint)!bVar13 * auVar191._28_4_;
            auVar191 = vfmadd231ps_avx512vl(auVar117,auVar213,auVar194);
            auVar164 = vfmsub231ps_fma(auVar191,auVar307,auVar116);
            auVar191 = vsubps_avx(ZEXT1632(auVar164),auVar212);
            auVar164 = vfmsub231ps_fma(auVar191,auVar319,auVar213);
            auVar293._8_4_ = 0xc0000000;
            auVar293._0_8_ = 0xc0000000c0000000;
            auVar293._12_4_ = 0xc0000000;
            auVar293._16_4_ = 0xc0000000;
            auVar293._20_4_ = 0xc0000000;
            auVar293._24_4_ = 0xc0000000;
            auVar293._28_4_ = 0xc0000000;
            auVar191 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            bVar13 = (bool)((byte)uVar155 & 1);
            auVar214._0_4_ =
                 (uint)bVar13 * auVar191._0_4_ | (uint)!bVar13 * (int)(auVar164._0_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
            auVar214._4_4_ =
                 (uint)bVar13 * auVar191._4_4_ | (uint)!bVar13 * (int)(auVar164._4_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
            auVar214._8_4_ =
                 (uint)bVar13 * auVar191._8_4_ | (uint)!bVar13 * (int)(auVar164._8_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
            auVar214._12_4_ =
                 (uint)bVar13 * auVar191._12_4_ | (uint)!bVar13 * (int)(auVar164._12_4_ * -2.0);
            bVar13 = (bool)((byte)(uVar155 >> 4) & 1);
            auVar214._16_4_ = (uint)bVar13 * auVar191._16_4_ | (uint)!bVar13 * -0x80000000;
            bVar13 = (bool)((byte)(uVar155 >> 5) & 1);
            auVar214._20_4_ = (uint)bVar13 * auVar191._20_4_ | (uint)!bVar13 * -0x80000000;
            bVar13 = (bool)((byte)(uVar155 >> 6) & 1);
            auVar214._24_4_ = (uint)bVar13 * auVar191._24_4_ | (uint)!bVar13 * -0x80000000;
            auVar214._28_4_ = (uint)(byte)(uVar155 >> 7) * auVar191._28_4_;
            auVar191 = vminps_avx(auVar214,auVar298);
            auVar191 = vmaxps_avx(auVar191,auVar303);
            auVar164 = vfmadd213ps_fma(auVar311,auVar191,auVar307);
            auVar192 = vroundps_avx(ZEXT1632(auVar164),1);
            uVar155 = vcmpps_avx512vl(ZEXT1632(auVar164),auVar192,1);
            auVar198 = vsubps_avx512vl(auVar192,auVar315);
            bVar13 = (bool)((byte)uVar155 & 1);
            auVar215._0_4_ = (float)((uint)bVar13 * auVar198._0_4_ | (uint)!bVar13 * auVar192._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
            auVar215._4_4_ = (float)((uint)bVar13 * auVar198._4_4_ | (uint)!bVar13 * auVar192._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
            auVar215._8_4_ = (float)((uint)bVar13 * auVar198._8_4_ | (uint)!bVar13 * auVar192._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
            auVar215._12_4_ =
                 (float)((uint)bVar13 * auVar198._12_4_ | (uint)!bVar13 * auVar192._12_4_);
            bVar13 = (bool)((byte)(uVar155 >> 4) & 1);
            auVar215._16_4_ =
                 (float)((uint)bVar13 * auVar198._16_4_ | (uint)!bVar13 * auVar192._16_4_);
            bVar13 = (bool)((byte)(uVar155 >> 5) & 1);
            auVar215._20_4_ =
                 (float)((uint)bVar13 * auVar198._20_4_ | (uint)!bVar13 * auVar192._20_4_);
            bVar13 = (bool)((byte)(uVar155 >> 6) & 1);
            auVar215._24_4_ =
                 (float)((uint)bVar13 * auVar198._24_4_ | (uint)!bVar13 * auVar192._24_4_);
            bVar13 = SUB81(uVar155 >> 7,0);
            auVar215._28_4_ =
                 (float)((uint)bVar13 * auVar198._28_4_ | (uint)!bVar13 * auVar192._28_4_);
            auVar164 = vfmsub231ps_fma(auVar191,auVar215,auVar319);
            auVar191 = vfnmsub231ps_avx512vl(ZEXT1632(auVar164),auVar215,auVar194);
            auVar263._0_4_ = auVar191._0_4_ * auVar191._0_4_;
            auVar263._4_4_ = auVar191._4_4_ * auVar191._4_4_;
            auVar263._8_4_ = auVar191._8_4_ * auVar191._8_4_;
            auVar263._12_4_ = auVar191._12_4_ * auVar191._12_4_;
            auVar263._16_4_ = auVar191._16_4_ * auVar191._16_4_;
            auVar263._20_4_ = auVar191._20_4_ * auVar191._20_4_;
            auVar263._24_4_ = auVar191._24_4_ * auVar191._24_4_;
            auVar263._28_4_ = 0;
            auVar164 = vfmadd213ps_fma(auVar323,auVar191,auVar328);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar191,auVar331);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar191,auVar335);
            auVar192 = vfmadd213ps_avx512vl(ZEXT1632(auVar164),auVar191,auVar195);
            auVar164 = vfmadd213ps_fma(auVar192,auVar191,auVar307);
            auVar164 = vfmadd213ps_fma(ZEXT1632(auVar164),auVar263,auVar191);
            auVar244._0_4_ = auVar164._0_4_ + 1.0;
            auVar244._4_4_ = auVar164._4_4_ + 1.0;
            auVar244._8_4_ = auVar164._8_4_ + 1.0;
            auVar244._12_4_ = auVar164._12_4_ + 1.0;
            auVar244._16_4_ = 0x3f800000;
            auVar244._20_4_ = 0x3f800000;
            auVar244._24_4_ = 0x3f800000;
            auVar244._28_4_ = 0x3f800000;
            auVar264._0_4_ = (int)auVar215._0_4_;
            auVar264._4_4_ = (int)auVar215._4_4_;
            auVar264._8_4_ = (int)auVar215._8_4_;
            auVar264._12_4_ = (int)auVar215._12_4_;
            auVar264._16_4_ = (int)auVar215._16_4_;
            auVar264._20_4_ = (int)auVar215._20_4_;
            auVar264._24_4_ = (int)auVar215._24_4_;
            auVar264._28_4_ = (int)auVar215._28_4_;
            auVar191 = vpslld_avx2(auVar264,0x17);
            auVar191 = vpaddd_avx512vl(auVar191,auVar196);
            auVar164 = vfmadd213ps_fma(auVar191,auVar244,auVar315);
            auVar191 = vdivps_avx(auVar315,ZEXT1632(auVar164));
            auVar191 = vfnmadd213ps_avx512vl(auVar191,auVar293,auVar197);
            auVar190 = auVar191._0_28_;
            goto LAB_002da557;
          case 6:
            puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar1 = *puVar8;
            auVar196._4_4_ = uVar1;
            auVar196._0_4_ = uVar1;
            auVar196._8_4_ = uVar1;
            auVar196._12_4_ = uVar1;
            auVar196._16_4_ = uVar1;
            auVar196._20_4_ = uVar1;
            auVar196._24_4_ = uVar1;
            auVar196._28_4_ = uVar1;
            uVar1 = puVar8[1];
            auVar194._4_4_ = uVar1;
            auVar194._0_4_ = uVar1;
            auVar194._8_4_ = uVar1;
            auVar194._12_4_ = uVar1;
            auVar194._16_4_ = uVar1;
            auVar194._20_4_ = uVar1;
            auVar194._24_4_ = uVar1;
            auVar194._28_4_ = uVar1;
            auVar191 = vfmadd213ps_avx512vl(auVar196,auVar193,auVar194);
            auVar191 = vmaxps_avx(auVar191,_DAT_00603060);
            auVar195._8_4_ = 0x3f800000;
            auVar195._0_8_ = 0x3f8000003f800000;
            auVar195._12_4_ = 0x3f800000;
            auVar195._16_4_ = 0x3f800000;
            auVar195._20_4_ = 0x3f800000;
            auVar195._24_4_ = 0x3f800000;
            auVar195._28_4_ = 0x3f800000;
            auVar191 = vminps_avx512vl(auVar191,auVar195);
            auVar190 = auVar191._0_28_;
LAB_002da557:
            auVar193._4_4_ = auVar190._4_4_ * auVar193._4_4_;
            auVar193._0_4_ = auVar190._0_4_ * auVar193._0_4_;
            auVar193._8_4_ = auVar190._8_4_ * auVar193._8_4_;
            auVar193._12_4_ = auVar190._12_4_ * auVar193._12_4_;
            auVar193._16_4_ = auVar190._16_4_ * auVar193._16_4_;
            auVar193._20_4_ = auVar190._20_4_ * auVar193._20_4_;
            auVar193._24_4_ = auVar190._24_4_ * auVar193._24_4_;
          }
          *(undefined1 (*) [32])((long)top_blob->data + local_300 * 4) = auVar193;
          uVar155 = local_2f8 + 1;
          lVar145 = local_2c0 + 8;
          lVar140 = local_2c8 + 8;
          lVar142 = local_2d0 + 8;
          lVar143 = local_2d8 + 8;
          lVar146 = local_2e0 + 8;
          lVar161 = local_2e8 + 8;
          lVar157 = local_2f0 + 8;
          local_308 = local_308 + 8;
        } while (uVar155 != local_220);
      }
      auVar165 = local_278;
      auVar164 = local_288;
      local_238 = (ulong)(int)uVar135;
      uVar155 = local_238 & 0xfffffffffffffff8;
      uVar149 = uVar135 >> 2 & 1;
      local_288._4_4_ = 0;
      local_288._0_4_ = uVar149;
      if (uVar149 != 0) {
        local_288._8_8_ = auVar164._8_8_;
        if (pvVar7 == (void *)0x0) {
          auVar164 = ZEXT816(0) << 0x40;
        }
        else {
          auVar164 = *(undefined1 (*) [16])((long)pvVar7 + uVar155 * 4);
        }
        pvVar10 = (this->weight_data_tm).data;
        lVar145 = (long)(this->weight_data_tm).w * (this->weight_data_tm).elemsize;
        pauVar162 = (undefined1 (*) [16])(lVar145 * uVar155 + (long)pvVar10);
        pauVar163 = (undefined1 (*) [16])((uVar155 | 1) * lVar145 + (long)pvVar10);
        pauVar158 = (undefined1 (*) [16])((uVar155 | 2) * lVar145 + (long)pvVar10);
        pauVar160 = (undefined1 (*) [16])((uVar155 | 3) * lVar145 + (long)pvVar10);
        pauVar141 = local_3b8;
        if ((int)uVar156 < 8) {
          uVar149 = 0;
          local_1b8 = SUB6432(ZEXT864(0),0);
          local_1f8 = SUB6432(ZEXT864(0),0);
          local_1d8 = SUB6432(ZEXT864(0),0);
          local_198 = SUB6432(ZEXT864(0),0);
        }
        else {
          uVar149 = uVar156 & 0xfffffff8;
          auVar217 = ZEXT864(0);
          iVar144 = 7;
          auVar219 = ZEXT864(0);
          auVar220 = ZEXT864(0);
          auVar218 = ZEXT864(0);
          do {
            auVar191 = *pauVar141;
            auVar166 = vlddqu_avx(*pauVar162);
            auVar192 = vcvtph2ps_f16c(auVar166);
            auVar166 = vlddqu_avx(*pauVar163);
            auVar193 = vcvtph2ps_f16c(auVar166);
            auVar166 = vlddqu_avx(*pauVar158);
            auVar194 = vcvtph2ps_f16c(auVar166);
            auVar166 = vlddqu_avx(*pauVar160);
            auVar195 = vcvtph2ps_f16c(auVar166);
            auVar166 = vfmadd231ps_fma(auVar218._0_32_,auVar191,auVar192);
            auVar218 = ZEXT1664(auVar166);
            local_1b8 = ZEXT1632(auVar166);
            auVar166 = vfmadd231ps_fma(auVar220._0_32_,auVar191,auVar193);
            auVar220 = ZEXT1664(auVar166);
            local_1f8 = ZEXT1632(auVar166);
            auVar166 = vfmadd231ps_fma(auVar219._0_32_,auVar191,auVar194);
            auVar219 = ZEXT1664(auVar166);
            local_1d8 = ZEXT1632(auVar166);
            auVar166 = vfmadd231ps_fma(auVar217._0_32_,auVar191,auVar195);
            auVar217 = ZEXT1664(auVar166);
            local_198 = ZEXT1632(auVar166);
            pauVar141 = pauVar141 + 1;
            pauVar162 = pauVar162 + 1;
            pauVar163 = pauVar163 + 1;
            pauVar158 = pauVar158 + 1;
            pauVar160 = pauVar160 + 1;
            iVar144 = iVar144 + 8;
          } while (iVar144 < (int)uVar156);
        }
        local_348 = ZEXT816(0) << 0x40;
        local_2b8 = (float)uVar155;
        uStack_2b4 = (undefined4)(uVar155 >> 0x20);
        if ((int)(uVar149 | 3) < (int)uVar156) {
          auVar217 = ZEXT864(0);
          lVar145 = 0;
          auVar218 = ZEXT864(0);
          local_368 = ZEXT816(0);
          pauVar138 = pauVar141;
          uVar150 = uVar149;
          do {
            auVar166._8_8_ = 0;
            auVar166._0_8_ = *(ulong *)(*pauVar162 + lVar145);
            auVar170 = vcvtph2ps_f16c(auVar166);
            auVar167._8_8_ = 0;
            auVar167._0_8_ = *(ulong *)(*pauVar163 + lVar145);
            auVar167 = vcvtph2ps_f16c(auVar167);
            auVar168._8_8_ = 0;
            auVar168._0_8_ = *(ulong *)(*pauVar158 + lVar145);
            auVar168 = vcvtph2ps_f16c(auVar168);
            auVar166 = *(undefined1 (*) [16])(*pauVar141 + lVar145 * 2);
            auVar169._8_8_ = 0;
            auVar169._0_8_ = *(ulong *)(*pauVar160 + lVar145);
            auVar169 = vcvtph2ps_f16c(auVar169);
            local_348 = vfmadd231ps_fma(local_348,auVar166,auVar170);
            local_368 = vfmadd231ps_fma(local_368,auVar166,auVar167);
            local_358 = vfmadd231ps_fma(auVar218._0_16_,auVar166,auVar168);
            auVar218 = ZEXT1664(local_358);
            local_338 = vfmadd231ps_fma(auVar217._0_16_,auVar166,auVar169);
            auVar217 = ZEXT1664(local_338);
            pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
            uVar149 = uVar150 + 4;
            iVar144 = uVar150 + 7;
            lVar145 = lVar145 + 8;
            uVar150 = uVar149;
          } while (iVar144 < (int)uVar156);
          pauVar160 = (undefined1 (*) [16])(*pauVar160 + lVar145);
          pauVar158 = (undefined1 (*) [16])(*pauVar158 + lVar145);
          pauVar163 = (undefined1 (*) [16])(*pauVar163 + lVar145);
          pauVar162 = (undefined1 (*) [16])(*pauVar162 + lVar145);
          pauVar141 = pauVar138;
        }
        else {
          local_368 = ZEXT816(0);
          local_358 = SUB6416(ZEXT864(0),0);
          local_338 = SUB6416(ZEXT864(0),0);
        }
        local_278._4_4_ = 0;
        local_278._0_4_ = uVar156 - uVar149;
        local_278._8_8_ = auVar165._8_8_;
        if (uVar156 - uVar149 != 0 && (int)uVar149 <= (int)uVar156) {
          lVar145 = 0;
          do {
            local_2a8._0_16_ = auVar164;
            uVar149 = *(uint *)(*pauVar141 + lVar145 * 4);
            fVar265 = float16_to_float32(*(unsigned_short *)(*pauVar162 + lVar145 * 2));
            auVar191 = _local_218;
            local_218._4_4_ = extraout_XMM0_Db_06;
            local_218._0_4_ = fVar265;
            fStack_210 = (float)extraout_XMM0_Dc_05;
            _fStack_208 = auVar191._16_16_;
            fStack_20c = (float)extraout_XMM0_Dd_05;
            _local_318 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
            local_328._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar163 + lVar145 * 2));
            local_328._4_4_ = extraout_XMM0_Db_07;
            local_328._8_4_ = extraout_XMM0_Dc_06;
            local_328._12_4_ = extraout_XMM0_Dd_06;
            local_248 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
            local_258._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar158 + lVar145 * 2));
            local_258._4_4_ = extraout_XMM0_Db_08;
            local_258._8_4_ = extraout_XMM0_Dc_07;
            local_258._12_4_ = extraout_XMM0_Dd_07;
            local_268 = ZEXT416(*(uint *)(*pauVar141 + lVar145 * 4));
            auVar218._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar160 + lVar145 * 2));
            auVar218._4_60_ = extraout_var_00;
            auVar164 = vinsertps_avx(_local_218,ZEXT416((uint)local_328._0_4_),0x10);
            auVar164 = vinsertps_avx(auVar164,ZEXT416((uint)local_258._0_4_),0x20);
            auVar164 = vinsertps_avx(auVar164,auVar218._0_16_,0x30);
            auVar165 = vinsertps_avx(ZEXT416(uVar149),ZEXT416((uint)local_318._0_4_),0x10);
            auVar165 = vinsertps_avx(auVar165,ZEXT416((uint)local_248._0_4_),0x20);
            auVar165 = vinsertps_avx(auVar165,ZEXT416((uint)local_268._0_4_),0x30);
            auVar164 = vfmadd231ps_fma(local_2a8._0_16_,auVar164,auVar165);
            lVar145 = lVar145 + 1;
          } while (local_278._0_4_ != (int)lVar145);
        }
        auVar191 = vhaddps_avx(local_1b8,local_1f8);
        auVar192 = vhaddps_avx(local_1d8,local_198);
        auVar191 = vhaddps_avx(auVar191,auVar192);
        auVar167 = vunpcklps_avx(local_348,local_368);
        auVar168 = vunpcklps_avx(local_358,local_338);
        auVar165 = vunpckhps_avx(local_348,local_368);
        auVar169 = vunpckhps_avx(local_358,local_338);
        auVar166 = vmovlhps_avx(auVar167,auVar168);
        auVar168 = vunpckhpd_avx(auVar167,auVar168);
        auVar167 = vmovlhps_avx(auVar165,auVar169);
        auVar169 = vunpckhpd_avx(auVar165,auVar169);
        auVar165._0_4_ =
             auVar168._0_4_ + auVar166._0_4_ + auVar167._0_4_ + auVar169._0_4_ +
             auVar164._0_4_ + auVar191._0_4_ + auVar191._16_4_;
        auVar165._4_4_ =
             auVar168._4_4_ + auVar166._4_4_ + auVar167._4_4_ + auVar169._4_4_ +
             auVar164._4_4_ + auVar191._4_4_ + auVar191._20_4_;
        auVar165._8_4_ =
             auVar168._8_4_ + auVar166._8_4_ + auVar167._8_4_ + auVar169._8_4_ +
             auVar164._8_4_ + auVar191._8_4_ + auVar191._24_4_;
        auVar165._12_4_ =
             auVar168._12_4_ + auVar166._12_4_ + auVar167._12_4_ + auVar169._12_4_ +
             auVar164._12_4_ + auVar191._12_4_ + auVar191._28_4_;
        switch(iVar5) {
        case 1:
          auVar165 = vmaxps_avx(auVar165,ZEXT816(0) << 0x20);
          break;
        case 2:
          auVar164 = vmaxps_avx(auVar165,ZEXT816(0) << 0x20);
          auVar165 = vminps_avx(auVar165,ZEXT816(0) << 0x20);
          uVar1 = *(this->super_InnerProduct).activation_params.data;
          auVar55._4_4_ = uVar1;
          auVar55._0_4_ = uVar1;
          auVar55._8_4_ = uVar1;
          auVar55._12_4_ = uVar1;
          auVar165 = vfmadd132ps_avx512vl(auVar165,auVar164,auVar55);
          break;
        case 3:
          puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar8;
          auVar53._4_4_ = uVar1;
          auVar53._0_4_ = uVar1;
          auVar53._8_4_ = uVar1;
          auVar53._12_4_ = uVar1;
          auVar164 = vmaxps_avx512vl(auVar165,auVar53);
          uVar1 = puVar8[1];
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar165 = vminps_avx512vl(auVar164,auVar54);
          break;
        case 4:
          auVar43._8_4_ = 0x80000000;
          auVar43._0_8_ = 0x8000000080000000;
          auVar43._12_4_ = 0x80000000;
          auVar164 = vxorps_avx512vl(auVar165,auVar43);
          auVar44._8_4_ = 0x42b0c0a5;
          auVar44._0_8_ = 0x42b0c0a542b0c0a5;
          auVar44._12_4_ = 0x42b0c0a5;
          auVar164 = vminps_avx512vl(auVar164,auVar44);
          auVar45._8_4_ = 0xc2b0c0a5;
          auVar45._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar45._12_4_ = 0xc2b0c0a5;
          auVar166 = vmaxps_avx512vl(auVar164,auVar45);
          auVar240._8_4_ = 0x3f000000;
          auVar240._0_8_ = 0x3f0000003f000000;
          auVar240._12_4_ = 0x3f000000;
          auVar254._8_4_ = 0x3fb8aa3b;
          auVar254._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar254._12_4_ = 0x3fb8aa3b;
          auVar165 = vfmadd213ps_fma(auVar254,auVar166,auVar240);
          auVar276._0_4_ = (int)auVar165._0_4_;
          auVar276._4_4_ = (int)auVar165._4_4_;
          auVar276._8_4_ = (int)auVar165._8_4_;
          auVar276._12_4_ = (int)auVar165._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar276);
          uVar155 = vcmpps_avx512vl(auVar165,auVar164,1);
          auVar255._8_4_ = 0x3f800000;
          auVar255._0_8_ = 0x3f8000003f800000;
          auVar255._12_4_ = 0x3f800000;
          auVar165 = vsubps_avx512vl(auVar164,auVar255);
          bVar13 = (bool)((byte)uVar155 & 1);
          auVar189._0_4_ = (float)((uint)bVar13 * auVar165._0_4_ | (uint)!bVar13 * auVar164._0_4_);
          bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
          auVar189._4_4_ = (float)((uint)bVar13 * auVar165._4_4_ | (uint)!bVar13 * auVar164._4_4_);
          bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
          auVar189._8_4_ = (float)((uint)bVar13 * auVar165._8_4_ | (uint)!bVar13 * auVar164._8_4_);
          bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
          auVar189._12_4_ =
               (float)((uint)bVar13 * auVar165._12_4_ | (uint)!bVar13 * auVar164._12_4_);
          auVar46._8_4_ = 0x3f318000;
          auVar46._0_8_ = 0x3f3180003f318000;
          auVar46._12_4_ = 0x3f318000;
          auVar164 = vfmsub231ps_avx512vl(auVar166,auVar189,auVar46);
          auVar47._8_4_ = 0x395e8083;
          auVar47._0_8_ = 0x395e8083395e8083;
          auVar47._12_4_ = 0x395e8083;
          auVar165 = vfmsub231ps_avx512vl(auVar164,auVar189,auVar47);
          auVar284._8_4_ = 0x39506967;
          auVar284._0_8_ = 0x3950696739506967;
          auVar284._12_4_ = 0x39506967;
          auVar48._8_4_ = 0x3ab743ce;
          auVar48._0_8_ = 0x3ab743ce3ab743ce;
          auVar48._12_4_ = 0x3ab743ce;
          auVar164 = vfmadd213ps_avx512vl(auVar284,auVar165,auVar48);
          auVar49._8_4_ = 0x3c088908;
          auVar49._0_8_ = 0x3c0889083c088908;
          auVar49._12_4_ = 0x3c088908;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar165,auVar49);
          auVar50._8_4_ = 0x3d2aa9c1;
          auVar50._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar50._12_4_ = 0x3d2aa9c1;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar165,auVar50);
          auVar291._0_4_ = auVar165._0_4_ * auVar165._0_4_;
          auVar291._4_4_ = auVar165._4_4_ * auVar165._4_4_;
          auVar291._8_4_ = auVar165._8_4_ * auVar165._8_4_;
          auVar291._12_4_ = auVar165._12_4_ * auVar165._12_4_;
          auVar51._8_4_ = 0x3e2aaaaa;
          auVar51._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar51._12_4_ = 0x3e2aaaaa;
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar165,auVar51);
          auVar164 = vfmadd213ps_fma(auVar164,auVar165,auVar240);
          auVar164 = vfmadd213ps_fma(auVar164,auVar291,auVar165);
          auVar234._0_4_ = auVar164._0_4_ + 1.0;
          auVar234._4_4_ = auVar164._4_4_ + 1.0;
          auVar234._8_4_ = auVar164._8_4_ + 1.0;
          auVar234._12_4_ = auVar164._12_4_ + 1.0;
          auVar241._0_4_ = (int)auVar189._0_4_;
          auVar241._4_4_ = (int)auVar189._4_4_;
          auVar241._8_4_ = (int)auVar189._8_4_;
          auVar241._12_4_ = (int)auVar189._12_4_;
          auVar164 = vpslld_avx(auVar241,0x17);
          auVar52._8_4_ = 0x3f800000;
          auVar52._0_8_ = 0x3f8000003f800000;
          auVar52._12_4_ = 0x3f800000;
          auVar164 = vpaddd_avx512vl(auVar164,auVar52);
          auVar164 = vfmadd213ps_fma(auVar164,auVar234,auVar255);
          auVar165 = vdivps_avx(auVar255,auVar164);
          break;
        case 5:
          auVar296._8_4_ = 0x42b0c0a5;
          auVar296._0_8_ = 0x42b0c0a542b0c0a5;
          auVar296._12_4_ = 0x42b0c0a5;
          auVar300._8_4_ = 0xc2b0c0a5;
          auVar300._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar300._12_4_ = 0xc2b0c0a5;
          auVar164 = vminps_avx(auVar165,auVar296);
          auVar166 = vmaxps_avx(auVar164,auVar300);
          auVar282._8_4_ = 0x3fb8aa3b;
          auVar282._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar282._12_4_ = 0x3fb8aa3b;
          auVar252._8_4_ = 0x3f000000;
          auVar252._0_8_ = 0x3f0000003f000000;
          auVar252._12_4_ = 0x3f000000;
          auVar167 = vfmadd213ps_fma(auVar282,auVar166,auVar252);
          auVar273._0_4_ = (int)auVar167._0_4_;
          auVar273._4_4_ = (int)auVar167._4_4_;
          auVar273._8_4_ = (int)auVar167._8_4_;
          auVar273._12_4_ = (int)auVar167._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar273);
          uVar155 = vcmpps_avx512vl(auVar167,auVar164,1);
          auVar238._8_4_ = 0x3f800000;
          auVar238._0_8_ = 0x3f8000003f800000;
          auVar238._12_4_ = 0x3f800000;
          auVar274._8_4_ = 0x3f318000;
          auVar274._0_8_ = 0x3f3180003f318000;
          auVar274._12_4_ = 0x3f318000;
          auVar167 = vsubps_avx512vl(auVar164,auVar238);
          bVar13 = (bool)((byte)uVar155 & 1);
          auVar184._0_4_ = (float)((uint)bVar13 * auVar167._0_4_ | (uint)!bVar13 * auVar164._0_4_);
          bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
          auVar184._4_4_ = (float)((uint)bVar13 * auVar167._4_4_ | (uint)!bVar13 * auVar164._4_4_);
          bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
          auVar184._8_4_ = (float)((uint)bVar13 * auVar167._8_4_ | (uint)!bVar13 * auVar164._8_4_);
          bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
          auVar184._12_4_ =
               (float)((uint)bVar13 * auVar167._12_4_ | (uint)!bVar13 * auVar164._12_4_);
          auVar164 = vfmsub231ps_fma(auVar166,auVar184,auVar274);
          auVar305._8_4_ = 0xb95e8083;
          auVar305._0_8_ = 0xb95e8083b95e8083;
          auVar305._12_4_ = 0xb95e8083;
          auVar164 = vfnmsub231ps_fma(auVar164,auVar184,auVar305);
          auVar166 = vmulps_avx512vl(auVar164,auVar164);
          auVar309._8_4_ = 0x3ab743ce;
          auVar309._0_8_ = 0x3ab743ce3ab743ce;
          auVar309._12_4_ = 0x3ab743ce;
          auVar290._8_4_ = 0x39506967;
          auVar290._0_8_ = 0x3950696739506967;
          auVar290._12_4_ = 0x39506967;
          auVar167 = vfmadd213ps_avx512vl(auVar290,auVar164,auVar309);
          auVar313._8_4_ = 0x3c088908;
          auVar313._0_8_ = 0x3c0889083c088908;
          auVar313._12_4_ = 0x3c088908;
          auVar317._8_4_ = 0x3d2aa9c1;
          auVar317._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar317._12_4_ = 0x3d2aa9c1;
          auVar167 = vfmadd213ps_avx512vl(auVar167,auVar164,auVar313);
          auVar167 = vfmadd213ps_avx512vl(auVar167,auVar164,auVar317);
          auVar321._8_4_ = 0x3e2aaaaa;
          auVar321._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar321._12_4_ = 0x3e2aaaaa;
          auVar167 = vfmadd213ps_avx512vl(auVar167,auVar164,auVar321);
          auVar167 = vfmadd213ps_avx512vl(auVar167,auVar164,auVar252);
          auVar164 = vfmadd213ps_avx512vl(auVar167,auVar166,auVar164);
          auVar166 = vaddps_avx512vl(auVar164,auVar238);
          auVar325._0_4_ = (int)auVar184._0_4_;
          auVar325._4_4_ = (int)auVar184._4_4_;
          auVar325._8_4_ = (int)auVar184._8_4_;
          auVar325._12_4_ = (int)auVar184._12_4_;
          auVar164 = vpslld_avx(auVar325,0x17);
          auVar326._8_4_ = 0x3f800000;
          auVar326._0_8_ = 0x3f8000003f800000;
          auVar326._12_4_ = 0x3f800000;
          auVar164 = vpaddd_avx(auVar164,auVar326);
          auVar164 = vfmadd213ps_avx512vl(auVar164,auVar166,auVar238);
          auVar173._8_4_ = 0x800000;
          auVar173._0_8_ = 0x80000000800000;
          auVar173._12_4_ = 0x800000;
          auVar166 = vmaxps_avx512vl(auVar164,auVar173);
          uVar155 = vcmpps_avx512vl(auVar164,(undefined1  [16])0x0,2);
          auVar164 = vpsrld_avx512vl(auVar166,0x17);
          auVar333._8_4_ = 0x3f000000;
          auVar333._0_8_ = 0x3f0000003f000000;
          auVar333._12_4_ = 0x3f000000;
          auVar172._8_4_ = 0x807fffff;
          auVar172._0_8_ = 0x807fffff807fffff;
          auVar172._12_4_ = 0x807fffff;
          auVar166 = vpternlogd_avx512vl(auVar333,auVar166,auVar172,0xf8);
          auVar174._8_4_ = 0xffffff82;
          auVar174._0_8_ = 0xffffff82ffffff82;
          auVar174._12_4_ = 0xffffff82;
          auVar164 = vpaddd_avx512vl(auVar164,auVar174);
          auVar175._8_4_ = 0x3f3504f3;
          auVar175._0_8_ = 0x3f3504f33f3504f3;
          auVar175._12_4_ = 0x3f3504f3;
          uVar137 = vcmpps_avx512vl(auVar166,auVar175,1);
          auVar34._8_4_ = 0xbf800000;
          auVar34._0_8_ = 0xbf800000bf800000;
          auVar34._12_4_ = 0xbf800000;
          auVar167 = vaddps_avx512vl(auVar166,auVar34);
          auVar164 = vcvtdq2ps_avx(auVar164);
          auVar168 = vsubps_avx512vl(auVar164,auVar238);
          bVar13 = (bool)((byte)uVar137 & 1);
          auVar185._0_4_ = (uint)bVar13 * auVar168._0_4_ | (uint)!bVar13 * auVar164._0_4_;
          bVar13 = (bool)((byte)(uVar137 >> 1) & 1);
          auVar185._4_4_ = (uint)bVar13 * auVar168._4_4_ | (uint)!bVar13 * auVar164._4_4_;
          bVar13 = (bool)((byte)(uVar137 >> 2) & 1);
          auVar185._8_4_ = (uint)bVar13 * auVar168._8_4_ | (uint)!bVar13 * auVar164._8_4_;
          bVar13 = (bool)((byte)(uVar137 >> 3) & 1);
          auVar185._12_4_ = (uint)bVar13 * auVar168._12_4_ | (uint)!bVar13 * auVar164._12_4_;
          auVar164 = vaddps_avx512vl(auVar167,auVar166);
          bVar13 = (bool)((byte)uVar137 & 1);
          auVar186._0_4_ = (uint)bVar13 * auVar164._0_4_ | (uint)!bVar13 * auVar167._0_4_;
          bVar13 = (bool)((byte)(uVar137 >> 1) & 1);
          auVar186._4_4_ = (uint)bVar13 * auVar164._4_4_ | (uint)!bVar13 * auVar167._4_4_;
          bVar13 = (bool)((byte)(uVar137 >> 2) & 1);
          auVar186._8_4_ = (uint)bVar13 * auVar164._8_4_ | (uint)!bVar13 * auVar167._8_4_;
          bVar13 = (bool)((byte)(uVar137 >> 3) & 1);
          auVar186._12_4_ = (uint)bVar13 * auVar164._12_4_ | (uint)!bVar13 * auVar167._12_4_;
          auVar164 = vmulps_avx512vl(auVar186,auVar186);
          auVar166 = vbroadcastss_avx512vl(ZEXT416(0x3d9021bb));
          auVar35._8_4_ = 0xbdebd1b8;
          auVar35._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar35._12_4_ = 0xbdebd1b8;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar35);
          auVar36._8_4_ = 0x3def251a;
          auVar36._0_8_ = 0x3def251a3def251a;
          auVar36._12_4_ = 0x3def251a;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar36);
          auVar37._8_4_ = 0xbdfe5d4f;
          auVar37._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar37._12_4_ = 0xbdfe5d4f;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar37);
          auVar38._8_4_ = 0x3e11e9bf;
          auVar38._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar38._12_4_ = 0x3e11e9bf;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar38);
          auVar39._8_4_ = 0xbe2aae50;
          auVar39._0_8_ = 0xbe2aae50be2aae50;
          auVar39._12_4_ = 0xbe2aae50;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar39);
          auVar40._8_4_ = 0x3e4cceac;
          auVar40._0_8_ = 0x3e4cceac3e4cceac;
          auVar40._12_4_ = 0x3e4cceac;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar40);
          auVar41._8_4_ = 0xbe7ffffc;
          auVar41._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar41._12_4_ = 0xbe7ffffc;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar41);
          auVar42._8_4_ = 0x3eaaaaaa;
          auVar42._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar42._12_4_ = 0x3eaaaaaa;
          auVar166 = vfmadd213ps_avx512vl(auVar166,auVar186,auVar42);
          auVar167 = vmulps_avx512vl(auVar164,auVar186);
          auVar166 = vmulps_avx512vl(auVar167,auVar166);
          auVar166 = vfmadd231ps_avx512vl(auVar166,auVar185,auVar305);
          auVar164 = vfmsub231ps_avx512vl(auVar166,auVar252,auVar164);
          auVar164 = vsubps_avx512vl(auVar164,auVar186);
          auVar164 = vfnmadd231ps_fma(auVar164,auVar274,auVar185);
          auVar166 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar155 & 1);
          auVar187._0_4_ =
               (uint)bVar13 * auVar166._0_4_ |
               (uint)!bVar13 * (int)(auVar164._0_4_ + auVar164._0_4_);
          bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
          auVar187._4_4_ =
               (uint)bVar13 * auVar166._4_4_ |
               (uint)!bVar13 * (int)(auVar164._4_4_ + auVar164._4_4_);
          bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
          auVar187._8_4_ =
               (uint)bVar13 * auVar166._8_4_ |
               (uint)!bVar13 * (int)(auVar164._8_4_ + auVar164._8_4_);
          bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
          auVar187._12_4_ =
               (uint)bVar13 * auVar166._12_4_ |
               (uint)!bVar13 * (int)(auVar164._12_4_ + auVar164._12_4_);
          auVar164 = vminps_avx(auVar187,auVar296);
          auVar166 = vmaxps_avx(auVar164,auVar300);
          auVar167 = vfmadd213ps_fma(auVar282,auVar166,auVar252);
          auVar301._0_4_ = (int)auVar167._0_4_;
          auVar301._4_4_ = (int)auVar167._4_4_;
          auVar301._8_4_ = (int)auVar167._8_4_;
          auVar301._12_4_ = (int)auVar167._12_4_;
          auVar164 = vcvtdq2ps_avx(auVar301);
          uVar155 = vcmpps_avx512vl(auVar167,auVar164,1);
          auVar167 = vsubps_avx512vl(auVar164,auVar238);
          bVar13 = (bool)((byte)uVar155 & 1);
          auVar188._0_4_ = (float)((uint)bVar13 * auVar167._0_4_ | (uint)!bVar13 * auVar164._0_4_);
          bVar13 = (bool)((byte)(uVar155 >> 1) & 1);
          auVar188._4_4_ = (float)((uint)bVar13 * auVar167._4_4_ | (uint)!bVar13 * auVar164._4_4_);
          bVar13 = (bool)((byte)(uVar155 >> 2) & 1);
          auVar188._8_4_ = (float)((uint)bVar13 * auVar167._8_4_ | (uint)!bVar13 * auVar164._8_4_);
          bVar13 = (bool)((byte)(uVar155 >> 3) & 1);
          auVar188._12_4_ =
               (float)((uint)bVar13 * auVar167._12_4_ | (uint)!bVar13 * auVar164._12_4_);
          auVar164 = vfmsub213ps_fma(auVar274,auVar188,auVar166);
          auVar166 = vfnmsub231ps_fma(auVar164,auVar188,auVar305);
          auVar283._0_4_ = auVar166._0_4_ * auVar166._0_4_;
          auVar283._4_4_ = auVar166._4_4_ * auVar166._4_4_;
          auVar283._8_4_ = auVar166._8_4_ * auVar166._8_4_;
          auVar283._12_4_ = auVar166._12_4_ * auVar166._12_4_;
          auVar164 = vfmadd213ps_fma(auVar290,auVar166,auVar309);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar313);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar317);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar321);
          auVar164 = vfmadd213ps_fma(auVar164,auVar166,auVar252);
          auVar164 = vfmadd213ps_fma(auVar164,auVar283,auVar166);
          auVar253._0_4_ = auVar164._0_4_ + 1.0;
          auVar253._4_4_ = auVar164._4_4_ + 1.0;
          auVar253._8_4_ = auVar164._8_4_ + 1.0;
          auVar253._12_4_ = auVar164._12_4_ + 1.0;
          auVar275._0_4_ = (int)auVar188._0_4_;
          auVar275._4_4_ = (int)auVar188._4_4_;
          auVar275._8_4_ = (int)auVar188._8_4_;
          auVar275._12_4_ = (int)auVar188._12_4_;
          auVar164 = vpslld_avx(auVar275,0x17);
          auVar164 = vpaddd_avx(auVar326,auVar164);
          auVar164 = vfmadd213ps_fma(auVar164,auVar253,auVar238);
          auVar239._8_4_ = 0x40000000;
          auVar239._0_8_ = 0x4000000040000000;
          auVar239._12_4_ = 0x40000000;
          auVar164 = vdivps_avx(auVar239,auVar164);
          auVar165 = vfmsub231ps_fma(auVar165,auVar165,auVar164);
          break;
        case 6:
          puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar8;
          auVar176._4_4_ = uVar1;
          auVar176._0_4_ = uVar1;
          auVar176._8_4_ = uVar1;
          auVar176._12_4_ = uVar1;
          uVar1 = puVar8[1];
          auVar170._4_4_ = uVar1;
          auVar170._0_4_ = uVar1;
          auVar170._8_4_ = uVar1;
          auVar170._12_4_ = uVar1;
          auVar164 = vfmadd213ps_avx512vl(auVar176,auVar165,auVar170);
          auVar233._12_4_ = 0;
          auVar233._0_12_ = ZEXT412(0);
          auVar164 = vmaxps_avx(auVar164,auVar233 << 0x20);
          auVar171._8_4_ = 0x3f800000;
          auVar171._0_8_ = 0x3f8000003f800000;
          auVar171._12_4_ = 0x3f800000;
          auVar164 = vminps_avx512vl(auVar164,auVar171);
          auVar165._0_4_ = auVar164._0_4_ * auVar165._0_4_;
          auVar165._4_4_ = auVar164._4_4_ * auVar165._4_4_;
          auVar165._8_4_ = auVar164._8_4_ * auVar165._8_4_;
          auVar165._12_4_ = auVar164._12_4_ * auVar165._12_4_;
        }
        uVar155 = CONCAT44(uStack_2b4,local_2b8);
        *(undefined1 (*) [16])((long)top_blob->data + uVar155 * 4) = auVar165;
        uVar149 = local_288._0_4_;
        auVar164 = local_288;
      }
      local_288 = auVar164;
      iVar134 = (int)uVar155 + uVar149 * 4;
      iVar144 = 0;
      if ((int)uVar135 <= iVar134) goto LAB_002db035;
      local_328._0_4_ = uVar156 & 0xfffffff8;
      uVar155 = (ulong)iVar134;
      do {
        auVar217 = ZEXT1664(ZEXT816(0) << 0x40);
        if (pvVar7 != (void *)0x0) {
          auVar217 = ZEXT464(*(uint *)((long)pvVar7 + uVar155 * 4));
        }
        fVar265 = auVar217._0_4_;
        pauVar158 = (undefined1 (*) [16])
                    ((long)(this->weight_data_tm).w * uVar155 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        pauVar141 = local_3b8;
        if ((int)uVar156 < 8) {
          uVar135 = 0;
          _local_218 = SUB6432(ZEXT864(0),0);
        }
        else {
          auVar218 = ZEXT864(0);
          iVar144 = 7;
          do {
            auVar164 = vlddqu_avx(*pauVar158);
            auVar191 = vcvtph2ps_f16c(auVar164);
            auVar164 = vfmadd231ps_fma(auVar218._0_32_,auVar191,*pauVar141);
            auVar218 = ZEXT1664(auVar164);
            _local_218 = ZEXT1632(auVar164);
            pauVar141 = pauVar141 + 1;
            pauVar158 = pauVar158 + 1;
            iVar144 = iVar144 + 8;
          } while (iVar144 < (int)uVar156);
          uVar135 = local_328._0_4_;
        }
        _local_318 = ZEXT816(0) << 0x40;
        uVar149 = uVar135 | 3;
        while ((int)uVar149 < (int)uVar156) {
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)*pauVar158;
          auVar164 = vcvtph2ps_f16c(auVar4);
          _local_318 = vfmadd231ps_fma(_local_318,auVar164,*(undefined1 (*) [16])*pauVar141);
          pauVar141 = (undefined1 (*) [32])(*pauVar141 + 0x10);
          pauVar158 = (undefined1 (*) [16])(*pauVar158 + 8);
          uVar149 = uVar135 + 7;
          uVar135 = uVar135 + 4;
        }
        if ((int)uVar135 < (int)uVar156) {
          lVar145 = 0;
          do {
            local_2a8._0_4_ = auVar217._0_4_;
            uVar149 = *(uint *)(*pauVar141 + lVar145 * 4);
            auVar219._0_4_ = float16_to_float32(*(unsigned_short *)(*pauVar158 + lVar145 * 2));
            auVar219._4_60_ = extraout_var_01;
            auVar164 = vfmadd231ss_fma(ZEXT416((uint)local_2a8._0_4_),auVar219._0_16_,
                                       ZEXT416(uVar149));
            fVar265 = auVar164._0_4_;
            auVar217 = ZEXT1664(auVar164);
            lVar145 = lVar145 + 1;
          } while (uVar156 - uVar135 != (int)lVar145);
        }
        auVar235._0_4_ = (float)local_218._0_4_ + (float)local_318._0_4_ + fStack_208;
        auVar235._4_4_ = (float)local_218._4_4_ + (float)local_318._4_4_ + fStack_204;
        auVar235._8_4_ = fStack_210 + fStack_310 + fStack_200;
        auVar235._12_4_ = fStack_20c + fStack_30c + fStack_1fc;
        auVar164 = vhaddps_avx(auVar235,auVar235);
        auVar164 = vhaddps_avx(auVar164,auVar164);
        fVar265 = auVar164._0_4_ + fVar265;
        auVar164 = ZEXT416((uint)fVar265);
        fVar232 = fVar265;
        switch(iVar5) {
        case 1:
          auVar164 = vmaxss_avx(auVar164,ZEXT416(0));
          fVar232 = auVar164._0_4_;
          break;
        case 2:
          uVar17 = vcmpss_avx512f(auVar164,ZEXT416(0),0xe);
          bVar13 = (bool)((byte)uVar17 & 1);
          fVar232 = (float)((uint)bVar13 * 0x3f800000 +
                           (uint)!bVar13 * *(this->super_InnerProduct).activation_params.data) *
                    fVar265;
          break;
        case 3:
          puVar9 = (uint *)(this->super_InnerProduct).activation_params.data;
          fVar265 = (float)puVar9[1];
          auVar164 = vmaxss_avx(auVar164,ZEXT416(*puVar9));
          fVar232 = auVar164._0_4_;
          if (fVar265 < auVar164._0_4_) {
            fVar232 = fVar265;
          }
          break;
        case 4:
          auVar164 = vminss_avx(auVar164,SUB6416(ZEXT464(0x42b0c0a5),0));
          auVar57._8_4_ = 0x80000000;
          auVar57._0_8_ = 0x8000000080000000;
          auVar57._12_4_ = 0x80000000;
          auVar165 = vxorps_avx512vl(auVar164,auVar57);
          uVar17 = vcmpss_avx512f(auVar164,ZEXT416(0xc2b0c0a5),1);
          bVar13 = (bool)((byte)uVar17 & 1);
          fVar265 = expf((float)((uint)bVar13 * 0x42b0c0a5 + (uint)!bVar13 * auVar165._0_4_));
          fVar232 = 1.0 / (fVar265 + 1.0);
          break;
        case 5:
          local_2a8._0_4_ = fVar265;
          fVar265 = expf(fVar265);
          fVar265 = logf(fVar265 + 1.0);
          fVar232 = tanhf(fVar265);
          fVar232 = fVar232 * (float)local_2a8._0_4_;
          break;
        case 6:
          pfVar12 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar2 = *pfVar12;
          auVar56._8_4_ = 0x80000000;
          auVar56._0_8_ = 0x8000000080000000;
          auVar56._12_4_ = 0x80000000;
          auVar166 = ZEXT416((uint)pfVar12[1]);
          auVar165 = vxorps_avx512vl(auVar166,auVar56);
          fVar266 = auVar165._0_4_ / fVar2;
          fVar232 = 0.0;
          if ((fVar266 <= fVar265) && (fVar232 = fVar265, fVar265 <= fVar266 + 1.0 / fVar2)) {
            auVar164 = vfmadd213ss_fma(ZEXT416((uint)fVar2),auVar164,auVar166);
            fVar232 = auVar164._0_4_ * fVar265;
          }
        }
        *(float *)((long)top_blob->data + uVar155 * 4) = fVar232;
        uVar155 = uVar155 + 1;
      } while (uVar155 != local_238);
    }
    else if ((iVar134 == 4) && (0 < (int)uVar135)) {
      uVar137 = 0;
      auVar233 = ZEXT816(0) << 0x40;
      auVar164 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar165 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar281._8_4_ = 0x3f000000;
      auVar281._0_8_ = 0x3f0000003f000000;
      auVar281._12_4_ = 0x3f000000;
      auVar166 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar295._8_4_ = 0x3f800000;
      auVar295._0_8_ = 0x3f8000003f800000;
      auVar295._12_4_ = 0x3f800000;
      auVar299._8_4_ = 0x3f318000;
      auVar299._0_8_ = 0x3f3180003f318000;
      auVar299._12_4_ = 0x3f318000;
      auVar308._8_4_ = 0x39506967;
      auVar308._0_8_ = 0x3950696739506967;
      auVar308._12_4_ = 0x39506967;
      auVar312._8_4_ = 0x3ab743ce;
      auVar312._0_8_ = 0x3ab743ce3ab743ce;
      auVar312._12_4_ = 0x3ab743ce;
      auVar316._8_4_ = 0x3c088908;
      auVar316._0_8_ = 0x3c0889083c088908;
      auVar316._12_4_ = 0x3c088908;
      auVar320._8_4_ = 0x3d2aa9c1;
      auVar320._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar320._12_4_ = 0x3d2aa9c1;
      auVar324._8_4_ = 0x3e2aaaaa;
      auVar324._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar324._12_4_ = 0x3e2aaaaa;
      auVar329._8_4_ = 0x3f800000;
      auVar329._0_8_ = 0x3f8000003f800000;
      auVar329._12_4_ = 0x3f800000;
      auVar332._8_4_ = 0xb95e8083;
      auVar332._0_8_ = 0xb95e8083b95e8083;
      auVar332._12_4_ = 0xb95e8083;
      auVar167 = vbroadcastss_avx512vl(ZEXT416(0xbe2aae50));
      auVar168 = vbroadcastss_avx512vl(ZEXT416(0x3e4cceac));
      auVar169 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar170 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar171 = vbroadcastss_avx512vl(ZEXT416(0x40000000));
      do {
        auVar176 = ZEXT816(0) << 0x40;
        if (pvVar7 != (void *)0x0) {
          auVar176 = *(undefined1 (*) [16])((long)pvVar7 + uVar137 * 0x10);
        }
        pauVar141 = (undefined1 (*) [32])
                    ((long)(this->weight_data_tm).w * uVar137 * (this->weight_data_tm).elemsize +
                    (long)(this->weight_data_tm).data);
        auVar172 = in_ZMM17._0_16_;
        auVar174 = in_ZMM18._0_16_;
        auVar173 = in_ZMM16._0_16_;
        pauVar138 = local_3b8;
        if ((int)uVar156 < 8) {
          auVar173 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM16 = ZEXT1664(auVar173);
          auVar173 = vxorps_avx512vl(auVar174,auVar174);
          in_ZMM18 = ZEXT1664(auVar173);
          auVar173 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM17 = ZEXT1664(auVar173);
          auVar217 = ZEXT864(0);
          uVar135 = 0;
        }
        else {
          auVar217 = ZEXT864(0);
          iVar144 = 7;
          auVar172 = vxorps_avx512vl(auVar172,auVar172);
          in_ZMM17 = ZEXT1664(auVar172);
          auVar172 = vxorps_avx512vl(auVar174,auVar174);
          in_ZMM18 = ZEXT1664(auVar172);
          auVar173 = vxorps_avx512vl(auVar173,auVar173);
          in_ZMM16 = ZEXT1664(auVar173);
          do {
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)*pauVar138));
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 4)));
            auVar174 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 8)));
            auVar175 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0xc)));
            auVar193 = vinsertf32x4_avx512vl(ZEXT1632(auVar173),auVar172,1);
            auVar194 = vinsertf32x4_avx512vl(ZEXT1632(auVar174),auVar175,1);
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x10)));
            auVar172 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x14)));
            auVar174 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x18)));
            auVar195 = vinsertf32x4_avx512vl(ZEXT1632(auVar173),auVar172,1);
            auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 0x1c)));
            auVar196 = vinsertf32x4_avx512vl(ZEXT1632(auVar174),auVar173,1);
            auVar191 = vlddqu_avx(*pauVar141);
            auVar192 = vlddqu_avx(pauVar141[1]);
            auVar197 = vcvtph2ps_avx512vl(auVar191._0_16_);
            auVar193 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar193,auVar197);
            auVar217 = ZEXT3264(auVar193);
            auVar191 = vcvtph2ps_f16c(auVar191._16_16_);
            auVar191 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar194,auVar191);
            in_ZMM17 = ZEXT3264(auVar191);
            auVar191 = vcvtph2ps_f16c(auVar192._0_16_);
            auVar191 = vfmadd231ps_avx512vl(in_ZMM18._0_32_,auVar195,auVar191);
            in_ZMM18 = ZEXT3264(auVar191);
            auVar191 = vcvtph2ps_f16c(auVar192._16_16_);
            auVar191 = vfmadd231ps_avx512vl(in_ZMM16._0_32_,auVar196,auVar191);
            in_ZMM16 = ZEXT3264(auVar191);
            pauVar138 = pauVar138 + 1;
            pauVar141 = pauVar141 + 2;
            iVar144 = iVar144 + 8;
            uVar135 = uVar156 & 0xfffffff8;
          } while (iVar144 < (int)uVar156);
        }
        auVar191 = auVar217._0_32_;
        uVar149 = uVar135 | 3;
        while ((int)uVar149 < (int)uVar156) {
          uVar1 = *(undefined4 *)*pauVar138;
          auVar259._4_4_ = uVar1;
          auVar259._0_4_ = uVar1;
          auVar259._8_4_ = uVar1;
          auVar259._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(*pauVar138 + 4);
          auVar259._20_4_ = uVar1;
          auVar259._16_4_ = uVar1;
          auVar259._24_4_ = uVar1;
          auVar259._28_4_ = uVar1;
          auVar173 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(*pauVar138 + 8)));
          uVar1 = *(undefined4 *)(*pauVar138 + 0xc);
          auVar267._4_4_ = uVar1;
          auVar267._0_4_ = uVar1;
          auVar267._8_4_ = uVar1;
          auVar267._12_4_ = uVar1;
          auVar193 = vinsertf32x4_avx512vl(ZEXT1632(auVar173),auVar267,1);
          auVar192 = vlddqu_avx(*pauVar141);
          auVar191 = vcvtph2ps_avx512vl(auVar192._0_16_);
          auVar191 = vfmadd231ps_avx512vl(auVar217._0_32_,auVar259,auVar191);
          auVar217 = ZEXT3264(auVar191);
          auVar192 = vcvtph2ps_f16c(auVar192._16_16_);
          auVar192 = vfmadd231ps_avx512vl(in_ZMM17._0_32_,auVar193,auVar192);
          in_ZMM17 = ZEXT3264(auVar192);
          pauVar138 = (undefined1 (*) [32])(*pauVar138 + 0x10);
          pauVar141 = pauVar141 + 1;
          uVar149 = uVar135 + 7;
          uVar135 = uVar135 + 4;
        }
        if (uVar156 - uVar135 != 0 && (int)uVar135 <= (int)uVar156) {
          lVar145 = 0;
          do {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = *(ulong *)(*pauVar141 + lVar145 * 8);
            auVar173 = vcvtph2ps_f16c(auVar3);
            uVar1 = *(undefined4 *)(*pauVar138 + lVar145 * 4);
            auVar18._4_4_ = uVar1;
            auVar18._0_4_ = uVar1;
            auVar18._8_4_ = uVar1;
            auVar18._12_4_ = uVar1;
            auVar176 = vfmadd231ps_avx512vl(auVar176,auVar173,auVar18);
            lVar145 = lVar145 + 1;
          } while (uVar156 - uVar135 != (int)lVar145);
        }
        auVar192 = vaddps_avx512vl(in_ZMM18._0_32_,in_ZMM16._0_32_);
        auVar191 = vaddps_avx512vl(in_ZMM17._0_32_,auVar191);
        fVar265 = auVar192._4_4_ + auVar191._4_4_;
        auVar182._0_4_ =
             auVar192._16_4_ + auVar191._16_4_ + auVar192._0_4_ + auVar191._0_4_ + auVar176._0_4_;
        auVar182._4_4_ = fVar265 + fVar265 + auVar176._4_4_;
        auVar182._8_4_ =
             auVar192._24_4_ + auVar191._24_4_ + auVar192._8_4_ + auVar191._8_4_ + auVar176._8_4_;
        auVar182._12_4_ =
             auVar192._28_4_ + auVar191._28_4_ + auVar192._12_4_ + auVar191._12_4_ + auVar176._12_4_
        ;
        switch(iVar5) {
        case 1:
          auVar182 = vmaxps_avx(auVar182,auVar233);
          break;
        case 2:
          auVar176 = vmaxps_avx(auVar182,auVar233);
          auVar173 = vminps_avx(auVar182,auVar233);
          uVar1 = *(this->super_InnerProduct).activation_params.data;
          auVar33._4_4_ = uVar1;
          auVar33._0_4_ = uVar1;
          auVar33._8_4_ = uVar1;
          auVar33._12_4_ = uVar1;
          auVar182 = vfmadd132ps_avx512vl(auVar173,auVar176,auVar33);
          break;
        case 3:
          puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar8;
          auVar31._4_4_ = uVar1;
          auVar31._0_4_ = uVar1;
          auVar31._8_4_ = uVar1;
          auVar31._12_4_ = uVar1;
          auVar176 = vmaxps_avx512vl(auVar182,auVar31);
          uVar1 = puVar8[1];
          auVar32._4_4_ = uVar1;
          auVar32._0_4_ = uVar1;
          auVar32._8_4_ = uVar1;
          auVar32._12_4_ = uVar1;
          auVar182 = vminps_avx512vl(auVar176,auVar32);
          break;
        case 4:
          auVar29._8_4_ = 0x80000000;
          auVar29._0_8_ = 0x8000000080000000;
          auVar29._12_4_ = 0x80000000;
          auVar176 = vxorps_avx512vl(auVar182,auVar29);
          auVar176 = vminps_avx512vl(auVar176,auVar164);
          auVar173 = vmaxps_avx512vl(auVar176,auVar165);
          auVar172 = vfmadd231ps_avx512vl(auVar281,auVar173,auVar166);
          auVar272._0_4_ = (int)auVar172._0_4_;
          auVar272._4_4_ = (int)auVar172._4_4_;
          auVar272._8_4_ = (int)auVar172._8_4_;
          auVar272._12_4_ = (int)auVar172._12_4_;
          auVar176 = vcvtdq2ps_avx(auVar272);
          uVar15 = vcmpps_avx512vl(auVar172,auVar176,1);
          auVar172 = vsubps_avx512vl(auVar176,auVar295);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar183._0_4_ = (float)((uint)bVar13 * auVar172._0_4_ | (uint)!bVar13 * auVar176._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar183._4_4_ = (float)((uint)bVar13 * auVar172._4_4_ | (uint)!bVar13 * auVar176._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar183._8_4_ = (float)((uint)bVar13 * auVar172._8_4_ | (uint)!bVar13 * auVar176._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar183._12_4_ =
               (float)((uint)bVar13 * auVar172._12_4_ | (uint)!bVar13 * auVar176._12_4_);
          auVar176 = vfmsub231ps_fma(auVar173,auVar183,auVar299);
          auVar30._8_4_ = 0x395e8083;
          auVar30._0_8_ = 0x395e8083395e8083;
          auVar30._12_4_ = 0x395e8083;
          auVar173 = vfmsub231ps_avx512vl(auVar176,auVar183,auVar30);
          auVar249._0_4_ = auVar173._0_4_ * auVar173._0_4_;
          auVar249._4_4_ = auVar173._4_4_ * auVar173._4_4_;
          auVar249._8_4_ = auVar173._8_4_ * auVar173._8_4_;
          auVar249._12_4_ = auVar173._12_4_ * auVar173._12_4_;
          auVar176 = vfmadd213ps_fma(auVar308,auVar173,auVar312);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar316);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar320);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar324);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar281);
          auVar176 = vfmadd213ps_fma(auVar176,auVar249,auVar173);
          auVar237._0_4_ = auVar176._0_4_ + 1.0;
          auVar237._4_4_ = auVar176._4_4_ + 1.0;
          auVar237._8_4_ = auVar176._8_4_ + 1.0;
          auVar237._12_4_ = auVar176._12_4_ + 1.0;
          auVar250._0_4_ = (int)auVar183._0_4_;
          auVar250._4_4_ = (int)auVar183._4_4_;
          auVar250._8_4_ = (int)auVar183._8_4_;
          auVar250._12_4_ = (int)auVar183._12_4_;
          auVar176 = vpslld_avx(auVar250,0x17);
          auVar176 = vpaddd_avx(auVar329,auVar176);
          auVar176 = vfmadd213ps_fma(auVar176,auVar237,auVar295);
          auVar182 = vdivps_avx(auVar295,auVar176);
          break;
        case 5:
          auVar176 = vminps_avx512vl(auVar182,auVar164);
          auVar172 = vmaxps_avx512vl(auVar176,auVar165);
          auVar173 = vfmadd213ps_fma(auVar166,auVar172,auVar281);
          auVar287._0_4_ = (int)auVar173._0_4_;
          auVar287._4_4_ = (int)auVar173._4_4_;
          auVar287._8_4_ = (int)auVar173._8_4_;
          auVar287._12_4_ = (int)auVar173._12_4_;
          auVar176 = vcvtdq2ps_avx(auVar287);
          uVar15 = vcmpps_avx512vl(auVar173,auVar176,1);
          auVar173 = vsubps_avx512vl(auVar176,auVar295);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar177._0_4_ = (float)((uint)bVar13 * auVar173._0_4_ | (uint)!bVar13 * auVar176._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar177._4_4_ = (float)((uint)bVar13 * auVar173._4_4_ | (uint)!bVar13 * auVar176._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar177._8_4_ = (float)((uint)bVar13 * auVar173._8_4_ | (uint)!bVar13 * auVar176._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar177._12_4_ =
               (float)((uint)bVar13 * auVar173._12_4_ | (uint)!bVar13 * auVar176._12_4_);
          auVar176 = vfmsub231ps_fma(auVar172,auVar177,auVar299);
          auVar173 = vfnmsub231ps_fma(auVar176,auVar177,auVar332);
          auVar268._0_4_ = auVar173._0_4_ * auVar173._0_4_;
          auVar268._4_4_ = auVar173._4_4_ * auVar173._4_4_;
          auVar268._8_4_ = auVar173._8_4_ * auVar173._8_4_;
          auVar268._12_4_ = auVar173._12_4_ * auVar173._12_4_;
          auVar176 = vfmadd213ps_fma(auVar308,auVar173,auVar312);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar316);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar320);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar324);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar281);
          auVar176 = vfmadd213ps_fma(auVar176,auVar268,auVar173);
          auVar246._0_4_ = auVar176._0_4_ + 1.0;
          auVar246._4_4_ = auVar176._4_4_ + 1.0;
          auVar246._8_4_ = auVar176._8_4_ + 1.0;
          auVar246._12_4_ = auVar176._12_4_ + 1.0;
          auVar269._0_4_ = (int)auVar177._0_4_;
          auVar269._4_4_ = (int)auVar177._4_4_;
          auVar269._8_4_ = (int)auVar177._8_4_;
          auVar269._12_4_ = (int)auVar177._12_4_;
          auVar176 = vpslld_avx(auVar269,0x17);
          auVar176 = vpaddd_avx(auVar329,auVar176);
          auVar176 = vfmadd213ps_fma(auVar176,auVar246,auVar295);
          uVar15 = vcmpps_avx512vl(auVar176,auVar233,2);
          auVar20._8_4_ = 0x800000;
          auVar20._0_8_ = 0x80000000800000;
          auVar20._12_4_ = 0x800000;
          auVar176 = vmaxps_avx512vl(auVar176,auVar20);
          auVar172 = vpsrld_avx(auVar176,0x17);
          auVar288._8_4_ = 0x807fffff;
          auVar288._0_8_ = 0x807fffff807fffff;
          auVar288._12_4_ = 0x807fffff;
          auVar21._8_4_ = 0x3f000000;
          auVar21._0_8_ = 0x3f0000003f000000;
          auVar21._12_4_ = 0x3f000000;
          auVar176 = vpternlogd_avx512vl(auVar176,auVar288,auVar21,0xea);
          auVar22._8_4_ = 0x3f3504f3;
          auVar22._0_8_ = 0x3f3504f33f3504f3;
          auVar22._12_4_ = 0x3f3504f3;
          uVar16 = vcmpps_avx512vl(auVar176,auVar22,1);
          auVar23._8_4_ = 0xbf800000;
          auVar23._0_8_ = 0xbf800000bf800000;
          auVar23._12_4_ = 0xbf800000;
          auVar173 = vaddps_avx512vl(auVar176,auVar23);
          auVar176 = vaddps_avx512vl(auVar173,auVar176);
          bVar13 = (bool)((byte)uVar16 & 1);
          auVar178._0_4_ = (float)((uint)bVar13 * auVar176._0_4_ | (uint)!bVar13 * auVar173._0_4_);
          bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar178._4_4_ = (float)((uint)bVar13 * auVar176._4_4_ | (uint)!bVar13 * auVar173._4_4_);
          bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar178._8_4_ = (float)((uint)bVar13 * auVar176._8_4_ | (uint)!bVar13 * auVar173._8_4_);
          bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar178._12_4_ =
               (float)((uint)bVar13 * auVar176._12_4_ | (uint)!bVar13 * auVar173._12_4_);
          auVar247._0_4_ = auVar178._0_4_ * auVar178._0_4_;
          auVar247._4_4_ = auVar178._4_4_ * auVar178._4_4_;
          auVar247._8_4_ = auVar178._8_4_ * auVar178._8_4_;
          auVar247._12_4_ = auVar178._12_4_ * auVar178._12_4_;
          auVar304._8_4_ = 0x3d9021bb;
          auVar304._0_8_ = 0x3d9021bb3d9021bb;
          auVar304._12_4_ = 0x3d9021bb;
          auVar24._8_4_ = 0xbdebd1b8;
          auVar24._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar24._12_4_ = 0xbdebd1b8;
          auVar176 = vfmadd213ps_avx512vl(auVar304,auVar178,auVar24);
          auVar25._8_4_ = 0x3def251a;
          auVar25._0_8_ = 0x3def251a3def251a;
          auVar25._12_4_ = 0x3def251a;
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar25);
          auVar26._8_4_ = 0xbdfe5d4f;
          auVar26._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar26._12_4_ = 0xbdfe5d4f;
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar26);
          auVar27._8_4_ = 0x3e11e9bf;
          auVar27._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar27._12_4_ = 0x3e11e9bf;
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar27);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar167);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar168);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar169);
          auVar176 = vfmadd213ps_avx512vl(auVar176,auVar178,auVar170);
          auVar173 = vmulps_avx512vl(auVar247,auVar178);
          in_ZMM16 = ZEXT1664(auVar173);
          auVar173 = vmulps_avx512vl(auVar173,auVar176);
          auVar28._8_4_ = 0xffffff82;
          auVar28._0_8_ = 0xffffff82ffffff82;
          auVar28._12_4_ = 0xffffff82;
          auVar176 = vpaddd_avx512vl(auVar172,auVar28);
          auVar176 = vcvtdq2ps_avx(auVar176);
          auVar172 = vsubps_avx512vl(auVar176,auVar295);
          bVar13 = (bool)((byte)uVar16 & 1);
          auVar179._0_4_ = (uint)bVar13 * auVar172._0_4_ | (uint)!bVar13 * auVar176._0_4_;
          bVar13 = (bool)((byte)(uVar16 >> 1) & 1);
          auVar179._4_4_ = (uint)bVar13 * auVar172._4_4_ | (uint)!bVar13 * auVar176._4_4_;
          bVar13 = (bool)((byte)(uVar16 >> 2) & 1);
          auVar179._8_4_ = (uint)bVar13 * auVar172._8_4_ | (uint)!bVar13 * auVar176._8_4_;
          bVar13 = (bool)((byte)(uVar16 >> 3) & 1);
          auVar179._12_4_ = (uint)bVar13 * auVar172._12_4_ | (uint)!bVar13 * auVar176._12_4_;
          auVar176 = vfmadd231ps_fma(auVar173,auVar179,auVar332);
          auVar176 = vfmsub231ps_fma(auVar176,auVar281,auVar247);
          auVar176 = vsubps_avx(auVar176,auVar178);
          auVar176 = vfnmadd231ps_fma(auVar176,auVar299,auVar179);
          auVar173 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar180._0_4_ =
               (uint)bVar13 * auVar173._0_4_ |
               (uint)!bVar13 * (int)(auVar176._0_4_ + auVar176._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar180._4_4_ =
               (uint)bVar13 * auVar173._4_4_ |
               (uint)!bVar13 * (int)(auVar176._4_4_ + auVar176._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar180._8_4_ =
               (uint)bVar13 * auVar173._8_4_ |
               (uint)!bVar13 * (int)(auVar176._8_4_ + auVar176._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar180._12_4_ =
               (uint)bVar13 * auVar173._12_4_ |
               (uint)!bVar13 * (int)(auVar176._12_4_ + auVar176._12_4_);
          auVar176 = vminps_avx512vl(auVar180,auVar164);
          auVar172 = vmaxps_avx512vl(auVar176,auVar165);
          auVar173 = vfmadd213ps_fma(auVar166,auVar172,auVar281);
          auVar289._0_4_ = (int)auVar173._0_4_;
          auVar289._4_4_ = (int)auVar173._4_4_;
          auVar289._8_4_ = (int)auVar173._8_4_;
          auVar289._12_4_ = (int)auVar173._12_4_;
          auVar176 = vcvtdq2ps_avx(auVar289);
          uVar15 = vcmpps_avx512vl(auVar173,auVar176,1);
          auVar173 = vsubps_avx512vl(auVar176,auVar295);
          bVar13 = (bool)((byte)uVar15 & 1);
          auVar181._0_4_ = (float)((uint)bVar13 * auVar173._0_4_ | (uint)!bVar13 * auVar176._0_4_);
          bVar13 = (bool)((byte)(uVar15 >> 1) & 1);
          auVar181._4_4_ = (float)((uint)bVar13 * auVar173._4_4_ | (uint)!bVar13 * auVar176._4_4_);
          bVar13 = (bool)((byte)(uVar15 >> 2) & 1);
          auVar181._8_4_ = (float)((uint)bVar13 * auVar173._8_4_ | (uint)!bVar13 * auVar176._8_4_);
          bVar13 = (bool)((byte)(uVar15 >> 3) & 1);
          auVar181._12_4_ =
               (float)((uint)bVar13 * auVar173._12_4_ | (uint)!bVar13 * auVar176._12_4_);
          auVar176 = vfmsub231ps_fma(auVar172,auVar181,auVar299);
          auVar173 = vfnmsub231ps_fma(auVar176,auVar181,auVar332);
          auVar270._0_4_ = auVar173._0_4_ * auVar173._0_4_;
          auVar270._4_4_ = auVar173._4_4_ * auVar173._4_4_;
          auVar270._8_4_ = auVar173._8_4_ * auVar173._8_4_;
          auVar270._12_4_ = auVar173._12_4_ * auVar173._12_4_;
          auVar176 = vfmadd213ps_fma(auVar308,auVar173,auVar312);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar316);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar320);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar324);
          auVar176 = vfmadd213ps_fma(auVar176,auVar173,auVar281);
          auVar176 = vfmadd213ps_fma(auVar176,auVar270,auVar173);
          auVar248._0_4_ = auVar176._0_4_ + 1.0;
          auVar248._4_4_ = auVar176._4_4_ + 1.0;
          auVar248._8_4_ = auVar176._8_4_ + 1.0;
          auVar248._12_4_ = auVar176._12_4_ + 1.0;
          auVar271._0_4_ = (int)auVar181._0_4_;
          auVar271._4_4_ = (int)auVar181._4_4_;
          auVar271._8_4_ = (int)auVar181._8_4_;
          auVar271._12_4_ = (int)auVar181._12_4_;
          auVar176 = vpslld_avx(auVar271,0x17);
          auVar176 = vpaddd_avx(auVar329,auVar176);
          auVar176 = vfmadd213ps_fma(auVar176,auVar248,auVar295);
          auVar176 = vdivps_avx512vl(auVar171,auVar176);
          auVar182 = vfmsub231ps_fma(auVar182,auVar182,auVar176);
          break;
        case 6:
          puVar8 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar1 = *puVar8;
          auVar251._4_4_ = uVar1;
          auVar251._0_4_ = uVar1;
          auVar251._8_4_ = uVar1;
          auVar251._12_4_ = uVar1;
          uVar1 = puVar8[1];
          auVar19._4_4_ = uVar1;
          auVar19._0_4_ = uVar1;
          auVar19._8_4_ = uVar1;
          auVar19._12_4_ = uVar1;
          auVar176 = vfmadd213ps_avx512vl(auVar251,auVar182,auVar19);
          auVar176 = vmaxps_avx(auVar176,auVar233);
          auVar176 = vminps_avx(auVar176,auVar295);
          auVar182._0_4_ = auVar176._0_4_ * auVar182._0_4_;
          auVar182._4_4_ = auVar176._4_4_ * auVar182._4_4_;
          auVar182._8_4_ = auVar176._8_4_ * auVar182._8_4_;
          auVar182._12_4_ = auVar176._12_4_ * auVar182._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar137 * 0x10) = auVar182;
        uVar137 = uVar137 + 1;
      } while (uVar137 != uVar155);
    }
    iVar144 = 0;
  }
LAB_002db035:
  piVar6 = (int *)CONCAT44(uStack_3ac,uStack_3b0);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (local_398 == (Allocator *)0x0) {
        if (local_3b8 != (undefined1 (*) [32])0x0) {
          free(local_3b8);
        }
      }
      else {
        (*local_398->_vptr_Allocator[3])();
      }
    }
  }
  return iVar144;
}

Assistant:

int InnerProduct_x86_avx512::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}